

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  undefined1 auVar122 [28];
  uint uVar123;
  int iVar124;
  ulong uVar125;
  RTCIntersectArguments *pRVar126;
  uint uVar127;
  long lVar128;
  byte bVar129;
  ulong uVar130;
  ulong uVar131;
  undefined1 auVar132 [8];
  Geometry *geometry;
  long lVar133;
  float fVar134;
  float fVar148;
  float fVar149;
  vint4 bi_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar151;
  float fVar152;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar150;
  float fVar153;
  float fVar154;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar155;
  float fVar170;
  float fVar171;
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar161 [16];
  float fVar174;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 bi_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar186;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar187;
  float fVar199;
  float fVar201;
  vint4 ai_1;
  undefined1 auVar188 [16];
  float fVar202;
  undefined1 auVar189 [16];
  float fVar200;
  float fVar205;
  undefined1 auVar191 [16];
  undefined1 auVar190 [16];
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar203;
  float fVar204;
  float fVar207;
  float fVar209;
  float fVar211;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  float fVar212;
  float fVar221;
  float fVar222;
  vint4 ai_2;
  undefined1 auVar227 [16];
  undefined1 auVar213 [16];
  float fVar223;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar224;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar225;
  float fVar235;
  float fVar236;
  undefined1 auVar226 [16];
  float fVar237;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar238;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar239;
  float fVar247;
  float fVar248;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar253;
  undefined1 auVar245 [32];
  float fVar249;
  float fVar254;
  undefined1 auVar246 [32];
  vint4 ai;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar265;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  float fVar276;
  undefined1 auVar271 [32];
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar272 [64];
  float fVar282;
  float fVar283;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar284 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar285 [32];
  float fVar293;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar304;
  float fVar305;
  undefined1 auVar298 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  float fVar310;
  float fVar313;
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar325 [32];
  float fVar329;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  uint local_7c0;
  undefined4 uStack_7bc;
  undefined1 local_7a0 [16];
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  undefined1 auStack_738 [8];
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 (*local_700) [16];
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [4];
  undefined1 auStack_59c [8];
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  PVar12 = prim[1];
  uVar125 = (ulong)(byte)PVar12;
  lVar21 = uVar125 * 0x25;
  fVar310 = *(float *)(prim + lVar21 + 0x12);
  auVar138 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar138 = vinsertps_avx(auVar138,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar227 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar138 = vsubps_avx(auVar138,*(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar156._0_4_ = fVar310 * auVar138._0_4_;
  auVar156._4_4_ = fVar310 * auVar138._4_4_;
  auVar156._8_4_ = fVar310 * auVar138._8_4_;
  auVar156._12_4_ = fVar310 * auVar138._12_4_;
  auVar255._0_4_ = fVar310 * auVar227._0_4_;
  auVar255._4_4_ = fVar310 * auVar227._4_4_;
  auVar255._8_4_ = fVar310 * auVar227._8_4_;
  auVar255._12_4_ = fVar310 * auVar227._12_4_;
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 5 + 6)));
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar125 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vshufps_avx(auVar255,auVar255,0);
  auVar29 = vshufps_avx(auVar255,auVar255,0x55);
  auVar30 = vshufps_avx(auVar255,auVar255,0xaa);
  fVar310 = auVar30._0_4_;
  fVar200 = auVar30._4_4_;
  fVar313 = auVar30._8_4_;
  fVar205 = auVar30._12_4_;
  fVar212 = auVar29._0_4_;
  fVar221 = auVar29._4_4_;
  fVar222 = auVar29._8_4_;
  fVar223 = auVar29._12_4_;
  fVar187 = auVar28._0_4_;
  fVar199 = auVar28._4_4_;
  fVar201 = auVar28._8_4_;
  fVar202 = auVar28._12_4_;
  auVar314._0_4_ = fVar187 * auVar138._0_4_ + fVar212 * auVar227._0_4_ + fVar310 * auVar191._0_4_;
  auVar314._4_4_ = fVar199 * auVar138._4_4_ + fVar221 * auVar227._4_4_ + fVar200 * auVar191._4_4_;
  auVar314._8_4_ = fVar201 * auVar138._8_4_ + fVar222 * auVar227._8_4_ + fVar313 * auVar191._8_4_;
  auVar314._12_4_ =
       fVar202 * auVar138._12_4_ + fVar223 * auVar227._12_4_ + fVar205 * auVar191._12_4_;
  auVar320._0_4_ = fVar187 * auVar181._0_4_ + fVar212 * auVar23._0_4_ + auVar24._0_4_ * fVar310;
  auVar320._4_4_ = fVar199 * auVar181._4_4_ + fVar221 * auVar23._4_4_ + auVar24._4_4_ * fVar200;
  auVar320._8_4_ = fVar201 * auVar181._8_4_ + fVar222 * auVar23._8_4_ + auVar24._8_4_ * fVar313;
  auVar320._12_4_ = fVar202 * auVar181._12_4_ + fVar223 * auVar23._12_4_ + auVar24._12_4_ * fVar205;
  auVar256._0_4_ = fVar187 * auVar25._0_4_ + fVar212 * auVar26._0_4_ + auVar27._0_4_ * fVar310;
  auVar256._4_4_ = fVar199 * auVar25._4_4_ + fVar221 * auVar26._4_4_ + auVar27._4_4_ * fVar200;
  auVar256._8_4_ = fVar201 * auVar25._8_4_ + fVar222 * auVar26._8_4_ + auVar27._8_4_ * fVar313;
  auVar256._12_4_ = fVar202 * auVar25._12_4_ + fVar223 * auVar26._12_4_ + auVar27._12_4_ * fVar205;
  auVar28 = vshufps_avx(auVar156,auVar156,0);
  auVar29 = vshufps_avx(auVar156,auVar156,0x55);
  auVar30 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar310 = auVar30._0_4_;
  fVar200 = auVar30._4_4_;
  fVar313 = auVar30._8_4_;
  fVar205 = auVar30._12_4_;
  fVar212 = auVar29._0_4_;
  fVar221 = auVar29._4_4_;
  fVar222 = auVar29._8_4_;
  fVar223 = auVar29._12_4_;
  fVar187 = auVar28._0_4_;
  fVar199 = auVar28._4_4_;
  fVar201 = auVar28._8_4_;
  fVar202 = auVar28._12_4_;
  auVar157._0_4_ = fVar187 * auVar138._0_4_ + fVar212 * auVar227._0_4_ + fVar310 * auVar191._0_4_;
  auVar157._4_4_ = fVar199 * auVar138._4_4_ + fVar221 * auVar227._4_4_ + fVar200 * auVar191._4_4_;
  auVar157._8_4_ = fVar201 * auVar138._8_4_ + fVar222 * auVar227._8_4_ + fVar313 * auVar191._8_4_;
  auVar157._12_4_ =
       fVar202 * auVar138._12_4_ + fVar223 * auVar227._12_4_ + fVar205 * auVar191._12_4_;
  auVar135._0_4_ = fVar187 * auVar181._0_4_ + auVar24._0_4_ * fVar310 + fVar212 * auVar23._0_4_;
  auVar135._4_4_ = fVar199 * auVar181._4_4_ + auVar24._4_4_ * fVar200 + fVar221 * auVar23._4_4_;
  auVar135._8_4_ = fVar201 * auVar181._8_4_ + auVar24._8_4_ * fVar313 + fVar222 * auVar23._8_4_;
  auVar135._12_4_ = fVar202 * auVar181._12_4_ + auVar24._12_4_ * fVar205 + fVar223 * auVar23._12_4_;
  auVar266._8_4_ = 0x7fffffff;
  auVar266._0_8_ = 0x7fffffff7fffffff;
  auVar266._12_4_ = 0x7fffffff;
  auVar138 = vandps_avx(auVar314,auVar266);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar138 = vcmpps_avx(auVar138,auVar213,1);
  auVar227 = vblendvps_avx(auVar314,auVar213,auVar138);
  auVar138 = vandps_avx(auVar320,auVar266);
  auVar138 = vcmpps_avx(auVar138,auVar213,1);
  auVar191 = vblendvps_avx(auVar320,auVar213,auVar138);
  auVar138 = vandps_avx(auVar266,auVar256);
  auVar138 = vcmpps_avx(auVar138,auVar213,1);
  auVar138 = vblendvps_avx(auVar256,auVar213,auVar138);
  auVar175._0_4_ = fVar187 * auVar25._0_4_ + fVar212 * auVar26._0_4_ + auVar27._0_4_ * fVar310;
  auVar175._4_4_ = fVar199 * auVar25._4_4_ + fVar221 * auVar26._4_4_ + auVar27._4_4_ * fVar200;
  auVar175._8_4_ = fVar201 * auVar25._8_4_ + fVar222 * auVar26._8_4_ + auVar27._8_4_ * fVar313;
  auVar175._12_4_ = fVar202 * auVar25._12_4_ + fVar223 * auVar26._12_4_ + auVar27._12_4_ * fVar205;
  auVar181 = vrcpps_avx(auVar227);
  fVar187 = auVar181._0_4_;
  auVar188._0_4_ = fVar187 * auVar227._0_4_;
  fVar199 = auVar181._4_4_;
  auVar188._4_4_ = fVar199 * auVar227._4_4_;
  fVar201 = auVar181._8_4_;
  auVar188._8_4_ = fVar201 * auVar227._8_4_;
  fVar202 = auVar181._12_4_;
  auVar188._12_4_ = fVar202 * auVar227._12_4_;
  auVar240._8_4_ = 0x3f800000;
  auVar240._0_8_ = 0x3f8000003f800000;
  auVar240._12_4_ = 0x3f800000;
  auVar227 = vsubps_avx(auVar240,auVar188);
  fVar187 = fVar187 + fVar187 * auVar227._0_4_;
  fVar199 = fVar199 + fVar199 * auVar227._4_4_;
  fVar201 = fVar201 + fVar201 * auVar227._8_4_;
  fVar202 = fVar202 + fVar202 * auVar227._12_4_;
  auVar227 = vrcpps_avx(auVar191);
  fVar212 = auVar227._0_4_;
  auVar226._0_4_ = fVar212 * auVar191._0_4_;
  fVar221 = auVar227._4_4_;
  auVar226._4_4_ = fVar221 * auVar191._4_4_;
  fVar222 = auVar227._8_4_;
  auVar226._8_4_ = fVar222 * auVar191._8_4_;
  fVar223 = auVar227._12_4_;
  auVar226._12_4_ = fVar223 * auVar191._12_4_;
  auVar227 = vsubps_avx(auVar240,auVar226);
  fVar212 = fVar212 + fVar212 * auVar227._0_4_;
  fVar221 = fVar221 + fVar221 * auVar227._4_4_;
  fVar222 = fVar222 + fVar222 * auVar227._8_4_;
  fVar223 = fVar223 + fVar223 * auVar227._12_4_;
  auVar227 = vrcpps_avx(auVar138);
  fVar225 = auVar227._0_4_;
  auVar257._0_4_ = fVar225 * auVar138._0_4_;
  fVar235 = auVar227._4_4_;
  auVar257._4_4_ = fVar235 * auVar138._4_4_;
  fVar236 = auVar227._8_4_;
  auVar257._8_4_ = fVar236 * auVar138._8_4_;
  fVar237 = auVar227._12_4_;
  auVar257._12_4_ = fVar237 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar240,auVar257);
  fVar225 = fVar225 + fVar225 * auVar138._0_4_;
  fVar235 = fVar235 + fVar235 * auVar138._4_4_;
  fVar236 = fVar236 + fVar236 * auVar138._8_4_;
  fVar237 = fVar237 + fVar237 * auVar138._12_4_;
  auVar138 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar21 + 0x16)) *
                           *(float *)(prim + lVar21 + 0x1a)));
  auVar191 = vshufps_avx(auVar138,auVar138,0);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar138 = vpmovsxwd_avx(auVar138);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 6);
  auVar227 = vpmovsxwd_avx(auVar227);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar181 = vsubps_avx(auVar227,auVar138);
  fVar310 = auVar191._0_4_;
  fVar200 = auVar191._4_4_;
  fVar313 = auVar191._8_4_;
  fVar205 = auVar191._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar227 = vpmovsxwd_avx(auVar191);
  auVar258._0_4_ = auVar181._0_4_ * fVar310 + auVar138._0_4_;
  auVar258._4_4_ = auVar181._4_4_ * fVar200 + auVar138._4_4_;
  auVar258._8_4_ = auVar181._8_4_ * fVar313 + auVar138._8_4_;
  auVar258._12_4_ = auVar181._12_4_ * fVar205 + auVar138._12_4_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 6);
  auVar191 = vpmovsxwd_avx(auVar181);
  auVar138 = vcvtdq2ps_avx(auVar227);
  auVar227 = vcvtdq2ps_avx(auVar191);
  auVar227 = vsubps_avx(auVar227,auVar138);
  auVar267._0_4_ = auVar227._0_4_ * fVar310 + auVar138._0_4_;
  auVar267._4_4_ = auVar227._4_4_ * fVar200 + auVar138._4_4_;
  auVar267._8_4_ = auVar227._8_4_ * fVar313 + auVar138._8_4_;
  auVar267._12_4_ = auVar227._12_4_ * fVar205 + auVar138._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 6);
  auVar138 = vpmovsxwd_avx(auVar23);
  uVar130 = (ulong)(uint)((int)(uVar125 * 5) << 2);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar125 * 2 + uVar130 + 6);
  auVar227 = vpmovsxwd_avx(auVar24);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar227 = vsubps_avx(auVar227,auVar138);
  auVar284._0_4_ = auVar227._0_4_ * fVar310 + auVar138._0_4_;
  auVar284._4_4_ = auVar227._4_4_ * fVar200 + auVar138._4_4_;
  auVar284._8_4_ = auVar227._8_4_ * fVar313 + auVar138._8_4_;
  auVar284._12_4_ = auVar227._12_4_ * fVar205 + auVar138._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar130 + 6);
  auVar138 = vpmovsxwd_avx(auVar25);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 6);
  auVar227 = vpmovsxwd_avx(auVar26);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar191 = vsubps_avx(auVar227,auVar138);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 6);
  auVar227 = vpmovsxwd_avx(auVar27);
  auVar298._0_4_ = auVar191._0_4_ * fVar310 + auVar138._0_4_;
  auVar298._4_4_ = auVar191._4_4_ * fVar200 + auVar138._4_4_;
  auVar298._8_4_ = auVar191._8_4_ * fVar313 + auVar138._8_4_;
  auVar298._12_4_ = auVar191._12_4_ * fVar205 + auVar138._12_4_;
  auVar138 = vcvtdq2ps_avx(auVar227);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar125 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar227 = vpmovsxwd_avx(auVar28);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar227 = vsubps_avx(auVar227,auVar138);
  auVar311._0_4_ = auVar227._0_4_ * fVar310 + auVar138._0_4_;
  auVar311._4_4_ = auVar227._4_4_ * fVar200 + auVar138._4_4_;
  auVar311._8_4_ = auVar227._8_4_ * fVar313 + auVar138._8_4_;
  auVar311._12_4_ = auVar227._12_4_ * fVar205 + auVar138._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar125) + 6);
  auVar138 = vpmovsxwd_avx(auVar29);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 6);
  auVar227 = vpmovsxwd_avx(auVar30);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar227 = vsubps_avx(auVar227,auVar138);
  auVar241._0_4_ = auVar138._0_4_ + auVar227._0_4_ * fVar310;
  auVar241._4_4_ = auVar138._4_4_ + auVar227._4_4_ * fVar200;
  auVar241._8_4_ = auVar138._8_4_ + auVar227._8_4_ * fVar313;
  auVar241._12_4_ = auVar138._12_4_ + auVar227._12_4_ * fVar205;
  auVar138 = vsubps_avx(auVar258,auVar157);
  auVar259._0_4_ = fVar187 * auVar138._0_4_;
  auVar259._4_4_ = fVar199 * auVar138._4_4_;
  auVar259._8_4_ = fVar201 * auVar138._8_4_;
  auVar259._12_4_ = fVar202 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar267,auVar157);
  auVar158._0_4_ = fVar187 * auVar138._0_4_;
  auVar158._4_4_ = fVar199 * auVar138._4_4_;
  auVar158._8_4_ = fVar201 * auVar138._8_4_;
  auVar158._12_4_ = fVar202 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar284,auVar135);
  auVar189._0_4_ = fVar212 * auVar138._0_4_;
  auVar189._4_4_ = fVar221 * auVar138._4_4_;
  auVar189._8_4_ = fVar222 * auVar138._8_4_;
  auVar189._12_4_ = fVar223 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar298,auVar135);
  auVar136._0_4_ = fVar212 * auVar138._0_4_;
  auVar136._4_4_ = fVar221 * auVar138._4_4_;
  auVar136._8_4_ = fVar222 * auVar138._8_4_;
  auVar136._12_4_ = fVar223 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar311,auVar175);
  auVar214._0_4_ = fVar225 * auVar138._0_4_;
  auVar214._4_4_ = fVar235 * auVar138._4_4_;
  auVar214._8_4_ = fVar236 * auVar138._8_4_;
  auVar214._12_4_ = fVar237 * auVar138._12_4_;
  auVar138 = vsubps_avx(auVar241,auVar175);
  auVar176._0_4_ = fVar225 * auVar138._0_4_;
  auVar176._4_4_ = fVar235 * auVar138._4_4_;
  auVar176._8_4_ = fVar236 * auVar138._8_4_;
  auVar176._12_4_ = fVar237 * auVar138._12_4_;
  auVar138 = vpminsd_avx(auVar259,auVar158);
  auVar227 = vpminsd_avx(auVar189,auVar136);
  auVar138 = vmaxps_avx(auVar138,auVar227);
  auVar227 = vpminsd_avx(auVar214,auVar176);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar268._4_4_ = uVar11;
  auVar268._0_4_ = uVar11;
  auVar268._8_4_ = uVar11;
  auVar268._12_4_ = uVar11;
  auVar227 = vmaxps_avx(auVar227,auVar268);
  auVar138 = vmaxps_avx(auVar138,auVar227);
  local_2f0._0_4_ = auVar138._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar138._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar138._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar138._12_4_ * 0.99999964;
  auVar138 = vpmaxsd_avx(auVar259,auVar158);
  auVar227 = vpmaxsd_avx(auVar189,auVar136);
  auVar138 = vminps_avx(auVar138,auVar227);
  auVar227 = vpmaxsd_avx(auVar214,auVar176);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar177._4_4_ = uVar11;
  auVar177._0_4_ = uVar11;
  auVar177._8_4_ = uVar11;
  auVar177._12_4_ = uVar11;
  auVar227 = vminps_avx(auVar227,auVar177);
  auVar138 = vminps_avx(auVar138,auVar227);
  auVar137._0_4_ = auVar138._0_4_ * 1.0000004;
  auVar137._4_4_ = auVar138._4_4_ * 1.0000004;
  auVar137._8_4_ = auVar138._8_4_ * 1.0000004;
  auVar137._12_4_ = auVar138._12_4_ * 1.0000004;
  auVar138 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar227 = vpcmpgtd_avx(auVar138,_DAT_01f7fcf0);
  auVar138 = vcmpps_avx(local_2f0,auVar137,2);
  auVar138 = vandps_avx(auVar138,auVar227);
  uVar123 = vmovmskps_avx(auVar138);
  if (uVar123 == 0) {
    bVar129 = 0;
  }
  else {
    uVar123 = uVar123 & 0xff;
    local_500 = mm_lookupmask_ps._16_8_;
    uStack_4f8 = mm_lookupmask_ps._24_8_;
    uStack_4f0 = mm_lookupmask_ps._16_8_;
    uStack_4e8 = mm_lookupmask_ps._24_8_;
    local_508 = pre->ray_space + k;
    local_700 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_6f8 = pre;
    do {
      lVar21 = 0;
      if (uVar123 != 0) {
        for (; (uVar123 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar13 = *(uint *)(prim + 2);
      local_788 = (ulong)uVar13;
      uVar14 = *(uint *)(prim + lVar21 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[local_788].ptr;
      local_610._0_8_ = CONCAT44(0,uVar14);
      uVar125 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,uVar14) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar310 = (pGVar16->time_range).lower;
      fVar310 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar310) /
                ((pGVar16->time_range).upper - fVar310));
      auVar138 = vroundss_avx(ZEXT416((uint)fVar310),ZEXT416((uint)fVar310),9);
      auVar138 = vminss_avx(auVar138,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar138 = vmaxss_avx(ZEXT816(0) << 0x20,auVar138);
      fVar310 = fVar310 - auVar138._0_4_;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar128 = (long)(int)auVar138._0_4_ * 0x38;
      lVar133 = *(long *)(_Var17 + 0x10 + lVar128);
      lVar18 = *(long *)(_Var17 + 0x38 + lVar128);
      lVar19 = *(long *)(_Var17 + 0x48 + lVar128);
      auVar138 = vshufps_avx(ZEXT416((uint)fVar310),ZEXT416((uint)fVar310),0);
      pfVar1 = (float *)(lVar18 + lVar19 * uVar125);
      fVar200 = auVar138._0_4_;
      fVar313 = auVar138._4_4_;
      fVar205 = auVar138._8_4_;
      fVar187 = auVar138._12_4_;
      lVar21 = uVar125 + 1;
      pfVar2 = (float *)(lVar18 + lVar19 * lVar21);
      p_Var20 = pGVar16[4].occlusionFilterN;
      auVar138 = vshufps_avx(ZEXT416((uint)(1.0 - fVar310)),ZEXT416((uint)(1.0 - fVar310)),0);
      pfVar3 = (float *)(*(long *)(_Var17 + lVar128) + lVar133 * uVar125);
      fVar310 = auVar138._0_4_;
      fVar199 = auVar138._4_4_;
      fVar201 = auVar138._8_4_;
      fVar202 = auVar138._12_4_;
      pfVar4 = (float *)(*(long *)(_Var17 + lVar128) + lVar133 * lVar21);
      pfVar5 = (float *)(*(long *)(p_Var20 + lVar128 + 0x38) +
                        uVar125 * *(long *)(p_Var20 + lVar128 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var20 + lVar128 + 0x38) +
                        *(long *)(p_Var20 + lVar128 + 0x48) * lVar21);
      uVar130 = *(long *)(p_Var20 + lVar128 + 0x10) * lVar21;
      pfVar7 = (float *)(*(long *)(p_Var20 + lVar128) +
                        *(long *)(p_Var20 + lVar128 + 0x10) * uVar125);
      pfVar8 = (float *)(*(long *)(p_Var20 + lVar128) + uVar130);
      uVar15 = (uint)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar15 * 0x44;
      fVar212 = fVar310 * *pfVar3 + fVar200 * *pfVar1;
      fVar221 = fVar199 * pfVar3[1] + fVar313 * pfVar1[1];
      local_710 = (undefined1  [8])CONCAT44(fVar221,fVar212);
      uStack_708._0_4_ = fVar201 * pfVar3[2] + fVar205 * pfVar1[2];
      uStack_708._4_4_ = fVar202 * pfVar3[3] + fVar187 * pfVar1[3];
      local_5d0 = (undefined1  [8])
                  CONCAT44(fVar199 * pfVar4[1] + fVar313 * pfVar2[1],
                           fVar310 * *pfVar4 + fVar200 * *pfVar2);
      uStack_5c8._0_4_ = fVar201 * pfVar4[2] + fVar205 * pfVar2[2];
      uStack_5c8._4_4_ = fVar202 * pfVar4[3] + fVar187 * pfVar2[3];
      auVar138 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar181 = vinsertps_avx(auVar138,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      local_5e0 = (undefined1  [8])
                  CONCAT44(fVar221 + (fVar199 * pfVar7[1] + fVar313 * pfVar5[1]) * 0.33333334,
                           fVar212 + (fVar310 * *pfVar7 + fVar200 * *pfVar5) * 0.33333334);
      uStack_5d8._0_4_ =
           (float)uStack_708 + (fVar201 * pfVar7[2] + fVar205 * pfVar5[2]) * 0.33333334;
      uStack_5d8._4_4_ = uStack_708._4_4_ + (fVar202 * pfVar7[3] + fVar187 * pfVar5[3]) * 0.33333334
      ;
      auVar159._0_4_ = (fVar310 * *pfVar8 + fVar200 * *pfVar6) * 0.33333334;
      auVar159._4_4_ = (fVar199 * pfVar8[1] + fVar313 * pfVar6[1]) * 0.33333334;
      auVar159._8_4_ = (fVar201 * pfVar8[2] + fVar205 * pfVar6[2]) * 0.33333334;
      auVar159._12_4_ = (fVar202 * pfVar8[3] + fVar187 * pfVar6[3]) * 0.33333334;
      _local_5f0 = vsubps_avx(_local_5d0,auVar159);
      auVar191 = vsubps_avx(_local_710,auVar181);
      auVar138 = vshufps_avx(auVar191,auVar191,0);
      auVar227 = vshufps_avx(auVar191,auVar191,0x55);
      auVar191 = vshufps_avx(auVar191,auVar191,0xaa);
      fVar310 = (local_508->vx).field_0.m128[0];
      fVar200 = (local_508->vx).field_0.m128[1];
      fVar313 = (local_508->vx).field_0.m128[2];
      fVar205 = (local_508->vx).field_0.m128[3];
      fVar187 = (local_508->vy).field_0.m128[0];
      fVar199 = (local_508->vy).field_0.m128[1];
      fVar201 = (local_508->vy).field_0.m128[2];
      fVar202 = (local_508->vy).field_0.m128[3];
      fVar212 = (local_508->vz).field_0.m128[0];
      fVar221 = (local_508->vz).field_0.m128[1];
      fVar222 = (local_508->vz).field_0.m128[2];
      fVar223 = (local_508->vz).field_0.m128[3];
      auVar190._0_8_ =
           CONCAT44(auVar138._4_4_ * fVar200 + auVar227._4_4_ * fVar199 + fVar221 * auVar191._4_4_,
                    auVar138._0_4_ * fVar310 + auVar227._0_4_ * fVar187 + fVar212 * auVar191._0_4_);
      auVar190._8_4_ =
           auVar138._8_4_ * fVar313 + auVar227._8_4_ * fVar201 + fVar222 * auVar191._8_4_;
      auVar190._12_4_ =
           auVar138._12_4_ * fVar205 + auVar227._12_4_ * fVar202 + fVar223 * auVar191._12_4_;
      auVar138 = vblendps_avx(auVar190,_local_710,8);
      auVar23 = vsubps_avx(_local_5e0,auVar181);
      auVar227 = vshufps_avx(auVar23,auVar23,0);
      auVar191 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar260._0_4_ = auVar227._0_4_ * fVar310 + auVar191._0_4_ * fVar187 + fVar212 * auVar23._0_4_
      ;
      auVar260._4_4_ = auVar227._4_4_ * fVar200 + auVar191._4_4_ * fVar199 + fVar221 * auVar23._4_4_
      ;
      auVar260._8_4_ = auVar227._8_4_ * fVar313 + auVar191._8_4_ * fVar201 + fVar222 * auVar23._8_4_
      ;
      auVar260._12_4_ =
           auVar227._12_4_ * fVar205 + auVar191._12_4_ * fVar202 + fVar223 * auVar23._12_4_;
      auVar227 = vblendps_avx(auVar260,_local_5e0,8);
      auVar24 = vsubps_avx(_local_5f0,auVar181);
      auVar191 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar269._0_4_ = auVar191._0_4_ * fVar310 + auVar23._0_4_ * fVar187 + auVar24._0_4_ * fVar212;
      auVar269._4_4_ = auVar191._4_4_ * fVar200 + auVar23._4_4_ * fVar199 + auVar24._4_4_ * fVar221;
      auVar269._8_4_ = auVar191._8_4_ * fVar313 + auVar23._8_4_ * fVar201 + auVar24._8_4_ * fVar222;
      auVar269._12_4_ =
           auVar191._12_4_ * fVar205 + auVar23._12_4_ * fVar202 + auVar24._12_4_ * fVar223;
      auVar191 = vblendps_avx(auVar269,_local_5f0,8);
      auVar24 = vsubps_avx(_local_5d0,auVar181);
      auVar181 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar160._0_4_ = auVar181._0_4_ * fVar310 + auVar23._0_4_ * fVar187 + fVar212 * auVar24._0_4_;
      auVar160._4_4_ = auVar181._4_4_ * fVar200 + auVar23._4_4_ * fVar199 + fVar221 * auVar24._4_4_;
      auVar160._8_4_ = auVar181._8_4_ * fVar313 + auVar23._8_4_ * fVar201 + fVar222 * auVar24._8_4_;
      auVar160._12_4_ =
           auVar181._12_4_ * fVar205 + auVar23._12_4_ * fVar202 + fVar223 * auVar24._12_4_;
      auVar181 = vblendps_avx(auVar160,_local_5d0,8);
      auVar215._8_4_ = 0x7fffffff;
      auVar215._0_8_ = 0x7fffffff7fffffff;
      auVar215._12_4_ = 0x7fffffff;
      auVar138 = vandps_avx(auVar138,auVar215);
      auVar227 = vandps_avx(auVar227,auVar215);
      auVar23 = vmaxps_avx(auVar138,auVar227);
      auVar138 = vandps_avx(auVar191,auVar215);
      auVar227 = vandps_avx(auVar181,auVar215);
      auVar138 = vmaxps_avx(auVar138,auVar227);
      auVar138 = vmaxps_avx(auVar23,auVar138);
      auVar227 = vmovshdup_avx(auVar138);
      auVar227 = vmaxss_avx(auVar227,auVar138);
      auVar138 = vshufpd_avx(auVar138,auVar138,1);
      auVar138 = vmaxss_avx(auVar138,auVar227);
      fVar202 = *(float *)(bezier_basis0 + lVar21 + 0x908);
      fVar212 = *(float *)(bezier_basis0 + lVar21 + 0x90c);
      fVar221 = *(float *)(bezier_basis0 + lVar21 + 0x910);
      fVar222 = *(float *)(bezier_basis0 + lVar21 + 0x914);
      fVar223 = *(float *)(bezier_basis0 + lVar21 + 0x918);
      fVar225 = *(float *)(bezier_basis0 + lVar21 + 0x91c);
      fVar235 = *(float *)(bezier_basis0 + lVar21 + 0x920);
      auVar227 = vshufps_avx(auVar269,auVar269,0);
      register0x00001310 = auVar227;
      _local_5c0 = auVar227;
      auVar191 = vshufps_avx(auVar269,auVar269,0x55);
      register0x00001410 = auVar191;
      _local_780 = auVar191;
      fVar310 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      fVar200 = *(float *)(bezier_basis0 + lVar21 + 0xd90);
      fVar313 = *(float *)(bezier_basis0 + lVar21 + 0xd94);
      fVar205 = *(float *)(bezier_basis0 + lVar21 + 0xd98);
      fVar187 = *(float *)(bezier_basis0 + lVar21 + 0xd9c);
      fVar199 = *(float *)(bezier_basis0 + lVar21 + 0xda0);
      fVar201 = *(float *)(bezier_basis0 + lVar21 + 0xda4);
      auVar118 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      auVar181 = vshufps_avx(auVar160,auVar160,0);
      register0x000014d0 = auVar181;
      _local_480 = auVar181;
      fVar263 = auVar181._0_4_;
      fVar264 = auVar181._4_4_;
      fVar283 = auVar181._8_4_;
      fVar290 = auVar181._12_4_;
      fVar153 = auVar227._0_4_;
      fVar253 = auVar227._4_4_;
      fVar206 = auVar227._8_4_;
      fVar210 = auVar227._12_4_;
      auVar227 = vshufps_avx(auVar160,auVar160,0x55);
      fVar155 = auVar227._0_4_;
      fVar170 = auVar227._4_4_;
      fVar171 = auVar227._8_4_;
      fVar172 = auVar227._12_4_;
      fVar265 = auVar191._0_4_;
      fVar273 = auVar191._4_4_;
      fVar275 = auVar191._8_4_;
      fVar277 = auVar191._12_4_;
      auVar227 = vshufps_avx(_local_5f0,_local_5f0,0xff);
      register0x00001550 = auVar227;
      _local_80 = auVar227;
      auVar191 = vshufps_avx(_local_5d0,_local_5d0,0xff);
      register0x00001590 = auVar191;
      _local_140 = auVar191;
      fVar297 = auVar191._0_4_;
      fVar324 = auVar191._4_4_;
      fVar326 = auVar191._8_4_;
      fVar327 = auVar191._12_4_;
      fVar292 = auVar227._0_4_;
      fVar294 = auVar227._4_4_;
      fVar295 = auVar227._8_4_;
      fVar296 = auVar227._12_4_;
      auVar227 = vshufps_avx(auVar260,auVar260,0);
      auVar285._16_16_ = auVar227;
      auVar285._0_16_ = auVar227;
      fVar236 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x484);
      fVar237 = *(float *)(bezier_basis0 + lVar21 + 0x488);
      fVar306 = *(float *)(bezier_basis0 + lVar21 + 0x48c);
      fVar274 = *(float *)(bezier_basis0 + lVar21 + 0x490);
      fVar276 = *(float *)(bezier_basis0 + lVar21 + 0x494);
      fVar204 = *(float *)(bezier_basis0 + lVar21 + 0x498);
      fVar307 = *(float *)(bezier_basis0 + lVar21 + 0x49c);
      auVar119 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x484);
      fVar282 = auVar227._0_4_;
      fVar289 = auVar227._4_4_;
      fVar291 = auVar227._8_4_;
      fVar293 = auVar227._12_4_;
      auVar227 = vshufps_avx(auVar260,auVar260,0x55);
      fVar329 = auVar227._0_4_;
      fVar332 = auVar227._4_4_;
      fVar333 = auVar227._8_4_;
      fVar334 = auVar227._12_4_;
      auVar227 = vshufps_avx(_local_5e0,_local_5e0,0xff);
      register0x00001310 = auVar227;
      _local_a0 = auVar227;
      fVar224 = auVar227._0_4_;
      fVar203 = auVar227._4_4_;
      fVar208 = auVar227._8_4_;
      auVar111._8_4_ = auVar190._8_4_;
      auVar111._0_8_ = auVar190._0_8_;
      auVar111._12_4_ = auVar190._12_4_;
      auVar191 = vshufps_avx(auVar111,auVar111,0);
      register0x00001350 = auVar191;
      _local_460 = auVar191;
      fVar278 = *(float *)(bezier_basis0 + lVar21);
      fVar279 = *(float *)(bezier_basis0 + lVar21 + 4);
      fVar207 = *(float *)(bezier_basis0 + lVar21 + 8);
      fVar308 = *(float *)(bezier_basis0 + lVar21 + 0xc);
      fStack_4b0 = *(float *)(bezier_basis0 + lVar21 + 0x10);
      fStack_4ac = *(float *)(bezier_basis0 + lVar21 + 0x14);
      fStack_4a8 = *(float *)(bezier_basis0 + lVar21 + 0x18);
      fStack_4a4 = *(float *)(bezier_basis0 + lVar21 + 0x1c);
      fVar238 = auVar191._0_4_;
      fVar154 = auVar191._4_4_;
      fVar174 = auVar191._8_4_;
      fVar239 = auVar191._12_4_;
      auVar261._0_4_ = fVar238 * fVar278 + fVar282 * fVar236 + fVar153 * fVar202 + fVar263 * fVar310
      ;
      auVar261._4_4_ = fVar154 * fVar279 + fVar289 * fVar237 + fVar253 * fVar212 + fVar264 * fVar200
      ;
      auVar261._8_4_ = fVar174 * fVar207 + fVar291 * fVar306 + fVar206 * fVar221 + fVar283 * fVar313
      ;
      auVar261._12_4_ =
           fVar239 * fVar308 + fVar293 * fVar274 + fVar210 * fVar222 + fVar290 * fVar205;
      auVar261._16_4_ =
           fVar238 * fStack_4b0 + fVar282 * fVar276 + fVar153 * fVar223 + fVar263 * fVar187;
      auVar261._20_4_ =
           fVar154 * fStack_4ac + fVar289 * fVar204 + fVar253 * fVar225 + fVar264 * fVar199;
      auVar261._24_4_ =
           fVar174 * fStack_4a8 + fVar291 * fVar307 + fVar206 * fVar235 + fVar283 * fVar201;
      auVar261._28_4_ = fVar239 + 0.0;
      auVar191 = vshufps_avx(auVar111,auVar111,0x55);
      register0x00001410 = auVar191;
      _local_120 = auVar191;
      fVar247 = auVar191._0_4_;
      fVar248 = auVar191._4_4_;
      fVar249 = auVar191._8_4_;
      fVar250 = auVar191._12_4_;
      auVar315._0_4_ = fVar247 * fVar278 + fVar329 * fVar236 + fVar265 * fVar202 + fVar155 * fVar310
      ;
      auVar315._4_4_ = fVar248 * fVar279 + fVar332 * fVar237 + fVar273 * fVar212 + fVar170 * fVar200
      ;
      auVar315._8_4_ = fVar249 * fVar207 + fVar333 * fVar306 + fVar275 * fVar221 + fVar171 * fVar313
      ;
      auVar315._12_4_ =
           fVar250 * fVar308 + fVar334 * fVar274 + fVar277 * fVar222 + fVar172 * fVar205;
      auVar315._16_4_ =
           fVar247 * fStack_4b0 + fVar329 * fVar276 + fVar265 * fVar223 + fVar155 * fVar187;
      auVar315._20_4_ =
           fVar248 * fStack_4ac + fVar332 * fVar204 + fVar273 * fVar225 + fVar170 * fVar199;
      auVar315._24_4_ =
           fVar249 * fStack_4a8 + fVar333 * fVar307 + fVar275 * fVar235 + fVar171 * fVar201;
      auVar315._28_4_ = fVar172 + 0.0 + 0.0 + 0.0;
      auVar191 = vpermilps_avx(_local_710,0xff);
      register0x00001490 = auVar191;
      _local_c0 = auVar191;
      fVar251 = auVar191._0_4_;
      fVar252 = auVar191._4_4_;
      fVar254 = auVar191._8_4_;
      local_7e0._0_4_ =
           fVar251 * fVar278 + fVar224 * fVar236 + fVar292 * fVar202 + fVar297 * fVar310;
      local_7e0._4_4_ =
           fVar252 * fVar279 + fVar203 * fVar237 + fVar294 * fVar212 + fVar324 * fVar200;
      fStack_7d8 = fVar254 * fVar207 + fVar208 * fVar306 + fVar295 * fVar221 + fVar326 * fVar313;
      fStack_7d4 = auVar191._12_4_ * fVar308 +
                   auVar227._12_4_ * fVar274 + fVar296 * fVar222 + fVar327 * fVar205;
      fStack_7d0 = fVar251 * fStack_4b0 + fVar224 * fVar276 + fVar292 * fVar223 + fVar297 * fVar187;
      fStack_7cc = fVar252 * fStack_4ac + fVar203 * fVar204 + fVar294 * fVar225 + fVar324 * fVar199;
      fStack_7c8 = fVar254 * fStack_4a8 + fVar208 * fVar307 + fVar295 * fVar235 + fVar326 * fVar201;
      fStack_7c4 = *(float *)(bezier_basis0 + lVar21 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar236 = *(float *)(bezier_basis1 + lVar21 + 0x908);
      fVar237 = *(float *)(bezier_basis1 + lVar21 + 0x90c);
      fVar306 = *(float *)(bezier_basis1 + lVar21 + 0x910);
      fVar274 = *(float *)(bezier_basis1 + lVar21 + 0x914);
      fVar276 = *(float *)(bezier_basis1 + lVar21 + 0x918);
      fVar204 = *(float *)(bezier_basis1 + lVar21 + 0x91c);
      fVar307 = *(float *)(bezier_basis1 + lVar21 + 0x920);
      fVar310 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar21 + 0xd8c);
      fVar200 = *(float *)(bezier_basis1 + lVar21 + 0xd90);
      fVar313 = *(float *)(bezier_basis1 + lVar21 + 0xd94);
      fVar205 = *(float *)(bezier_basis1 + lVar21 + 0xd98);
      fVar187 = *(float *)(bezier_basis1 + lVar21 + 0xd9c);
      fVar199 = *(float *)(bezier_basis1 + lVar21 + 0xda0);
      fVar201 = *(float *)(bezier_basis1 + lVar21 + 0xda4);
      auVar120 = *(undefined1 (*) [28])(bezier_basis1 + lVar21 + 0xd8c);
      fVar280 = *(float *)(bezier_basis1 + lVar21 + 0x484);
      fVar281 = *(float *)(bezier_basis1 + lVar21 + 0x488);
      fVar209 = *(float *)(bezier_basis1 + lVar21 + 0x48c);
      fVar309 = *(float *)(bezier_basis1 + lVar21 + 0x490);
      fVar304 = *(float *)(bezier_basis1 + lVar21 + 0x494);
      fVar305 = *(float *)(bezier_basis1 + lVar21 + 0x498);
      fVar211 = *(float *)(bezier_basis1 + lVar21 + 0x49c);
      fVar186 = fVar296 + fStack_7c4 + 0.0;
      fVar173 = *(float *)(bezier_basis1 + lVar21);
      fVar134 = *(float *)(bezier_basis1 + lVar21 + 4);
      fVar148 = *(float *)(bezier_basis1 + lVar21 + 8);
      fVar149 = *(float *)(bezier_basis1 + lVar21 + 0xc);
      fVar150 = *(float *)(bezier_basis1 + lVar21 + 0x10);
      fVar151 = *(float *)(bezier_basis1 + lVar21 + 0x14);
      fVar152 = *(float *)(bezier_basis1 + lVar21 + 0x18);
      auVar216._0_4_ = fVar238 * fVar173 + fVar282 * fVar280 + fVar153 * fVar236 + fVar263 * fVar310
      ;
      auVar216._4_4_ = fVar154 * fVar134 + fVar289 * fVar281 + fVar253 * fVar237 + fVar264 * fVar200
      ;
      auVar216._8_4_ = fVar174 * fVar148 + fVar291 * fVar209 + fVar206 * fVar306 + fVar283 * fVar313
      ;
      auVar216._12_4_ =
           fVar239 * fVar149 + fVar293 * fVar309 + fVar210 * fVar274 + fVar290 * fVar205;
      auVar216._16_4_ =
           fVar238 * fVar150 + fVar282 * fVar304 + fVar153 * fVar276 + fVar263 * fVar187;
      auVar216._20_4_ =
           fVar154 * fVar151 + fVar289 * fVar305 + fVar253 * fVar204 + fVar264 * fVar199;
      auVar216._24_4_ =
           fVar174 * fVar152 + fVar291 * fVar211 + fVar206 * fVar307 + fVar283 * fVar201;
      auVar216._28_4_ = fVar327 + fVar186;
      auVar192._0_4_ = fVar247 * fVar173 + fVar329 * fVar280 + fVar236 * fVar265 + fVar310 * fVar155
      ;
      auVar192._4_4_ = fVar248 * fVar134 + fVar332 * fVar281 + fVar237 * fVar273 + fVar200 * fVar170
      ;
      auVar192._8_4_ = fVar249 * fVar148 + fVar333 * fVar209 + fVar306 * fVar275 + fVar313 * fVar171
      ;
      auVar192._12_4_ =
           fVar250 * fVar149 + fVar334 * fVar309 + fVar274 * fVar277 + fVar205 * fVar172;
      auVar192._16_4_ =
           fVar247 * fVar150 + fVar329 * fVar304 + fVar276 * fVar265 + fVar187 * fVar155;
      auVar192._20_4_ =
           fVar248 * fVar151 + fVar332 * fVar305 + fVar204 * fVar273 + fVar199 * fVar170;
      auVar192._24_4_ =
           fVar249 * fVar152 + fVar333 * fVar211 + fVar307 * fVar275 + fVar201 * fVar171;
      auVar192._28_4_ = fVar186 + fVar296 + fVar239 + 0.0;
      local_760._0_4_ =
           fVar224 * fVar280 + fVar292 * fVar236 + fVar297 * fVar310 + fVar251 * fVar173;
      local_760._4_4_ =
           fVar203 * fVar281 + fVar294 * fVar237 + fVar324 * fVar200 + fVar252 * fVar134;
      local_760._8_4_ =
           fVar208 * fVar209 + fVar295 * fVar306 + fVar326 * fVar313 + fVar254 * fVar148;
      local_760._12_4_ =
           auVar227._12_4_ * fVar309 + fVar296 * fVar274 + fVar327 * fVar205 +
           auVar191._12_4_ * fVar149;
      local_760._16_4_ =
           fVar224 * fVar304 + fVar292 * fVar276 + fVar297 * fVar187 + fVar251 * fVar150;
      local_760._20_4_ =
           fVar203 * fVar305 + fVar294 * fVar204 + fVar324 * fVar199 + fVar252 * fVar151;
      local_760._24_4_ =
           fVar208 * fVar211 + fVar295 * fVar307 + fVar326 * fVar201 + fVar254 * fVar152;
      local_760._28_4_ = fVar296 + fVar210 + fVar239 + fVar186;
      auVar232 = vsubps_avx(auVar216,auVar261);
      auVar272 = ZEXT3264(auVar232);
      auVar31 = vsubps_avx(auVar192,auVar315);
      fVar310 = auVar232._0_4_;
      fVar200 = auVar232._4_4_;
      auVar22._4_4_ = auVar315._4_4_ * fVar200;
      auVar22._0_4_ = auVar315._0_4_ * fVar310;
      fVar313 = auVar232._8_4_;
      auVar22._8_4_ = auVar315._8_4_ * fVar313;
      fVar205 = auVar232._12_4_;
      auVar22._12_4_ = auVar315._12_4_ * fVar205;
      fVar187 = auVar232._16_4_;
      auVar22._16_4_ = auVar315._16_4_ * fVar187;
      fVar199 = auVar232._20_4_;
      auVar22._20_4_ = auVar315._20_4_ * fVar199;
      fVar201 = auVar232._24_4_;
      auVar22._24_4_ = auVar315._24_4_ * fVar201;
      auVar22._28_4_ = fVar186;
      fVar186 = auVar31._0_4_;
      fVar224 = auVar31._4_4_;
      auVar32._4_4_ = fVar224 * auVar261._4_4_;
      auVar32._0_4_ = fVar186 * auVar261._0_4_;
      fVar203 = auVar31._8_4_;
      auVar32._8_4_ = fVar203 * auVar261._8_4_;
      fVar208 = auVar31._12_4_;
      auVar32._12_4_ = fVar208 * auVar261._12_4_;
      fVar251 = auVar31._16_4_;
      auVar32._16_4_ = fVar251 * auVar261._16_4_;
      fVar252 = auVar31._20_4_;
      auVar32._20_4_ = fVar252 * auVar261._20_4_;
      fVar254 = auVar31._24_4_;
      auVar32._24_4_ = fVar254 * auVar261._24_4_;
      auVar32._28_4_ = auVar192._28_4_;
      auVar32 = vsubps_avx(auVar22,auVar32);
      auVar22 = vmaxps_avx(_local_7e0,local_760);
      auVar39._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar200 * fVar200 + fVar224 * fVar224);
      auVar39._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar310 * fVar310 + fVar186 * fVar186);
      auVar39._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar313 * fVar313 + fVar203 * fVar203);
      auVar39._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar205 * fVar205 + fVar208 * fVar208);
      auVar39._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar187 * fVar187 + fVar251 * fVar251);
      auVar39._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar199 * fVar199 + fVar252 * fVar252);
      auVar39._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar201 * fVar201 + fVar254 * fVar254);
      auVar39._28_4_ = auVar216._28_4_ + auVar192._28_4_;
      auVar300._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar300._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar300._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar300._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar300._16_4_ = auVar32._16_4_ * auVar32._16_4_;
      auVar300._20_4_ = auVar32._20_4_ * auVar32._20_4_;
      auVar300._24_4_ = auVar32._24_4_ * auVar32._24_4_;
      auVar300._28_4_ = auVar32._28_4_;
      auVar22 = vcmpps_avx(auVar300,auVar39,2);
      local_600 = ZEXT416((uint)(float)(int)uVar15);
      auVar227 = vshufps_avx(local_600,local_600,0);
      auVar193._16_16_ = auVar227;
      auVar193._0_16_ = auVar227;
      auVar32 = vcmpps_avx(_DAT_01faff40,auVar193,1);
      auVar198 = ZEXT3264(auVar32);
      auVar112._8_4_ = auVar190._8_4_;
      auVar112._0_8_ = auVar190._0_8_;
      auVar112._12_4_ = auVar190._12_4_;
      auVar227 = vpermilps_avx(auVar112,0xaa);
      register0x00001490 = auVar227;
      _local_160 = auVar227;
      auVar191 = vpermilps_avx(auVar260,0xaa);
      register0x00001550 = auVar191;
      _local_4a0 = auVar191;
      auVar181 = vpermilps_avx(auVar269,0xaa);
      register0x00001590 = auVar181;
      _local_320 = auVar181;
      auVar23 = vpermilps_avx(auVar160,0xaa);
      register0x00001310 = auVar23;
      _local_340 = auVar23;
      auVar39 = auVar32 & auVar22;
      uVar127 = *(uint *)(ray + k * 4 + 0x30);
      auVar138 = ZEXT416((uint)(auVar138._0_4_ * 4.7683716e-07));
      _local_740 = auVar138;
      auVar300 = local_540;
      auVar193 = local_560;
      fVar310 = fVar265;
      fVar200 = fVar273;
      fVar313 = fVar275;
      fVar205 = fVar277;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0x7f,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar39 >> 0xbf,0) == '\0') &&
          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar39[0x1f])
      {
LAB_00f79b35:
        uVar130 = 0;
      }
      else {
        local_360 = vandps_avx(auVar22,auVar32);
        fVar251 = auVar227._0_4_;
        fVar252 = auVar227._4_4_;
        fVar254 = auVar227._8_4_;
        fVar292 = auVar227._12_4_;
        fVar294 = auVar191._0_4_;
        fVar295 = auVar191._4_4_;
        fVar296 = auVar191._8_4_;
        fVar297 = auVar191._12_4_;
        fVar324 = auVar181._0_4_;
        fVar326 = auVar181._4_4_;
        fVar327 = auVar181._8_4_;
        fVar328 = auVar181._12_4_;
        local_4e0._0_4_ = auVar120._0_4_;
        local_4e0._4_4_ = auVar120._4_4_;
        fStack_4d8 = auVar120._8_4_;
        fStack_4d4 = auVar120._12_4_;
        fStack_4d0 = auVar120._16_4_;
        fStack_4cc = auVar120._20_4_;
        fStack_4c8 = auVar120._24_4_;
        fVar186 = auVar23._0_4_;
        fVar224 = auVar23._4_4_;
        fVar203 = auVar23._8_4_;
        fVar208 = auVar23._12_4_;
        fVar187 = auVar32._28_4_ +
                  *(float *)(bezier_basis1 + lVar21 + 0x924) +
                  *(float *)(bezier_basis1 + lVar21 + 0x4a0);
        local_4e0._0_4_ =
             fVar251 * fVar173 +
             fVar294 * fVar280 + fVar324 * fVar236 + fVar186 * (float)local_4e0._0_4_;
        local_4e0._4_4_ =
             fVar252 * fVar134 +
             fVar295 * fVar281 + fVar326 * fVar237 + fVar224 * (float)local_4e0._4_4_;
        fStack_4d8 = fVar254 * fVar148 +
                     fVar296 * fVar209 + fVar327 * fVar306 + fVar203 * fStack_4d8;
        fStack_4d4 = fVar292 * fVar149 +
                     fVar297 * fVar309 + fVar328 * fVar274 + fVar208 * fStack_4d4;
        fStack_4d0 = fVar251 * fVar150 +
                     fVar294 * fVar304 + fVar324 * fVar276 + fVar186 * fStack_4d0;
        fStack_4cc = fVar252 * fVar151 +
                     fVar295 * fVar305 + fVar326 * fVar204 + fVar224 * fStack_4cc;
        fStack_4c8 = fVar254 * fVar152 +
                     fVar296 * fVar211 + fVar327 * fVar307 + fVar203 * fStack_4c8;
        fStack_4c4 = local_360._28_4_ + fVar187;
        local_6c0._0_4_ = auVar119._0_4_;
        local_6c0._4_4_ = auVar119._4_4_;
        fStack_6b8 = auVar119._8_4_;
        fStack_6b4 = auVar119._12_4_;
        fStack_6b0 = auVar119._16_4_;
        fStack_6ac = auVar119._20_4_;
        fStack_6a8 = auVar119._24_4_;
        local_6a0._0_4_ = auVar118._0_4_;
        local_6a0._4_4_ = auVar118._4_4_;
        fStack_698 = auVar118._8_4_;
        fStack_694 = auVar118._12_4_;
        fStack_690 = auVar118._16_4_;
        fStack_68c = auVar118._20_4_;
        fStack_688 = auVar118._24_4_;
        local_680 = fVar251 * fVar278 +
                    fVar294 * (float)local_6c0._0_4_ +
                    fVar324 * fVar202 + fVar186 * (float)local_6a0._0_4_;
        fStack_67c = fVar252 * fVar279 +
                     fVar295 * (float)local_6c0._4_4_ +
                     fVar326 * fVar212 + fVar224 * (float)local_6a0._4_4_;
        fStack_678 = fVar254 * fVar207 +
                     fVar296 * fStack_6b8 + fVar327 * fVar221 + fVar203 * fStack_698;
        fStack_674 = fVar292 * fVar308 +
                     fVar297 * fStack_6b4 + fVar328 * fVar222 + fVar208 * fStack_694;
        fStack_670 = fVar251 * fStack_4b0 +
                     fVar294 * fStack_6b0 + fVar324 * fVar223 + fVar186 * fStack_690;
        fStack_66c = fVar252 * fStack_4ac +
                     fVar295 * fStack_6ac + fVar326 * fVar225 + fVar224 * fStack_68c;
        fStack_668 = fVar254 * fStack_4a8 +
                     fVar296 * fStack_6a8 + fVar327 * fVar235 + fVar203 * fStack_688;
        fStack_664 = fStack_4c4 + fVar187 + local_360._28_4_ + auVar32._28_4_;
        fVar187 = *(float *)(bezier_basis0 + lVar21 + 0x1210);
        fVar199 = *(float *)(bezier_basis0 + lVar21 + 0x1214);
        fVar201 = *(float *)(bezier_basis0 + lVar21 + 0x1218);
        fVar202 = *(float *)(bezier_basis0 + lVar21 + 0x121c);
        fVar212 = *(float *)(bezier_basis0 + lVar21 + 0x1220);
        fVar221 = *(float *)(bezier_basis0 + lVar21 + 0x1224);
        fVar222 = *(float *)(bezier_basis0 + lVar21 + 0x1228);
        fVar223 = *(float *)(bezier_basis0 + lVar21 + 0x1694);
        fVar225 = *(float *)(bezier_basis0 + lVar21 + 0x1698);
        fVar235 = *(float *)(bezier_basis0 + lVar21 + 0x169c);
        fVar236 = *(float *)(bezier_basis0 + lVar21 + 0x16a0);
        fVar237 = *(float *)(bezier_basis0 + lVar21 + 0x16a4);
        fVar306 = *(float *)(bezier_basis0 + lVar21 + 0x16a8);
        fVar274 = *(float *)(bezier_basis0 + lVar21 + 0x16ac);
        fVar276 = *(float *)(bezier_basis0 + lVar21 + 0x1b18);
        fVar204 = *(float *)(bezier_basis0 + lVar21 + 0x1b1c);
        fVar307 = *(float *)(bezier_basis0 + lVar21 + 0x1b20);
        fVar278 = *(float *)(bezier_basis0 + lVar21 + 0x1b24);
        fVar279 = *(float *)(bezier_basis0 + lVar21 + 0x1b28);
        fVar207 = *(float *)(bezier_basis0 + lVar21 + 0x1b2c);
        fVar308 = *(float *)(bezier_basis0 + lVar21 + 0x1b30);
        fVar280 = *(float *)(bezier_basis0 + lVar21 + 0x1f9c);
        fVar281 = *(float *)(bezier_basis0 + lVar21 + 0x1fa0);
        fVar209 = *(float *)(bezier_basis0 + lVar21 + 0x1fa4);
        fVar309 = *(float *)(bezier_basis0 + lVar21 + 0x1fa8);
        fVar304 = *(float *)(bezier_basis0 + lVar21 + 0x1fac);
        fVar305 = *(float *)(bezier_basis0 + lVar21 + 0x1fb0);
        fVar211 = *(float *)(bezier_basis0 + lVar21 + 0x1fb4);
        fVar134 = *(float *)(bezier_basis1 + lVar21 + 0x4a0) + 0.0;
        fVar173 = *(float *)(bezier_basis0 + lVar21 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar21 + 0x1fb8);
        fVar148 = *(float *)(bezier_basis0 + lVar21 + 0x16b0) + fVar173;
        local_4c0 = fVar238 * fVar187 + fVar282 * fVar223 + fVar153 * fVar276 + fVar263 * fVar280;
        fStack_4bc = fVar154 * fVar199 + fVar289 * fVar225 + fVar253 * fVar204 + fVar264 * fVar281;
        fStack_4b8 = fVar174 * fVar201 + fVar291 * fVar235 + fVar206 * fVar307 + fVar283 * fVar209;
        fStack_4b4 = fVar239 * fVar202 + fVar293 * fVar236 + fVar210 * fVar278 + fVar290 * fVar309;
        fStack_4b0 = fVar238 * fVar212 + fVar282 * fVar237 + fVar153 * fVar279 + fVar263 * fVar304;
        fStack_4ac = fVar154 * fVar221 + fVar289 * fVar306 + fVar253 * fVar207 + fVar264 * fVar305;
        fStack_4a8 = fVar174 * fVar222 + fVar291 * fVar274 + fVar206 * fVar308 + fVar283 * fVar211;
        fStack_4a4 = *(float *)(bezier_basis0 + lVar21 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar21 + 0x1fb8) + fVar134;
        auVar164._0_4_ =
             fVar247 * fVar187 + fVar265 * fVar276 + fVar280 * fVar155 + fVar329 * fVar223;
        auVar164._4_4_ =
             fVar248 * fVar199 + fVar273 * fVar204 + fVar281 * fVar170 + fVar332 * fVar225;
        auVar164._8_4_ =
             fVar249 * fVar201 + fVar275 * fVar307 + fVar209 * fVar171 + fVar333 * fVar235;
        auVar164._12_4_ =
             fVar250 * fVar202 + fVar277 * fVar278 + fVar309 * fVar172 + fVar334 * fVar236;
        auVar164._16_4_ =
             fVar247 * fVar212 + fVar265 * fVar279 + fVar304 * fVar155 + fVar329 * fVar237;
        auVar164._20_4_ =
             fVar248 * fVar221 + fVar273 * fVar207 + fVar305 * fVar170 + fVar332 * fVar306;
        auVar164._24_4_ =
             fVar249 * fVar222 + fVar275 * fVar308 + fVar211 * fVar171 + fVar333 * fVar274;
        auVar164._28_4_ = fVar173 + auVar232._28_4_ + 0.0 + fVar134;
        auVar228._0_4_ =
             fVar294 * fVar223 + fVar324 * fVar276 + fVar186 * fVar280 + fVar251 * fVar187;
        auVar228._4_4_ =
             fVar295 * fVar225 + fVar326 * fVar204 + fVar224 * fVar281 + fVar252 * fVar199;
        auVar228._8_4_ =
             fVar296 * fVar235 + fVar327 * fVar307 + fVar203 * fVar209 + fVar254 * fVar201;
        auVar228._12_4_ =
             fVar297 * fVar236 + fVar328 * fVar278 + fVar208 * fVar309 + fVar292 * fVar202;
        auVar228._16_4_ =
             fVar294 * fVar237 + fVar324 * fVar279 + fVar186 * fVar304 + fVar251 * fVar212;
        auVar228._20_4_ =
             fVar295 * fVar306 + fVar326 * fVar207 + fVar224 * fVar305 + fVar252 * fVar221;
        auVar228._24_4_ =
             fVar296 * fVar274 + fVar327 * fVar308 + fVar203 * fVar211 + fVar254 * fVar222;
        auVar228._28_4_ = fVar148 + *(float *)(bezier_basis0 + lVar21 + 0x122c);
        fVar187 = *(float *)(bezier_basis1 + lVar21 + 0x1b18);
        fVar199 = *(float *)(bezier_basis1 + lVar21 + 0x1b1c);
        fVar201 = *(float *)(bezier_basis1 + lVar21 + 0x1b20);
        fVar202 = *(float *)(bezier_basis1 + lVar21 + 0x1b24);
        fVar212 = *(float *)(bezier_basis1 + lVar21 + 0x1b28);
        fVar221 = *(float *)(bezier_basis1 + lVar21 + 0x1b2c);
        fVar222 = *(float *)(bezier_basis1 + lVar21 + 0x1b30);
        fVar223 = *(float *)(bezier_basis1 + lVar21 + 0x1f9c);
        fVar225 = *(float *)(bezier_basis1 + lVar21 + 0x1fa0);
        fVar235 = *(float *)(bezier_basis1 + lVar21 + 0x1fa4);
        fVar236 = *(float *)(bezier_basis1 + lVar21 + 0x1fa8);
        fVar237 = *(float *)(bezier_basis1 + lVar21 + 0x1fac);
        fVar306 = *(float *)(bezier_basis1 + lVar21 + 0x1fb0);
        fVar274 = *(float *)(bezier_basis1 + lVar21 + 0x1fb4);
        fVar276 = *(float *)(bezier_basis1 + lVar21 + 0x1694);
        fVar204 = *(float *)(bezier_basis1 + lVar21 + 0x1698);
        fVar307 = *(float *)(bezier_basis1 + lVar21 + 0x169c);
        fVar278 = *(float *)(bezier_basis1 + lVar21 + 0x16a0);
        fVar279 = *(float *)(bezier_basis1 + lVar21 + 0x16a4);
        fVar207 = *(float *)(bezier_basis1 + lVar21 + 0x16a8);
        fVar308 = *(float *)(bezier_basis1 + lVar21 + 0x16ac);
        fVar280 = *(float *)(bezier_basis1 + lVar21 + 0x1210);
        fVar281 = *(float *)(bezier_basis1 + lVar21 + 0x1214);
        fVar209 = *(float *)(bezier_basis1 + lVar21 + 0x1218);
        fVar309 = *(float *)(bezier_basis1 + lVar21 + 0x121c);
        fVar304 = *(float *)(bezier_basis1 + lVar21 + 0x1220);
        fVar305 = *(float *)(bezier_basis1 + lVar21 + 0x1224);
        fVar211 = *(float *)(bezier_basis1 + lVar21 + 0x1228);
        auVar242._0_4_ =
             fVar238 * fVar280 + fVar282 * fVar276 + fVar153 * fVar187 + fVar263 * fVar223;
        auVar242._4_4_ =
             fVar154 * fVar281 + fVar289 * fVar204 + fVar253 * fVar199 + fVar264 * fVar225;
        auVar242._8_4_ =
             fVar174 * fVar209 + fVar291 * fVar307 + fVar206 * fVar201 + fVar283 * fVar235;
        auVar242._12_4_ =
             fVar239 * fVar309 + fVar293 * fVar278 + fVar210 * fVar202 + fVar290 * fVar236;
        auVar242._16_4_ =
             fVar238 * fVar304 + fVar282 * fVar279 + fVar153 * fVar212 + fVar263 * fVar237;
        auVar242._20_4_ =
             fVar154 * fVar305 + fVar289 * fVar207 + fVar253 * fVar221 + fVar264 * fVar306;
        auVar242._24_4_ =
             fVar174 * fVar211 + fVar291 * fVar308 + fVar206 * fVar222 + fVar283 * fVar274;
        auVar242._28_4_ = fVar292 + fVar292 + fVar148 + fVar290;
        auVar286._0_4_ =
             fVar247 * fVar280 + fVar329 * fVar276 + fVar265 * fVar187 + fVar223 * fVar155;
        auVar286._4_4_ =
             fVar248 * fVar281 + fVar332 * fVar204 + fVar273 * fVar199 + fVar225 * fVar170;
        auVar286._8_4_ =
             fVar249 * fVar209 + fVar333 * fVar307 + fVar275 * fVar201 + fVar235 * fVar171;
        auVar286._12_4_ =
             fVar250 * fVar309 + fVar334 * fVar278 + fVar277 * fVar202 + fVar236 * fVar172;
        auVar286._16_4_ =
             fVar247 * fVar304 + fVar329 * fVar279 + fVar265 * fVar212 + fVar237 * fVar155;
        auVar286._20_4_ =
             fVar248 * fVar305 + fVar332 * fVar207 + fVar273 * fVar221 + fVar306 * fVar170;
        auVar286._24_4_ =
             fVar249 * fVar211 + fVar333 * fVar308 + fVar275 * fVar222 + fVar274 * fVar171;
        auVar286._28_4_ = fVar292 + fVar292 + fVar292 + fVar148;
        auVar184._0_4_ =
             fVar251 * fVar280 + fVar294 * fVar276 + fVar324 * fVar187 + fVar186 * fVar223;
        auVar184._4_4_ =
             fVar252 * fVar281 + fVar295 * fVar204 + fVar326 * fVar199 + fVar224 * fVar225;
        auVar184._8_4_ =
             fVar254 * fVar209 + fVar296 * fVar307 + fVar327 * fVar201 + fVar203 * fVar235;
        auVar184._12_4_ =
             fVar292 * fVar309 + fVar297 * fVar278 + fVar328 * fVar202 + fVar208 * fVar236;
        auVar184._16_4_ =
             fVar251 * fVar304 + fVar294 * fVar279 + fVar324 * fVar212 + fVar186 * fVar237;
        auVar184._20_4_ =
             fVar252 * fVar305 + fVar295 * fVar207 + fVar326 * fVar221 + fVar224 * fVar306;
        auVar184._24_4_ =
             fVar254 * fVar211 + fVar296 * fVar308 + fVar327 * fVar222 + fVar203 * fVar274;
        auVar184._28_4_ =
             *(float *)(bezier_basis1 + lVar21 + 0x122c) +
             *(float *)(bezier_basis1 + lVar21 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar21 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar21 + 0x1fb8);
        auVar217._8_4_ = 0x7fffffff;
        auVar217._0_8_ = 0x7fffffff7fffffff;
        auVar217._12_4_ = 0x7fffffff;
        auVar217._16_4_ = 0x7fffffff;
        auVar217._20_4_ = 0x7fffffff;
        auVar217._24_4_ = 0x7fffffff;
        auVar217._28_4_ = 0x7fffffff;
        auVar117._4_4_ = fStack_4bc;
        auVar117._0_4_ = local_4c0;
        auVar117._8_4_ = fStack_4b8;
        auVar117._12_4_ = fStack_4b4;
        auVar117._16_4_ = fStack_4b0;
        auVar117._20_4_ = fStack_4ac;
        auVar117._24_4_ = fStack_4a8;
        auVar117._28_4_ = fStack_4a4;
        auVar22 = vandps_avx(auVar117,auVar217);
        auVar32 = vandps_avx(auVar164,auVar217);
        auVar32 = vmaxps_avx(auVar22,auVar32);
        auVar22 = vandps_avx(auVar228,auVar217);
        auVar22 = vmaxps_avx(auVar32,auVar22);
        auVar138 = vpermilps_avx(auVar138,0);
        auVar229._16_16_ = auVar138;
        auVar229._0_16_ = auVar138;
        auVar22 = vcmpps_avx(auVar22,auVar229,1);
        auVar39 = vblendvps_avx(auVar117,auVar232,auVar22);
        auVar300 = vblendvps_avx(auVar164,auVar31,auVar22);
        auVar22 = vandps_avx(auVar242,auVar217);
        auVar32 = vandps_avx(auVar286,auVar217);
        auVar193 = vmaxps_avx(auVar22,auVar32);
        auVar22 = vandps_avx(auVar184,auVar217);
        auVar22 = vmaxps_avx(auVar193,auVar22);
        auVar193 = vcmpps_avx(auVar22,auVar229,1);
        auVar22 = vblendvps_avx(auVar242,auVar232,auVar193);
        auVar232 = vblendvps_avx(auVar286,auVar31,auVar193);
        fVar134 = auVar39._0_4_;
        fVar148 = auVar39._4_4_;
        fVar149 = auVar39._8_4_;
        fVar150 = auVar39._12_4_;
        fVar151 = auVar39._16_4_;
        fVar152 = auVar39._20_4_;
        fVar186 = auVar39._24_4_;
        fVar238 = -auVar39._28_4_;
        fVar153 = auVar22._0_4_;
        fVar224 = auVar22._4_4_;
        fVar253 = auVar22._8_4_;
        fVar203 = auVar22._12_4_;
        fVar206 = auVar22._16_4_;
        fVar208 = auVar22._20_4_;
        fVar210 = auVar22._24_4_;
        fVar187 = auVar300._0_4_;
        fVar212 = auVar300._4_4_;
        fVar225 = auVar300._8_4_;
        fVar306 = auVar300._12_4_;
        fVar307 = auVar300._16_4_;
        fVar308 = auVar300._20_4_;
        fVar309 = auVar300._24_4_;
        auVar141._0_4_ = fVar187 * fVar187 + fVar134 * fVar134;
        auVar141._4_4_ = fVar212 * fVar212 + fVar148 * fVar148;
        auVar141._8_4_ = fVar225 * fVar225 + fVar149 * fVar149;
        auVar141._12_4_ = fVar306 * fVar306 + fVar150 * fVar150;
        auVar141._16_4_ = fVar307 * fVar307 + fVar151 * fVar151;
        auVar141._20_4_ = fVar308 * fVar308 + fVar152 * fVar152;
        auVar141._24_4_ = fVar309 * fVar309 + fVar186 * fVar186;
        auVar141._28_4_ = auVar286._28_4_ + auVar39._28_4_;
        auVar31 = vrsqrtps_avx(auVar141);
        fVar199 = auVar31._0_4_;
        fVar201 = auVar31._4_4_;
        auVar34._4_4_ = fVar201 * 1.5;
        auVar34._0_4_ = fVar199 * 1.5;
        fVar202 = auVar31._8_4_;
        auVar34._8_4_ = fVar202 * 1.5;
        fVar221 = auVar31._12_4_;
        auVar34._12_4_ = fVar221 * 1.5;
        fVar222 = auVar31._16_4_;
        auVar34._16_4_ = fVar222 * 1.5;
        fVar223 = auVar31._20_4_;
        auVar34._20_4_ = fVar223 * 1.5;
        fVar235 = auVar31._24_4_;
        fVar173 = auVar32._28_4_;
        auVar34._24_4_ = fVar235 * 1.5;
        auVar34._28_4_ = fVar173;
        auVar31._4_4_ = fVar201 * fVar201 * fVar201 * auVar141._4_4_ * 0.5;
        auVar31._0_4_ = fVar199 * fVar199 * fVar199 * auVar141._0_4_ * 0.5;
        auVar31._8_4_ = fVar202 * fVar202 * fVar202 * auVar141._8_4_ * 0.5;
        auVar31._12_4_ = fVar221 * fVar221 * fVar221 * auVar141._12_4_ * 0.5;
        auVar31._16_4_ = fVar222 * fVar222 * fVar222 * auVar141._16_4_ * 0.5;
        auVar31._20_4_ = fVar223 * fVar223 * fVar223 * auVar141._20_4_ * 0.5;
        auVar31._24_4_ = fVar235 * fVar235 * fVar235 * auVar141._24_4_ * 0.5;
        auVar31._28_4_ = auVar141._28_4_;
        auVar32 = vsubps_avx(auVar34,auVar31);
        fVar199 = auVar32._0_4_;
        fVar221 = auVar32._4_4_;
        fVar235 = auVar32._8_4_;
        fVar274 = auVar32._12_4_;
        fVar278 = auVar32._16_4_;
        fVar280 = auVar32._20_4_;
        fVar304 = auVar32._24_4_;
        fVar201 = auVar232._0_4_;
        fVar222 = auVar232._4_4_;
        fVar236 = auVar232._8_4_;
        fVar276 = auVar232._12_4_;
        fVar279 = auVar232._16_4_;
        fVar281 = auVar232._20_4_;
        fVar305 = auVar232._24_4_;
        auVar142._0_4_ = fVar201 * fVar201 + fVar153 * fVar153;
        auVar142._4_4_ = fVar222 * fVar222 + fVar224 * fVar224;
        auVar142._8_4_ = fVar236 * fVar236 + fVar253 * fVar253;
        auVar142._12_4_ = fVar276 * fVar276 + fVar203 * fVar203;
        auVar142._16_4_ = fVar279 * fVar279 + fVar206 * fVar206;
        auVar142._20_4_ = fVar281 * fVar281 + fVar208 * fVar208;
        auVar142._24_4_ = fVar305 * fVar305 + fVar210 * fVar210;
        auVar142._28_4_ = auVar22._28_4_ + auVar32._28_4_;
        auVar22 = vrsqrtps_avx(auVar142);
        fVar202 = auVar22._0_4_;
        fVar223 = auVar22._4_4_;
        auVar35._4_4_ = fVar223 * 1.5;
        auVar35._0_4_ = fVar202 * 1.5;
        fVar237 = auVar22._8_4_;
        auVar35._8_4_ = fVar237 * 1.5;
        fVar204 = auVar22._12_4_;
        auVar35._12_4_ = fVar204 * 1.5;
        fVar207 = auVar22._16_4_;
        auVar35._16_4_ = fVar207 * 1.5;
        fVar209 = auVar22._20_4_;
        auVar35._20_4_ = fVar209 * 1.5;
        fVar211 = auVar22._24_4_;
        auVar35._24_4_ = fVar211 * 1.5;
        auVar35._28_4_ = fVar173;
        auVar36._4_4_ = fVar223 * fVar223 * fVar223 * auVar142._4_4_ * 0.5;
        auVar36._0_4_ = fVar202 * fVar202 * fVar202 * auVar142._0_4_ * 0.5;
        auVar36._8_4_ = fVar237 * fVar237 * fVar237 * auVar142._8_4_ * 0.5;
        auVar36._12_4_ = fVar204 * fVar204 * fVar204 * auVar142._12_4_ * 0.5;
        auVar36._16_4_ = fVar207 * fVar207 * fVar207 * auVar142._16_4_ * 0.5;
        auVar36._20_4_ = fVar209 * fVar209 * fVar209 * auVar142._20_4_ * 0.5;
        auVar36._24_4_ = fVar211 * fVar211 * fVar211 * auVar142._24_4_ * 0.5;
        auVar36._28_4_ = auVar142._28_4_;
        auVar22 = vsubps_avx(auVar35,auVar36);
        fVar202 = auVar22._0_4_;
        fVar223 = auVar22._4_4_;
        fVar237 = auVar22._8_4_;
        fVar204 = auVar22._12_4_;
        fVar207 = auVar22._16_4_;
        fVar209 = auVar22._20_4_;
        fVar211 = auVar22._24_4_;
        fVar187 = (float)local_7e0._0_4_ * fVar187 * fVar199;
        fVar212 = (float)local_7e0._4_4_ * fVar212 * fVar221;
        auVar37._4_4_ = fVar212;
        auVar37._0_4_ = fVar187;
        fVar225 = fStack_7d8 * fVar225 * fVar235;
        auVar37._8_4_ = fVar225;
        fVar306 = fStack_7d4 * fVar306 * fVar274;
        auVar37._12_4_ = fVar306;
        fVar307 = fStack_7d0 * fVar307 * fVar278;
        auVar37._16_4_ = fVar307;
        fVar308 = fStack_7cc * fVar308 * fVar280;
        auVar37._20_4_ = fVar308;
        fVar309 = fStack_7c8 * fVar309 * fVar304;
        auVar37._24_4_ = fVar309;
        auVar37._28_4_ = fVar173;
        local_6a0._4_4_ = fVar212 + auVar261._4_4_;
        local_6a0._0_4_ = fVar187 + auVar261._0_4_;
        fStack_698 = fVar225 + auVar261._8_4_;
        fStack_694 = fVar306 + auVar261._12_4_;
        fStack_690 = fVar307 + auVar261._16_4_;
        fStack_68c = fVar308 + auVar261._20_4_;
        fStack_688 = fVar309 + auVar261._24_4_;
        fStack_684 = fVar173 + auVar261._28_4_;
        fVar187 = (float)local_7e0._0_4_ * fVar199 * -fVar134;
        fVar212 = (float)local_7e0._4_4_ * fVar221 * -fVar148;
        auVar38._4_4_ = fVar212;
        auVar38._0_4_ = fVar187;
        fVar225 = fStack_7d8 * fVar235 * -fVar149;
        auVar38._8_4_ = fVar225;
        fVar306 = fStack_7d4 * fVar274 * -fVar150;
        auVar38._12_4_ = fVar306;
        fVar307 = fStack_7d0 * fVar278 * -fVar151;
        auVar38._16_4_ = fVar307;
        fVar308 = fStack_7cc * fVar280 * -fVar152;
        auVar38._20_4_ = fVar308;
        fVar309 = fStack_7c8 * fVar304 * -fVar186;
        auVar38._24_4_ = fVar309;
        auVar38._28_4_ = fVar238;
        local_6c0._4_4_ = auVar315._4_4_ + fVar212;
        local_6c0._0_4_ = auVar315._0_4_ + fVar187;
        fStack_6b8 = auVar315._8_4_ + fVar225;
        fStack_6b4 = auVar315._12_4_ + fVar306;
        fStack_6b0 = auVar315._16_4_ + fVar307;
        fStack_6ac = auVar315._20_4_ + fVar308;
        fStack_6a8 = auVar315._24_4_ + fVar309;
        fStack_6a4 = auVar315._28_4_ + fVar238;
        fVar187 = fVar199 * 0.0 * (float)local_7e0._0_4_;
        fVar199 = fVar221 * 0.0 * (float)local_7e0._4_4_;
        auVar33._4_4_ = fVar199;
        auVar33._0_4_ = fVar187;
        fVar212 = fVar235 * 0.0 * fStack_7d8;
        auVar33._8_4_ = fVar212;
        fVar221 = fVar274 * 0.0 * fStack_7d4;
        auVar33._12_4_ = fVar221;
        fVar225 = fVar278 * 0.0 * fStack_7d0;
        auVar33._16_4_ = fVar225;
        fVar235 = fVar280 * 0.0 * fStack_7cc;
        auVar33._20_4_ = fVar235;
        fVar306 = fVar304 * 0.0 * fStack_7c8;
        auVar33._24_4_ = fVar306;
        auVar33._28_4_ = fVar297;
        auVar114._4_4_ = fStack_67c;
        auVar114._0_4_ = local_680;
        auVar114._8_4_ = fStack_678;
        auVar114._12_4_ = fStack_674;
        auVar114._16_4_ = fStack_670;
        auVar114._20_4_ = fStack_66c;
        auVar114._24_4_ = fStack_668;
        auVar114._28_4_ = fStack_664;
        auVar243._0_4_ = local_680 + fVar187;
        auVar243._4_4_ = fStack_67c + fVar199;
        auVar243._8_4_ = fStack_678 + fVar212;
        auVar243._12_4_ = fStack_674 + fVar221;
        auVar243._16_4_ = fStack_670 + fVar225;
        auVar243._20_4_ = fStack_66c + fVar235;
        auVar243._24_4_ = fStack_668 + fVar306;
        auVar243._28_4_ = fStack_664 + fVar297;
        fVar187 = (float)local_760._0_4_ * fVar201 * fVar202;
        fVar199 = local_760._4_4_ * fVar222 * fVar223;
        auVar40._4_4_ = fVar199;
        auVar40._0_4_ = fVar187;
        fVar201 = local_760._8_4_ * fVar236 * fVar237;
        auVar40._8_4_ = fVar201;
        fVar212 = local_760._12_4_ * fVar276 * fVar204;
        auVar40._12_4_ = fVar212;
        fVar221 = local_760._16_4_ * fVar279 * fVar207;
        auVar40._16_4_ = fVar221;
        fVar222 = local_760._20_4_ * fVar281 * fVar209;
        auVar40._20_4_ = fVar222;
        fVar225 = local_760._24_4_ * fVar305 * fVar211;
        auVar40._24_4_ = fVar225;
        auVar40._28_4_ = auVar232._28_4_;
        auVar193 = vsubps_avx(auVar261,auVar37);
        auVar299._0_4_ = auVar216._0_4_ + fVar187;
        auVar299._4_4_ = auVar216._4_4_ + fVar199;
        auVar299._8_4_ = auVar216._8_4_ + fVar201;
        auVar299._12_4_ = auVar216._12_4_ + fVar212;
        auVar299._16_4_ = auVar216._16_4_ + fVar221;
        auVar299._20_4_ = auVar216._20_4_ + fVar222;
        auVar299._24_4_ = auVar216._24_4_ + fVar225;
        auVar299._28_4_ = auVar216._28_4_ + auVar232._28_4_;
        fVar187 = (float)local_760._0_4_ * fVar202 * -fVar153;
        fVar199 = local_760._4_4_ * fVar223 * -fVar224;
        auVar232._4_4_ = fVar199;
        auVar232._0_4_ = fVar187;
        fVar201 = local_760._8_4_ * fVar237 * -fVar253;
        auVar232._8_4_ = fVar201;
        fVar212 = local_760._12_4_ * fVar204 * -fVar203;
        auVar232._12_4_ = fVar212;
        fVar221 = local_760._16_4_ * fVar207 * -fVar206;
        auVar232._16_4_ = fVar221;
        fVar222 = local_760._20_4_ * fVar209 * -fVar208;
        auVar232._20_4_ = fVar222;
        fVar225 = local_760._24_4_ * fVar211 * -fVar210;
        auVar232._24_4_ = fVar225;
        auVar232._28_4_ = fVar328;
        auVar261 = vsubps_avx(auVar315,auVar38);
        auVar312._0_4_ = fVar187 + auVar192._0_4_;
        auVar312._4_4_ = fVar199 + auVar192._4_4_;
        auVar312._8_4_ = fVar201 + auVar192._8_4_;
        auVar312._12_4_ = fVar212 + auVar192._12_4_;
        auVar312._16_4_ = fVar221 + auVar192._16_4_;
        auVar312._20_4_ = fVar222 + auVar192._20_4_;
        auVar312._24_4_ = fVar225 + auVar192._24_4_;
        auVar312._28_4_ = fVar328 + auVar192._28_4_;
        fVar187 = fVar202 * 0.0 * (float)local_760._0_4_;
        fVar199 = fVar223 * 0.0 * local_760._4_4_;
        auVar41._4_4_ = fVar199;
        auVar41._0_4_ = fVar187;
        fVar201 = fVar237 * 0.0 * local_760._8_4_;
        auVar41._8_4_ = fVar201;
        fVar202 = fVar204 * 0.0 * local_760._12_4_;
        auVar41._12_4_ = fVar202;
        fVar212 = fVar207 * 0.0 * local_760._16_4_;
        auVar41._16_4_ = fVar212;
        fVar221 = fVar209 * 0.0 * local_760._20_4_;
        auVar41._20_4_ = fVar221;
        fVar222 = fVar211 * 0.0 * local_760._24_4_;
        auVar41._24_4_ = fVar222;
        auVar41._28_4_ = fVar238;
        auVar315 = vsubps_avx(auVar114,auVar33);
        auVar330._0_4_ = (float)local_4e0._0_4_ + fVar187;
        auVar330._4_4_ = (float)local_4e0._4_4_ + fVar199;
        auVar330._8_4_ = fStack_4d8 + fVar201;
        auVar330._12_4_ = fStack_4d4 + fVar202;
        auVar330._16_4_ = fStack_4d0 + fVar212;
        auVar330._20_4_ = fStack_4cc + fVar221;
        auVar330._24_4_ = fStack_4c8 + fVar222;
        auVar330._28_4_ = fStack_4c4 + fVar238;
        auVar22 = vsubps_avx(auVar216,auVar40);
        auVar32 = vsubps_avx(auVar192,auVar232);
        auVar232 = vsubps_avx(_local_4e0,auVar41);
        auVar31 = vsubps_avx(auVar312,auVar261);
        auVar39 = vsubps_avx(auVar330,auVar315);
        auVar42._4_4_ = auVar315._4_4_ * auVar31._4_4_;
        auVar42._0_4_ = auVar315._0_4_ * auVar31._0_4_;
        auVar42._8_4_ = auVar315._8_4_ * auVar31._8_4_;
        auVar42._12_4_ = auVar315._12_4_ * auVar31._12_4_;
        auVar42._16_4_ = auVar315._16_4_ * auVar31._16_4_;
        auVar42._20_4_ = auVar315._20_4_ * auVar31._20_4_;
        auVar42._24_4_ = auVar315._24_4_ * auVar31._24_4_;
        auVar42._28_4_ = fVar328;
        auVar43._4_4_ = auVar261._4_4_ * auVar39._4_4_;
        auVar43._0_4_ = auVar261._0_4_ * auVar39._0_4_;
        auVar43._8_4_ = auVar261._8_4_ * auVar39._8_4_;
        auVar43._12_4_ = auVar261._12_4_ * auVar39._12_4_;
        auVar43._16_4_ = auVar261._16_4_ * auVar39._16_4_;
        auVar43._20_4_ = auVar261._20_4_ * auVar39._20_4_;
        auVar43._24_4_ = auVar261._24_4_ * auVar39._24_4_;
        auVar43._28_4_ = auVar192._28_4_;
        auVar300 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar193._4_4_ * auVar39._4_4_;
        auVar44._0_4_ = auVar193._0_4_ * auVar39._0_4_;
        auVar44._8_4_ = auVar193._8_4_ * auVar39._8_4_;
        auVar44._12_4_ = auVar193._12_4_ * auVar39._12_4_;
        auVar44._16_4_ = auVar193._16_4_ * auVar39._16_4_;
        auVar44._20_4_ = auVar193._20_4_ * auVar39._20_4_;
        auVar44._24_4_ = auVar193._24_4_ * auVar39._24_4_;
        auVar44._28_4_ = auVar39._28_4_;
        auVar34 = vsubps_avx(auVar299,auVar193);
        auVar45._4_4_ = auVar315._4_4_ * auVar34._4_4_;
        auVar45._0_4_ = auVar315._0_4_ * auVar34._0_4_;
        auVar45._8_4_ = auVar315._8_4_ * auVar34._8_4_;
        auVar45._12_4_ = auVar315._12_4_ * auVar34._12_4_;
        auVar45._16_4_ = auVar315._16_4_ * auVar34._16_4_;
        auVar45._20_4_ = auVar315._20_4_ * auVar34._20_4_;
        auVar45._24_4_ = auVar315._24_4_ * auVar34._24_4_;
        auVar45._28_4_ = auVar216._28_4_;
        auVar35 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar34._4_4_ * auVar261._4_4_;
        auVar46._0_4_ = auVar34._0_4_ * auVar261._0_4_;
        auVar46._8_4_ = auVar34._8_4_ * auVar261._8_4_;
        auVar46._12_4_ = auVar34._12_4_ * auVar261._12_4_;
        auVar46._16_4_ = auVar34._16_4_ * auVar261._16_4_;
        auVar46._20_4_ = auVar34._20_4_ * auVar261._20_4_;
        auVar46._24_4_ = auVar34._24_4_ * auVar261._24_4_;
        auVar46._28_4_ = auVar39._28_4_;
        auVar47._4_4_ = auVar193._4_4_ * auVar31._4_4_;
        auVar47._0_4_ = auVar193._0_4_ * auVar31._0_4_;
        auVar47._8_4_ = auVar193._8_4_ * auVar31._8_4_;
        auVar47._12_4_ = auVar193._12_4_ * auVar31._12_4_;
        auVar47._16_4_ = auVar193._16_4_ * auVar31._16_4_;
        auVar47._20_4_ = auVar193._20_4_ * auVar31._20_4_;
        auVar47._24_4_ = auVar193._24_4_ * auVar31._24_4_;
        auVar47._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar47,auVar46);
        auVar143._0_4_ = auVar300._0_4_ * 0.0 + auVar31._0_4_ + auVar35._0_4_ * 0.0;
        auVar143._4_4_ = auVar300._4_4_ * 0.0 + auVar31._4_4_ + auVar35._4_4_ * 0.0;
        auVar143._8_4_ = auVar300._8_4_ * 0.0 + auVar31._8_4_ + auVar35._8_4_ * 0.0;
        auVar143._12_4_ = auVar300._12_4_ * 0.0 + auVar31._12_4_ + auVar35._12_4_ * 0.0;
        auVar143._16_4_ = auVar300._16_4_ * 0.0 + auVar31._16_4_ + auVar35._16_4_ * 0.0;
        auVar143._20_4_ = auVar300._20_4_ * 0.0 + auVar31._20_4_ + auVar35._20_4_ * 0.0;
        auVar143._24_4_ = auVar300._24_4_ * 0.0 + auVar31._24_4_ + auVar35._24_4_ * 0.0;
        auVar143._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar35._28_4_;
        auVar34 = vcmpps_avx(auVar143,ZEXT432(0) << 0x20,2);
        auVar22 = vblendvps_avx(auVar22,_local_6a0,auVar34);
        auVar32 = vblendvps_avx(auVar32,_local_6c0,auVar34);
        auVar232 = vblendvps_avx(auVar232,auVar243,auVar34);
        auVar31 = vblendvps_avx(auVar193,auVar299,auVar34);
        auVar39 = vblendvps_avx(auVar261,auVar312,auVar34);
        auVar300 = vblendvps_avx(auVar315,auVar330,auVar34);
        auVar193 = vblendvps_avx(auVar299,auVar193,auVar34);
        auVar261 = vblendvps_avx(auVar312,auVar261,auVar34);
        auVar138 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar315 = vblendvps_avx(auVar330,auVar315,auVar34);
        auVar193 = vsubps_avx(auVar193,auVar22);
        auVar35 = vsubps_avx(auVar261,auVar32);
        auVar315 = vsubps_avx(auVar315,auVar232);
        auVar36 = vsubps_avx(auVar32,auVar39);
        fVar187 = auVar35._0_4_;
        fVar186 = auVar232._0_4_;
        fVar221 = auVar35._4_4_;
        fVar153 = auVar232._4_4_;
        auVar48._4_4_ = fVar153 * fVar221;
        auVar48._0_4_ = fVar186 * fVar187;
        fVar236 = auVar35._8_4_;
        fVar224 = auVar232._8_4_;
        auVar48._8_4_ = fVar224 * fVar236;
        fVar204 = auVar35._12_4_;
        fVar253 = auVar232._12_4_;
        auVar48._12_4_ = fVar253 * fVar204;
        fVar308 = auVar35._16_4_;
        fVar203 = auVar232._16_4_;
        auVar48._16_4_ = fVar203 * fVar308;
        fVar304 = auVar35._20_4_;
        fVar206 = auVar232._20_4_;
        auVar48._20_4_ = fVar206 * fVar304;
        fVar148 = auVar35._24_4_;
        fVar208 = auVar232._24_4_;
        auVar48._24_4_ = fVar208 * fVar148;
        auVar48._28_4_ = auVar261._28_4_;
        fVar199 = auVar32._0_4_;
        fVar249 = auVar315._0_4_;
        fVar222 = auVar32._4_4_;
        fVar250 = auVar315._4_4_;
        auVar49._4_4_ = fVar250 * fVar222;
        auVar49._0_4_ = fVar249 * fVar199;
        fVar237 = auVar32._8_4_;
        fVar251 = auVar315._8_4_;
        auVar49._8_4_ = fVar251 * fVar237;
        fVar307 = auVar32._12_4_;
        fVar252 = auVar315._12_4_;
        auVar49._12_4_ = fVar252 * fVar307;
        fVar280 = auVar32._16_4_;
        fVar254 = auVar315._16_4_;
        auVar49._16_4_ = fVar254 * fVar280;
        fVar305 = auVar32._20_4_;
        fVar263 = auVar315._20_4_;
        auVar49._20_4_ = fVar263 * fVar305;
        fVar149 = auVar32._24_4_;
        fVar264 = auVar315._24_4_;
        auVar49._24_4_ = fVar264 * fVar149;
        auVar49._28_4_ = auVar312._28_4_;
        auVar261 = vsubps_avx(auVar49,auVar48);
        fVar201 = auVar22._0_4_;
        fVar223 = auVar22._4_4_;
        auVar50._4_4_ = fVar250 * fVar223;
        auVar50._0_4_ = fVar249 * fVar201;
        fVar306 = auVar22._8_4_;
        auVar50._8_4_ = fVar251 * fVar306;
        fVar278 = auVar22._12_4_;
        auVar50._12_4_ = fVar252 * fVar278;
        fVar281 = auVar22._16_4_;
        auVar50._16_4_ = fVar254 * fVar281;
        fVar211 = auVar22._20_4_;
        auVar50._20_4_ = fVar263 * fVar211;
        fVar150 = auVar22._24_4_;
        auVar50._24_4_ = fVar264 * fVar150;
        auVar50._28_4_ = auVar312._28_4_;
        fVar202 = auVar193._0_4_;
        auVar325._0_4_ = fVar186 * fVar202;
        fVar225 = auVar193._4_4_;
        auVar325._4_4_ = fVar153 * fVar225;
        fVar274 = auVar193._8_4_;
        auVar325._8_4_ = fVar224 * fVar274;
        fVar279 = auVar193._12_4_;
        auVar325._12_4_ = fVar253 * fVar279;
        fVar209 = auVar193._16_4_;
        auVar325._16_4_ = fVar203 * fVar209;
        fVar173 = auVar193._20_4_;
        auVar325._20_4_ = fVar206 * fVar173;
        fVar151 = auVar193._24_4_;
        auVar325._24_4_ = fVar208 * fVar151;
        auVar325._28_4_ = 0;
        auVar37 = vsubps_avx(auVar325,auVar50);
        auVar51._4_4_ = fVar222 * fVar225;
        auVar51._0_4_ = fVar199 * fVar202;
        auVar51._8_4_ = fVar237 * fVar274;
        auVar51._12_4_ = fVar307 * fVar279;
        auVar51._16_4_ = fVar280 * fVar209;
        auVar51._20_4_ = fVar305 * fVar173;
        auVar51._24_4_ = fVar149 * fVar151;
        auVar51._28_4_ = auVar312._28_4_;
        auVar52._4_4_ = fVar223 * fVar221;
        auVar52._0_4_ = fVar201 * fVar187;
        auVar52._8_4_ = fVar306 * fVar236;
        auVar52._12_4_ = fVar278 * fVar204;
        auVar52._16_4_ = fVar281 * fVar308;
        auVar52._20_4_ = fVar211 * fVar304;
        auVar52._24_4_ = fVar150 * fVar148;
        auVar52._28_4_ = auVar330._28_4_;
        auVar38 = vsubps_avx(auVar52,auVar51);
        auVar33 = vsubps_avx(auVar232,auVar300);
        fVar212 = auVar38._28_4_ + auVar37._28_4_;
        auVar165._0_4_ = auVar38._0_4_ + auVar37._0_4_ * 0.0 + auVar261._0_4_ * 0.0;
        auVar165._4_4_ = auVar38._4_4_ + auVar37._4_4_ * 0.0 + auVar261._4_4_ * 0.0;
        auVar165._8_4_ = auVar38._8_4_ + auVar37._8_4_ * 0.0 + auVar261._8_4_ * 0.0;
        auVar165._12_4_ = auVar38._12_4_ + auVar37._12_4_ * 0.0 + auVar261._12_4_ * 0.0;
        auVar165._16_4_ = auVar38._16_4_ + auVar37._16_4_ * 0.0 + auVar261._16_4_ * 0.0;
        auVar165._20_4_ = auVar38._20_4_ + auVar37._20_4_ * 0.0 + auVar261._20_4_ * 0.0;
        auVar165._24_4_ = auVar38._24_4_ + auVar37._24_4_ * 0.0 + auVar261._24_4_ * 0.0;
        auVar165._28_4_ = fVar212 + auVar261._28_4_;
        fVar210 = auVar36._0_4_;
        fVar238 = auVar36._4_4_;
        auVar53._4_4_ = fVar238 * auVar300._4_4_;
        auVar53._0_4_ = fVar210 * auVar300._0_4_;
        fVar154 = auVar36._8_4_;
        auVar53._8_4_ = fVar154 * auVar300._8_4_;
        fVar174 = auVar36._12_4_;
        auVar53._12_4_ = fVar174 * auVar300._12_4_;
        fVar239 = auVar36._16_4_;
        auVar53._16_4_ = fVar239 * auVar300._16_4_;
        fVar247 = auVar36._20_4_;
        auVar53._20_4_ = fVar247 * auVar300._20_4_;
        fVar248 = auVar36._24_4_;
        auVar53._24_4_ = fVar248 * auVar300._24_4_;
        auVar53._28_4_ = fVar212;
        fVar212 = auVar33._0_4_;
        fVar235 = auVar33._4_4_;
        auVar54._4_4_ = auVar39._4_4_ * fVar235;
        auVar54._0_4_ = auVar39._0_4_ * fVar212;
        fVar276 = auVar33._8_4_;
        auVar54._8_4_ = auVar39._8_4_ * fVar276;
        fVar207 = auVar33._12_4_;
        auVar54._12_4_ = auVar39._12_4_ * fVar207;
        fVar309 = auVar33._16_4_;
        auVar54._16_4_ = auVar39._16_4_ * fVar309;
        fVar134 = auVar33._20_4_;
        auVar54._20_4_ = auVar39._20_4_ * fVar134;
        fVar152 = auVar33._24_4_;
        auVar54._24_4_ = auVar39._24_4_ * fVar152;
        auVar54._28_4_ = auVar38._28_4_;
        auVar36 = vsubps_avx(auVar54,auVar53);
        auVar37 = vsubps_avx(auVar22,auVar31);
        fVar283 = auVar37._0_4_;
        fVar290 = auVar37._4_4_;
        auVar55._4_4_ = fVar290 * auVar300._4_4_;
        auVar55._0_4_ = fVar283 * auVar300._0_4_;
        fVar292 = auVar37._8_4_;
        auVar55._8_4_ = fVar292 * auVar300._8_4_;
        fVar294 = auVar37._12_4_;
        auVar55._12_4_ = fVar294 * auVar300._12_4_;
        fVar295 = auVar37._16_4_;
        auVar55._16_4_ = fVar295 * auVar300._16_4_;
        fVar296 = auVar37._20_4_;
        auVar55._20_4_ = fVar296 * auVar300._20_4_;
        fVar297 = auVar37._24_4_;
        auVar55._24_4_ = fVar297 * auVar300._24_4_;
        auVar55._28_4_ = auVar300._28_4_;
        auVar56._4_4_ = auVar31._4_4_ * fVar235;
        auVar56._0_4_ = auVar31._0_4_ * fVar212;
        auVar56._8_4_ = auVar31._8_4_ * fVar276;
        auVar56._12_4_ = auVar31._12_4_ * fVar207;
        auVar56._16_4_ = auVar31._16_4_ * fVar309;
        auVar56._20_4_ = auVar31._20_4_ * fVar134;
        auVar56._24_4_ = auVar31._24_4_ * fVar152;
        auVar56._28_4_ = auVar261._28_4_;
        auVar261 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar39._4_4_ * fVar290;
        auVar57._0_4_ = auVar39._0_4_ * fVar283;
        auVar57._8_4_ = auVar39._8_4_ * fVar292;
        auVar57._12_4_ = auVar39._12_4_ * fVar294;
        auVar57._16_4_ = auVar39._16_4_ * fVar295;
        auVar57._20_4_ = auVar39._20_4_ * fVar296;
        auVar57._24_4_ = auVar39._24_4_ * fVar297;
        auVar57._28_4_ = auVar300._28_4_;
        auVar58._4_4_ = auVar31._4_4_ * fVar238;
        auVar58._0_4_ = auVar31._0_4_ * fVar210;
        auVar58._8_4_ = auVar31._8_4_ * fVar154;
        auVar58._12_4_ = auVar31._12_4_ * fVar174;
        auVar58._16_4_ = auVar31._16_4_ * fVar239;
        auVar58._20_4_ = auVar31._20_4_ * fVar247;
        auVar58._24_4_ = auVar31._24_4_ * fVar248;
        auVar58._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar58,auVar57);
        auVar218._0_4_ = auVar36._0_4_ * 0.0 + auVar31._0_4_ + auVar261._0_4_ * 0.0;
        auVar218._4_4_ = auVar36._4_4_ * 0.0 + auVar31._4_4_ + auVar261._4_4_ * 0.0;
        auVar218._8_4_ = auVar36._8_4_ * 0.0 + auVar31._8_4_ + auVar261._8_4_ * 0.0;
        auVar218._12_4_ = auVar36._12_4_ * 0.0 + auVar31._12_4_ + auVar261._12_4_ * 0.0;
        auVar218._16_4_ = auVar36._16_4_ * 0.0 + auVar31._16_4_ + auVar261._16_4_ * 0.0;
        auVar218._20_4_ = auVar36._20_4_ * 0.0 + auVar31._20_4_ + auVar261._20_4_ * 0.0;
        auVar218._24_4_ = auVar36._24_4_ * 0.0 + auVar31._24_4_ + auVar261._24_4_ * 0.0;
        auVar218._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar261._28_4_;
        auVar31 = vmaxps_avx(auVar165,auVar218);
        auVar31 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,2);
        auVar227 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
        auVar138 = vpand_avx(auVar138,auVar227);
        auVar227 = vpmovsxwd_avx(auVar138);
        auVar191 = vpunpckhwd_avx(auVar138,auVar138);
        auVar194._16_16_ = auVar191;
        auVar194._0_16_ = auVar227;
        if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar194 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar194 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar194 >> 0x7f,0) == '\0') &&
              (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar191 >> 0x3f,0) == '\0') &&
            (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar191[0xf]) {
LAB_00f7af87:
          auVar323 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
          auVar198 = ZEXT3264(auVar194);
          auVar303 = ZEXT3264(local_540);
          auVar147 = ZEXT3264(local_560);
        }
        else {
          auVar59._4_4_ = fVar235 * fVar221;
          auVar59._0_4_ = fVar212 * fVar187;
          auVar59._8_4_ = fVar276 * fVar236;
          auVar59._12_4_ = fVar207 * fVar204;
          auVar59._16_4_ = fVar309 * fVar308;
          auVar59._20_4_ = fVar134 * fVar304;
          auVar59._24_4_ = fVar152 * fVar148;
          auVar59._28_4_ = auVar191._12_4_;
          auVar316._0_4_ = fVar210 * fVar249;
          auVar316._4_4_ = fVar238 * fVar250;
          auVar316._8_4_ = fVar154 * fVar251;
          auVar316._12_4_ = fVar174 * fVar252;
          auVar316._16_4_ = fVar239 * fVar254;
          auVar316._20_4_ = fVar247 * fVar263;
          auVar316._24_4_ = fVar248 * fVar264;
          auVar316._28_4_ = 0;
          auVar31 = vsubps_avx(auVar316,auVar59);
          auVar60._4_4_ = fVar290 * fVar250;
          auVar60._0_4_ = fVar283 * fVar249;
          auVar60._8_4_ = fVar292 * fVar251;
          auVar60._12_4_ = fVar294 * fVar252;
          auVar60._16_4_ = fVar295 * fVar254;
          auVar60._20_4_ = fVar296 * fVar263;
          auVar60._24_4_ = fVar297 * fVar264;
          auVar60._28_4_ = auVar315._28_4_;
          auVar61._4_4_ = fVar235 * fVar225;
          auVar61._0_4_ = fVar212 * fVar202;
          auVar61._8_4_ = fVar276 * fVar274;
          auVar61._12_4_ = fVar207 * fVar279;
          auVar61._16_4_ = fVar309 * fVar209;
          auVar61._20_4_ = fVar134 * fVar173;
          auVar61._24_4_ = fVar152 * fVar151;
          auVar61._28_4_ = auVar33._28_4_;
          auVar300 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar238 * fVar225;
          auVar62._0_4_ = fVar210 * fVar202;
          auVar62._8_4_ = fVar154 * fVar274;
          auVar62._12_4_ = fVar174 * fVar279;
          auVar62._16_4_ = fVar239 * fVar209;
          auVar62._20_4_ = fVar247 * fVar173;
          auVar62._24_4_ = fVar248 * fVar151;
          auVar62._28_4_ = auVar165._28_4_;
          auVar63._4_4_ = fVar290 * fVar221;
          auVar63._0_4_ = fVar283 * fVar187;
          auVar63._8_4_ = fVar292 * fVar236;
          auVar63._12_4_ = fVar294 * fVar204;
          auVar63._16_4_ = fVar295 * fVar308;
          auVar63._20_4_ = fVar296 * fVar304;
          auVar63._24_4_ = fVar297 * fVar148;
          auVar63._28_4_ = auVar35._28_4_;
          auVar261 = vsubps_avx(auVar63,auVar62);
          auVar262._0_4_ = auVar31._0_4_ * 0.0 + auVar261._0_4_ + auVar300._0_4_ * 0.0;
          auVar262._4_4_ = auVar31._4_4_ * 0.0 + auVar261._4_4_ + auVar300._4_4_ * 0.0;
          auVar262._8_4_ = auVar31._8_4_ * 0.0 + auVar261._8_4_ + auVar300._8_4_ * 0.0;
          auVar262._12_4_ = auVar31._12_4_ * 0.0 + auVar261._12_4_ + auVar300._12_4_ * 0.0;
          auVar262._16_4_ = auVar31._16_4_ * 0.0 + auVar261._16_4_ + auVar300._16_4_ * 0.0;
          auVar262._20_4_ = auVar31._20_4_ * 0.0 + auVar261._20_4_ + auVar300._20_4_ * 0.0;
          auVar262._24_4_ = auVar31._24_4_ * 0.0 + auVar261._24_4_ + auVar300._24_4_ * 0.0;
          auVar262._28_4_ = auVar35._28_4_ + auVar261._28_4_ + auVar165._28_4_;
          auVar39 = vrcpps_avx(auVar262);
          fVar187 = auVar39._0_4_;
          fVar202 = auVar39._4_4_;
          auVar64._4_4_ = auVar262._4_4_ * fVar202;
          auVar64._0_4_ = auVar262._0_4_ * fVar187;
          fVar212 = auVar39._8_4_;
          auVar64._8_4_ = auVar262._8_4_ * fVar212;
          fVar221 = auVar39._12_4_;
          auVar64._12_4_ = auVar262._12_4_ * fVar221;
          fVar225 = auVar39._16_4_;
          auVar64._16_4_ = auVar262._16_4_ * fVar225;
          fVar235 = auVar39._20_4_;
          auVar64._20_4_ = auVar262._20_4_ * fVar235;
          fVar236 = auVar39._24_4_;
          auVar64._24_4_ = auVar262._24_4_ * fVar236;
          auVar64._28_4_ = auVar33._28_4_;
          auVar317._8_4_ = 0x3f800000;
          auVar317._0_8_ = 0x3f8000003f800000;
          auVar317._12_4_ = 0x3f800000;
          auVar317._16_4_ = 0x3f800000;
          auVar317._20_4_ = 0x3f800000;
          auVar317._24_4_ = 0x3f800000;
          auVar317._28_4_ = 0x3f800000;
          auVar315 = vsubps_avx(auVar317,auVar64);
          fVar187 = auVar315._0_4_ * fVar187 + fVar187;
          fVar202 = auVar315._4_4_ * fVar202 + fVar202;
          fVar212 = auVar315._8_4_ * fVar212 + fVar212;
          fVar221 = auVar315._12_4_ * fVar221 + fVar221;
          fVar225 = auVar315._16_4_ * fVar225 + fVar225;
          fVar235 = auVar315._20_4_ * fVar235 + fVar235;
          fVar236 = auVar315._24_4_ * fVar236 + fVar236;
          auVar65._4_4_ =
               (auVar31._4_4_ * fVar223 + auVar300._4_4_ * fVar222 + auVar261._4_4_ * fVar153) *
               fVar202;
          auVar65._0_4_ =
               (auVar31._0_4_ * fVar201 + auVar300._0_4_ * fVar199 + auVar261._0_4_ * fVar186) *
               fVar187;
          auVar65._8_4_ =
               (auVar31._8_4_ * fVar306 + auVar300._8_4_ * fVar237 + auVar261._8_4_ * fVar224) *
               fVar212;
          auVar65._12_4_ =
               (auVar31._12_4_ * fVar278 + auVar300._12_4_ * fVar307 + auVar261._12_4_ * fVar253) *
               fVar221;
          auVar65._16_4_ =
               (auVar31._16_4_ * fVar281 + auVar300._16_4_ * fVar280 + auVar261._16_4_ * fVar203) *
               fVar225;
          auVar65._20_4_ =
               (auVar31._20_4_ * fVar211 + auVar300._20_4_ * fVar305 + auVar261._20_4_ * fVar206) *
               fVar235;
          auVar65._24_4_ =
               (auVar31._24_4_ * fVar150 + auVar300._24_4_ * fVar149 + auVar261._24_4_ * fVar208) *
               fVar236;
          auVar65._28_4_ = auVar22._28_4_ + auVar193._28_4_ + auVar232._28_4_;
          auVar227 = vpermilps_avx(ZEXT416(uVar127),0);
          auVar195._16_16_ = auVar227;
          auVar195._0_16_ = auVar227;
          auVar232 = vcmpps_avx(auVar195,auVar65,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar230._4_4_ = uVar11;
          auVar230._0_4_ = uVar11;
          auVar230._8_4_ = uVar11;
          auVar230._12_4_ = uVar11;
          auVar230._16_4_ = uVar11;
          auVar230._20_4_ = uVar11;
          auVar230._24_4_ = uVar11;
          auVar230._28_4_ = uVar11;
          auVar31 = vcmpps_avx(auVar65,auVar230,2);
          auVar232 = vandps_avx(auVar31,auVar232);
          auVar227 = vpackssdw_avx(auVar232._0_16_,auVar232._16_16_);
          auVar138 = vpand_avx(auVar138,auVar227);
          auVar227 = vpmovsxwd_avx(auVar138);
          auVar191 = vpshufd_avx(auVar138,0xee);
          auVar191 = vpmovsxwd_avx(auVar191);
          auVar194._16_16_ = auVar191;
          auVar194._0_16_ = auVar227;
          if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar194 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar194 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar194 >> 0x7f,0) == '\0') &&
                (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar191 >> 0x3f,0) == '\0') &&
              (auVar194 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar191[0xf]) goto LAB_00f7af87;
          auVar232 = vcmpps_avx(ZEXT832(0) << 0x20,auVar262,4);
          auVar227 = vpackssdw_avx(auVar232._0_16_,auVar232._16_16_);
          auVar138 = vpand_avx(auVar138,auVar227);
          auVar227 = vpmovsxwd_avx(auVar138);
          auVar138 = vpunpckhwd_avx(auVar138,auVar138);
          auVar198 = ZEXT1664(auVar138);
          auVar244._16_16_ = auVar138;
          auVar244._0_16_ = auVar227;
          auVar323 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
          auVar303 = ZEXT3264(local_540);
          auVar147 = ZEXT3264(local_560);
          if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar244 >> 0x7f,0) != '\0') ||
                (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar138 >> 0x3f,0) != '\0') ||
              (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar138[0xf] < '\0') {
            auVar196._0_4_ = auVar165._0_4_ * fVar187;
            auVar196._4_4_ = auVar165._4_4_ * fVar202;
            auVar196._8_4_ = auVar165._8_4_ * fVar212;
            auVar196._12_4_ = auVar165._12_4_ * fVar221;
            auVar196._16_4_ = auVar165._16_4_ * fVar225;
            auVar196._20_4_ = auVar165._20_4_ * fVar235;
            auVar196._24_4_ = auVar165._24_4_ * fVar236;
            auVar196._28_4_ = 0;
            auVar66._4_4_ = auVar218._4_4_ * fVar202;
            auVar66._0_4_ = auVar218._0_4_ * fVar187;
            auVar66._8_4_ = auVar218._8_4_ * fVar212;
            auVar66._12_4_ = auVar218._12_4_ * fVar221;
            auVar66._16_4_ = auVar218._16_4_ * fVar225;
            auVar66._20_4_ = auVar218._20_4_ * fVar235;
            auVar66._24_4_ = auVar218._24_4_ * fVar236;
            auVar66._28_4_ = auVar315._28_4_ + auVar39._28_4_;
            auVar231._8_4_ = 0x3f800000;
            auVar231._0_8_ = 0x3f8000003f800000;
            auVar231._12_4_ = 0x3f800000;
            auVar231._16_4_ = 0x3f800000;
            auVar231._20_4_ = 0x3f800000;
            auVar231._24_4_ = 0x3f800000;
            auVar231._28_4_ = 0x3f800000;
            auVar232 = vsubps_avx(auVar231,auVar196);
            auVar232 = vblendvps_avx(auVar232,auVar196,auVar34);
            auVar303 = ZEXT3264(auVar232);
            auVar232 = vsubps_avx(auVar231,auVar66);
            auVar198 = ZEXT3264(auVar232);
            _local_380 = vblendvps_avx(auVar232,auVar66,auVar34);
            auVar323 = ZEXT3264(auVar244);
            auVar147 = ZEXT3264(auVar65);
          }
        }
        auVar272 = ZEXT3264(_local_7e0);
        auVar193 = auVar147._0_32_;
        auVar300 = auVar303._0_32_;
        auVar232 = auVar323._0_32_;
        if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar232 >> 0x7f,0) == '\0') &&
              (auVar323 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar232 >> 0xbf,0) == '\0') &&
            (auVar323 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar323[0x1f]) goto LAB_00f79b35;
        auVar31 = vsubps_avx(local_760,_local_7e0);
        local_7e0._0_4_ = (float)local_7e0._0_4_ + auVar303._0_4_ * auVar31._0_4_;
        local_7e0._4_4_ = (float)local_7e0._4_4_ + auVar303._4_4_ * auVar31._4_4_;
        fStack_7d8 = fStack_7d8 + auVar303._8_4_ * auVar31._8_4_;
        fStack_7d4 = fStack_7d4 + auVar303._12_4_ * auVar31._12_4_;
        fStack_7d0 = fStack_7d0 + auVar303._16_4_ * auVar31._16_4_;
        fStack_7cc = fStack_7cc + auVar303._20_4_ * auVar31._20_4_;
        fStack_7c8 = fStack_7c8 + auVar303._24_4_ * auVar31._24_4_;
        fStack_7c4 = fStack_7c4 + auVar31._28_4_;
        fVar187 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
        auVar67._4_4_ = ((float)local_7e0._4_4_ + (float)local_7e0._4_4_) * fVar187;
        auVar67._0_4_ = ((float)local_7e0._0_4_ + (float)local_7e0._0_4_) * fVar187;
        auVar67._8_4_ = (fStack_7d8 + fStack_7d8) * fVar187;
        auVar67._12_4_ = (fStack_7d4 + fStack_7d4) * fVar187;
        auVar67._16_4_ = (fStack_7d0 + fStack_7d0) * fVar187;
        auVar67._20_4_ = (fStack_7cc + fStack_7cc) * fVar187;
        auVar67._24_4_ = (fStack_7c8 + fStack_7c8) * fVar187;
        auVar67._28_4_ = fStack_7c4 + fStack_7c4;
        auVar31 = vcmpps_avx(auVar193,auVar67,6);
        auVar39 = auVar232 & auVar31;
        if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar39 >> 0x7f,0) == '\0') &&
              (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0xbf,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar39[0x1f]) {
LAB_00f79bcf:
          uVar130 = 0;
        }
        else {
          local_220 = vandps_avx(auVar31,auVar232);
          local_2c0 = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
          fStack_2bc = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
          fStack_2b8 = (float)uStack_378 + (float)uStack_378 + -1.0;
          fStack_2b4 = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
          fStack_2b0 = (float)uStack_370 + (float)uStack_370 + -1.0;
          fStack_2ac = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
          fStack_2a8 = (float)uStack_368 + (float)uStack_368 + -1.0;
          fStack_2a4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
          local_280 = 0;
          uStack_268 = uStack_708;
          uStack_258 = uStack_5d8;
          local_250 = local_5f0;
          uStack_248 = uStack_5e8;
          uStack_238 = uStack_5c8;
          local_380._4_4_ = fStack_2bc;
          local_380._0_4_ = local_2c0;
          uStack_378._0_4_ = fStack_2b8;
          uStack_378._4_4_ = fStack_2b4;
          uStack_370._0_4_ = fStack_2b0;
          uStack_370._4_4_ = fStack_2ac;
          auVar121 = _local_380;
          uStack_368._0_4_ = fStack_2a8;
          uStack_368._4_4_ = fStack_2a4;
          auVar232 = _local_380;
          _local_380 = auVar232;
          if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_00f79bcf;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (uVar130 = CONCAT71((int7)(uVar130 >> 8),1),
             pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar178._0_4_ = 1.0 / (float)(int)uVar15;
            auVar178._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar138 = vshufps_avx(auVar178,auVar178,0);
            local_200[0] = auVar138._0_4_ * (auVar303._0_4_ + 0.0);
            local_200[1] = auVar138._4_4_ * (auVar303._4_4_ + 1.0);
            local_200[2] = auVar138._8_4_ * (auVar303._8_4_ + 2.0);
            local_200[3] = auVar138._12_4_ * (auVar303._12_4_ + 3.0);
            fStack_1f0 = auVar138._0_4_ * (auVar303._16_4_ + 4.0);
            fStack_1ec = auVar138._4_4_ * (auVar303._20_4_ + 5.0);
            fStack_1e8 = auVar138._8_4_ * (auVar303._24_4_ + 6.0);
            fStack_1e4 = auVar303._28_4_ + 7.0;
            uStack_370 = auVar121._16_8_;
            uStack_368 = auVar232._24_8_;
            local_1e0 = local_380;
            uStack_1d8 = uStack_378;
            uStack_1d0 = uStack_370;
            uStack_1c8 = uStack_368;
            local_1c0 = auVar193;
            iVar124 = vmovmskps_avx(local_220);
            uVar131 = CONCAT44((int)((ulong)p_Var20 >> 0x20),iVar124);
            uVar125 = 0;
            if (uVar131 != 0) {
              for (; (uVar131 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
              }
            }
            if (iVar124 == 0) goto LAB_00f79bcf;
            local_640 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
            auStack_630 = auVar22._16_16_;
            _local_660 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
            auStack_650 = auVar32._16_16_;
            _auStack_570 = auVar216._16_16_;
            _local_580 = *local_700;
            _auStack_59c = auVar192._4_28_;
            local_5a0 = (undefined1  [4])*(undefined4 *)(ray + k * 4 + 0x80);
            local_560 = auVar193;
            local_540 = auVar300;
            local_2e0 = auVar300;
            local_2a0 = auVar193;
            local_27c = uVar15;
            local_270 = local_710;
            local_260 = local_5e0;
            local_240 = local_5d0;
            do {
              local_400 = local_200[uVar125];
              local_3f0 = *(undefined4 *)((long)&local_1e0 + uVar125 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar125 * 4);
              fVar199 = 1.0 - local_400;
              fVar187 = local_400 * fVar199 + local_400 * fVar199;
              auVar138 = ZEXT416((uint)(local_400 * local_400 * 3.0));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar227 = ZEXT416((uint)((fVar187 - local_400 * local_400) * 3.0));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar191 = ZEXT416((uint)((fVar199 * fVar199 - fVar187) * 3.0));
              auVar191 = vshufps_avx(auVar191,auVar191,0);
              local_6f0.context = context->user;
              auVar181 = ZEXT416((uint)(fVar199 * fVar199 * -3.0));
              auVar181 = vshufps_avx(auVar181,auVar181,0);
              auVar179._0_4_ =
                   auVar181._0_4_ * (float)local_710._0_4_ +
                   auVar191._0_4_ * (float)local_5e0._0_4_ +
                   auVar138._0_4_ * (float)local_5d0._0_4_ + auVar227._0_4_ * (float)local_5f0._0_4_
              ;
              auVar179._4_4_ =
                   auVar181._4_4_ * (float)local_710._4_4_ +
                   auVar191._4_4_ * (float)local_5e0._4_4_ +
                   auVar138._4_4_ * (float)local_5d0._4_4_ + auVar227._4_4_ * (float)local_5f0._4_4_
              ;
              auVar179._8_4_ =
                   auVar181._8_4_ * (float)uStack_708 +
                   auVar191._8_4_ * (float)uStack_5d8 +
                   auVar138._8_4_ * (float)uStack_5c8 + auVar227._8_4_ * (float)uStack_5e8;
              auVar179._12_4_ =
                   auVar181._12_4_ * uStack_708._4_4_ +
                   auVar191._12_4_ * uStack_5d8._4_4_ +
                   auVar138._12_4_ * uStack_5c8._4_4_ + auVar227._12_4_ * uStack_5e8._4_4_;
              local_430 = (RTCHitN  [16])vshufps_avx(auVar179,auVar179,0);
              local_420 = vshufps_avx(auVar179,auVar179,0x55);
              auVar198 = ZEXT1664(local_420);
              local_410 = vshufps_avx(auVar179,auVar179,0xaa);
              local_3e0 = local_660;
              uStack_3d8 = uStack_658;
              local_3d0 = local_640._0_8_;
              uStack_3c8 = local_640._8_8_;
              vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
              uStack_3bc = (local_6f0.context)->instID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = (local_6f0.context)->instPrimID[0];
              uStack_3ac = uStack_3b0;
              uStack_3a8 = uStack_3b0;
              uStack_3a4 = uStack_3b0;
              local_7a0 = _local_580;
              local_6f0.valid = (int *)local_7a0;
              local_6f0.geometryUserPtr = pGVar16->userPtr;
              local_6f0.hit = local_430;
              local_6f0.N = 4;
              local_760._0_8_ = uVar131;
              local_6f0.ray = (RTCRayN *)ray;
              fStack_3fc = local_400;
              fStack_3f8 = local_400;
              fStack_3f4 = local_400;
              uStack_3ec = local_3f0;
              uStack_3e8 = local_3f0;
              uStack_3e4 = local_3f0;
              if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar198 = ZEXT1664(local_420);
                auVar272 = ZEXT1664(auVar272._0_16_);
                (*pGVar16->occlusionFilterN)(&local_6f0);
                auVar147 = ZEXT3264(local_560);
                auVar303 = ZEXT3264(local_540);
                uVar131 = local_760._0_8_;
                fVar265 = (float)local_780._0_4_;
                fVar273 = (float)local_780._4_4_;
                fVar275 = fStack_778;
                fVar277 = fStack_774;
                fVar310 = fStack_770;
                fVar200 = fStack_76c;
                fVar313 = fStack_768;
                fVar205 = fStack_764;
              }
              if (local_7a0 == (undefined1  [16])0x0) {
                auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar138 = auVar138 ^ _DAT_01f7ae20;
              }
              else {
                p_Var20 = context->args->filter;
                if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar198 = ZEXT1664(auVar198._0_16_);
                  auVar272 = ZEXT1664(auVar272._0_16_);
                  (*p_Var20)(&local_6f0);
                  auVar147 = ZEXT3264(local_560);
                  auVar303 = ZEXT3264(local_540);
                  uVar131 = local_760._0_8_;
                  fVar265 = (float)local_780._0_4_;
                  fVar273 = (float)local_780._4_4_;
                  fVar275 = fStack_778;
                  fVar277 = fStack_774;
                  fVar310 = fStack_770;
                  fVar200 = fStack_76c;
                  fVar313 = fStack_768;
                  fVar205 = fStack_764;
                }
                auVar227 = vpcmpeqd_avx(local_7a0,_DAT_01f7aa10);
                auVar138 = auVar227 ^ _DAT_01f7ae20;
                auVar180._8_4_ = 0xff800000;
                auVar180._0_8_ = 0xff800000ff800000;
                auVar180._12_4_ = 0xff800000;
                auVar227 = vblendvps_avx(auVar180,*(undefined1 (*) [16])(local_6f0.ray + 0x80),
                                         auVar227);
                *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar227;
              }
              auVar193 = auVar147._0_32_;
              auVar300 = auVar303._0_32_;
              auVar161._8_8_ = 0x100000001;
              auVar161._0_8_ = 0x100000001;
              if ((auVar161 & auVar138) != (undefined1  [16])0x0) {
                uVar130 = CONCAT71((int7)(uVar130 >> 8),1);
                break;
              }
              *(undefined1 (*) [4])(ray + k * 4 + 0x80) = local_5a0;
              uVar131 = uVar131 ^ 1L << (uVar125 & 0x3f);
              uVar125 = 0;
              if (uVar131 != 0) {
                for (; (uVar131 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                }
              }
              uVar130 = 0;
            } while (uVar131 != 0);
          }
        }
      }
      auVar323 = ZEXT3264(auVar285);
      local_560 = auVar193;
      local_540 = auVar300;
      if (8 < (int)uVar15) {
        auVar138 = vpshufd_avx(ZEXT416(uVar15),0);
        local_4c0 = auVar138._0_4_;
        fStack_4bc = auVar138._4_4_;
        fStack_4b8 = auVar138._8_4_;
        fStack_4b4 = auVar138._12_4_;
        auVar138 = vshufps_avx(_local_740,_local_740,0);
        local_360._16_16_ = auVar138;
        local_360._0_16_ = auVar138;
        auVar138 = vpermilps_avx(ZEXT416(uVar127),0);
        local_e0._16_16_ = auVar138;
        local_e0._0_16_ = auVar138;
        auVar140._0_4_ = 1.0 / (float)local_600._0_4_;
        auVar140._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar138 = vshufps_avx(auVar140,auVar140,0);
        register0x00001210 = auVar138;
        _local_100 = auVar138;
        local_600 = vshufps_avx(ZEXT416((uint)local_788),ZEXT416((uint)local_788),0);
        local_610 = vshufps_avx(ZEXT416((uint)local_610._0_4_),ZEXT416((uint)local_610._0_4_),0);
        auVar147 = ZEXT1664(local_610);
        lVar133 = 8;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar133 * 4 + lVar21);
          fVar187 = *(float *)*pauVar9;
          fVar199 = *(float *)(*pauVar9 + 4);
          fVar201 = *(float *)(*pauVar9 + 8);
          fVar202 = *(float *)(*pauVar9 + 0xc);
          fVar212 = *(float *)(*pauVar9 + 0x10);
          fVar221 = *(float *)(*pauVar9 + 0x14);
          fVar222 = *(float *)(*pauVar9 + 0x18);
          auVar120 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21aa768 + lVar133 * 4);
          fVar223 = *(float *)*pauVar9;
          fVar225 = *(float *)(*pauVar9 + 4);
          fVar235 = *(float *)(*pauVar9 + 8);
          fVar236 = *(float *)(*pauVar9 + 0xc);
          fVar237 = *(float *)(*pauVar9 + 0x10);
          fVar306 = *(float *)(*pauVar9 + 0x14);
          fVar274 = *(float *)(*pauVar9 + 0x18);
          auVar119 = *pauVar9;
          pfVar1 = (float *)(lVar21 + 0x21aabec + lVar133 * 4);
          fVar204 = *pfVar1;
          fVar307 = pfVar1[1];
          fVar278 = pfVar1[2];
          fVar279 = pfVar1[3];
          fVar207 = pfVar1[4];
          fVar308 = pfVar1[5];
          fVar280 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21ab070 + lVar133 * 4);
          fVar276 = *(float *)*pauVar9;
          fVar281 = *(float *)(*pauVar9 + 4);
          fVar209 = *(float *)(*pauVar9 + 8);
          fVar309 = *(float *)(*pauVar9 + 0xc);
          fVar304 = *(float *)(*pauVar9 + 0x10);
          fVar305 = *(float *)(*pauVar9 + 0x14);
          fVar211 = *(float *)(*pauVar9 + 0x18);
          auVar118 = *pauVar9;
          fVar173 = auVar198._28_4_;
          fStack_7c4 = fVar173 + *(float *)pauVar9[1];
          fVar224 = fVar173 + fStack_7c4;
          local_7e0._0_4_ =
               (float)local_460._0_4_ * fVar187 +
               auVar323._0_4_ * fVar223 +
               (float)local_5c0._0_4_ * fVar204 + (float)local_480._0_4_ * fVar276;
          local_7e0._4_4_ =
               (float)local_460._4_4_ * fVar199 +
               auVar323._4_4_ * fVar225 +
               (float)local_5c0._4_4_ * fVar307 + (float)local_480._4_4_ * fVar281;
          fStack_7d8 = fStack_458 * fVar201 +
                       auVar323._8_4_ * fVar235 + fStack_5b8 * fVar278 + fStack_478 * fVar209;
          fStack_7d4 = fStack_454 * fVar202 +
                       auVar323._12_4_ * fVar236 + fStack_5b4 * fVar279 + fStack_474 * fVar309;
          fStack_7d0 = fStack_450 * fVar212 +
                       auVar323._16_4_ * fVar237 + fStack_5b0 * fVar207 + fStack_470 * fVar304;
          fStack_7cc = fStack_44c * fVar221 +
                       auVar323._20_4_ * fVar306 + fStack_5ac * fVar308 + fStack_46c * fVar305;
          fStack_7c8 = fStack_448 * fVar222 +
                       auVar323._24_4_ * fVar274 + fStack_5a8 * fVar280 + fStack_468 * fVar211;
          fStack_7c4 = fStack_7c4 + fVar173 + fVar173 + auVar147._28_4_;
          auVar197._0_4_ =
               (float)local_120._0_4_ * fVar187 +
               fVar155 * fVar276 + fVar265 * fVar204 + fVar223 * fVar329;
          auVar197._4_4_ =
               (float)local_120._4_4_ * fVar199 +
               fVar170 * fVar281 + fVar273 * fVar307 + fVar225 * fVar332;
          auVar197._8_4_ =
               fStack_118 * fVar201 + fVar171 * fVar209 + fVar275 * fVar278 + fVar235 * fVar333;
          auVar197._12_4_ =
               fStack_114 * fVar202 + fVar172 * fVar309 + fVar277 * fVar279 + fVar236 * fVar334;
          auVar197._16_4_ =
               fStack_110 * fVar212 + fVar155 * fVar304 + fVar310 * fVar207 + fVar237 * fVar329;
          auVar197._20_4_ =
               fStack_10c * fVar221 + fVar170 * fVar305 + fVar200 * fVar308 + fVar306 * fVar332;
          auVar197._24_4_ =
               fStack_108 * fVar222 + fVar171 * fVar211 + fVar313 * fVar280 + fVar274 * fVar333;
          auVar197._28_4_ = fStack_7c4 + auVar272._28_4_ + fVar173 + fVar173;
          auVar198 = ZEXT3264(auVar197);
          fVar134 = (float)local_c0._0_4_ * fVar187 +
                    (float)local_a0._0_4_ * fVar223 +
                    (float)local_80._0_4_ * fVar204 + fVar276 * (float)local_140._0_4_;
          fVar148 = (float)local_c0._4_4_ * fVar199 +
                    (float)local_a0._4_4_ * fVar225 +
                    (float)local_80._4_4_ * fVar307 + fVar281 * (float)local_140._4_4_;
          fVar149 = fStack_b8 * fVar201 +
                    fStack_98 * fVar235 + fStack_78 * fVar278 + fVar209 * fStack_138;
          fVar150 = fStack_b4 * fVar202 +
                    fStack_94 * fVar236 + fStack_74 * fVar279 + fVar309 * fStack_134;
          fVar151 = fStack_b0 * fVar212 +
                    fStack_90 * fVar237 + fStack_70 * fVar207 + fVar304 * fStack_130;
          fVar152 = fStack_ac * fVar221 +
                    fStack_8c * fVar306 + fStack_6c * fVar308 + fVar305 * fStack_12c;
          fVar186 = fStack_a8 * fVar222 +
                    fStack_88 * fVar274 + fStack_68 * fVar280 + fVar211 * fStack_128;
          fVar153 = fStack_7c4 + fVar224;
          pauVar10 = (undefined1 (*) [32])(bezier_basis1 + lVar133 * 4 + lVar21);
          auVar121 = *(undefined1 (*) [24])*pauVar10;
          pfVar1 = (float *)(lVar21 + 0x21acb88 + lVar133 * 4);
          fVar281 = *pfVar1;
          fVar209 = pfVar1[1];
          fVar309 = pfVar1[2];
          fVar304 = pfVar1[3];
          fVar305 = pfVar1[4];
          fVar211 = pfVar1[5];
          fVar173 = pfVar1[6];
          auVar22 = *(undefined1 (*) [32])(lVar21 + 0x21ad00c + lVar133 * 4);
          auVar147 = ZEXT3264(auVar22);
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21ad490 + lVar133 * 4);
          fVar199 = *(float *)*pauVar9;
          fVar202 = *(float *)(*pauVar9 + 4);
          fVar221 = *(float *)(*pauVar9 + 8);
          fVar223 = *(float *)(*pauVar9 + 0xc);
          fVar235 = *(float *)(*pauVar9 + 0x10);
          fVar237 = *(float *)(*pauVar9 + 0x14);
          fVar274 = *(float *)(*pauVar9 + 0x18);
          auVar122 = *pauVar9;
          fVar276 = auVar323._28_4_;
          fVar187 = auVar22._0_4_;
          fVar201 = auVar22._4_4_;
          fVar212 = auVar22._8_4_;
          fVar222 = auVar22._12_4_;
          fVar225 = auVar22._16_4_;
          fVar236 = auVar22._20_4_;
          fVar306 = auVar22._24_4_;
          fVar253 = fVar172 + *(float *)pauVar9[1];
          fVar224 = fVar172 + fVar172 + fVar224;
          local_740._0_4_ = auVar121._0_4_;
          local_740._4_4_ = auVar121._4_4_;
          auStack_738._0_4_ = auVar121._8_4_;
          auStack_738._4_4_ = auVar121._12_4_;
          fStack_730 = auVar121._16_4_;
          fStack_72c = auVar121._20_4_;
          fStack_728 = (float)*(undefined8 *)(*pauVar10 + 0x18);
          fStack_724 = (float)((ulong)*(undefined8 *)(*pauVar10 + 0x18) >> 0x20);
          auVar245._0_4_ =
               (float)local_460._0_4_ * (float)local_740._0_4_ +
               fVar281 * auVar323._0_4_ +
               (float)local_5c0._0_4_ * fVar187 + (float)local_480._0_4_ * fVar199;
          auVar245._4_4_ =
               (float)local_460._4_4_ * (float)local_740._4_4_ +
               fVar209 * auVar323._4_4_ +
               (float)local_5c0._4_4_ * fVar201 + (float)local_480._4_4_ * fVar202;
          auVar245._8_4_ =
               fStack_458 * (float)auStack_738._0_4_ +
               fVar309 * auVar323._8_4_ + fStack_5b8 * fVar212 + fStack_478 * fVar221;
          auVar245._12_4_ =
               fStack_454 * (float)auStack_738._4_4_ +
               fVar304 * auVar323._12_4_ + fStack_5b4 * fVar222 + fStack_474 * fVar223;
          auVar245._16_4_ =
               fStack_450 * fStack_730 +
               fVar305 * auVar323._16_4_ + fStack_5b0 * fVar225 + fStack_470 * fVar235;
          auVar245._20_4_ =
               fStack_44c * fStack_72c +
               fVar211 * auVar323._20_4_ + fStack_5ac * fVar236 + fStack_46c * fVar237;
          auVar245._24_4_ =
               fStack_448 * fStack_728 +
               fVar173 * auVar323._24_4_ + fStack_5a8 * fVar306 + fStack_468 * fVar274;
          auVar245._28_4_ = fVar253 + fVar224;
          auVar233._0_4_ =
               (float)local_120._0_4_ * (float)local_740._0_4_ +
               fVar329 * fVar281 + fVar265 * fVar187 + fVar155 * fVar199;
          auVar233._4_4_ =
               (float)local_120._4_4_ * (float)local_740._4_4_ +
               fVar332 * fVar209 + fVar273 * fVar201 + fVar170 * fVar202;
          auVar233._8_4_ =
               fStack_118 * (float)auStack_738._0_4_ +
               fVar333 * fVar309 + fVar275 * fVar212 + fVar171 * fVar221;
          auVar233._12_4_ =
               fStack_114 * (float)auStack_738._4_4_ +
               fVar334 * fVar304 + fVar277 * fVar222 + fVar172 * fVar223;
          auVar233._16_4_ =
               fStack_110 * fStack_730 + fVar329 * fVar305 + fVar310 * fVar225 + fVar155 * fVar235;
          auVar233._20_4_ =
               fStack_10c * fStack_72c + fVar332 * fVar211 + fVar200 * fVar236 + fVar170 * fVar237;
          auVar233._24_4_ =
               fStack_108 * fStack_728 + fVar333 * fVar173 + fVar313 * fVar306 + fVar171 * fVar274;
          auVar233._28_4_ = fVar224 + fVar172 + fVar172 + fVar276;
          auVar270._0_4_ =
               (float)local_a0._0_4_ * fVar281 +
               (float)local_80._0_4_ * fVar187 + fVar199 * (float)local_140._0_4_ +
               (float)local_740._0_4_ * (float)local_c0._0_4_;
          auVar270._4_4_ =
               (float)local_a0._4_4_ * fVar209 +
               (float)local_80._4_4_ * fVar201 + fVar202 * (float)local_140._4_4_ +
               (float)local_740._4_4_ * (float)local_c0._4_4_;
          auVar270._8_4_ =
               fStack_98 * fVar309 + fStack_78 * fVar212 + fVar221 * fStack_138 +
               (float)auStack_738._0_4_ * fStack_b8;
          auVar270._12_4_ =
               fStack_94 * fVar304 + fStack_74 * fVar222 + fVar223 * fStack_134 +
               (float)auStack_738._4_4_ * fStack_b4;
          auVar270._16_4_ =
               fStack_90 * fVar305 + fStack_70 * fVar225 + fVar235 * fStack_130 +
               fStack_730 * fStack_b0;
          auVar270._20_4_ =
               fStack_8c * fVar211 + fStack_6c * fVar236 + fVar237 * fStack_12c +
               fStack_72c * fStack_ac;
          auVar270._24_4_ =
               fStack_88 * fVar173 + fStack_68 * fVar306 + fVar274 * fStack_128 +
               fStack_728 * fStack_a8;
          auVar270._28_4_ = fVar172 + fVar253 + fVar224;
          auVar272 = ZEXT3264(auVar270);
          auVar232 = vsubps_avx(auVar245,_local_7e0);
          auVar31 = vsubps_avx(auVar233,auVar197);
          fVar199 = auVar232._0_4_;
          fVar202 = auVar232._4_4_;
          auVar68._4_4_ = auVar197._4_4_ * fVar202;
          auVar68._0_4_ = auVar197._0_4_ * fVar199;
          fVar221 = auVar232._8_4_;
          auVar68._8_4_ = auVar197._8_4_ * fVar221;
          fVar223 = auVar232._12_4_;
          auVar68._12_4_ = auVar197._12_4_ * fVar223;
          fVar235 = auVar232._16_4_;
          auVar68._16_4_ = auVar197._16_4_ * fVar235;
          fVar237 = auVar232._20_4_;
          auVar68._20_4_ = auVar197._20_4_ * fVar237;
          fVar274 = auVar232._24_4_;
          auVar68._24_4_ = auVar197._24_4_ * fVar274;
          auVar68._28_4_ = fVar224;
          fVar224 = auVar31._0_4_;
          fVar253 = auVar31._4_4_;
          auVar69._4_4_ = fVar253 * (float)local_7e0._4_4_;
          auVar69._0_4_ = fVar224 * (float)local_7e0._0_4_;
          fVar203 = auVar31._8_4_;
          auVar69._8_4_ = fVar203 * fStack_7d8;
          fVar206 = auVar31._12_4_;
          auVar69._12_4_ = fVar206 * fStack_7d4;
          fVar208 = auVar31._16_4_;
          auVar69._16_4_ = fVar208 * fStack_7d0;
          fVar210 = auVar31._20_4_;
          auVar69._20_4_ = fVar210 * fStack_7cc;
          fVar238 = auVar31._24_4_;
          auVar69._24_4_ = fVar238 * fStack_7c8;
          auVar69._28_4_ = auVar233._28_4_;
          auVar39 = vsubps_avx(auVar68,auVar69);
          auVar113._4_4_ = fVar148;
          auVar113._0_4_ = fVar134;
          auVar113._8_4_ = fVar149;
          auVar113._12_4_ = fVar150;
          auVar113._16_4_ = fVar151;
          auVar113._20_4_ = fVar152;
          auVar113._24_4_ = fVar186;
          auVar113._28_4_ = fVar153;
          auVar32 = vmaxps_avx(auVar113,auVar270);
          auVar70._4_4_ = auVar32._4_4_ * auVar32._4_4_ * (fVar202 * fVar202 + fVar253 * fVar253);
          auVar70._0_4_ = auVar32._0_4_ * auVar32._0_4_ * (fVar199 * fVar199 + fVar224 * fVar224);
          auVar70._8_4_ = auVar32._8_4_ * auVar32._8_4_ * (fVar221 * fVar221 + fVar203 * fVar203);
          auVar70._12_4_ = auVar32._12_4_ * auVar32._12_4_ * (fVar223 * fVar223 + fVar206 * fVar206)
          ;
          auVar70._16_4_ = auVar32._16_4_ * auVar32._16_4_ * (fVar235 * fVar235 + fVar208 * fVar208)
          ;
          auVar70._20_4_ = auVar32._20_4_ * auVar32._20_4_ * (fVar237 * fVar237 + fVar210 * fVar210)
          ;
          auVar70._24_4_ = auVar32._24_4_ * auVar32._24_4_ * (fVar274 * fVar274 + fVar238 * fVar238)
          ;
          auVar70._28_4_ = auVar245._28_4_ + auVar233._28_4_;
          auVar71._4_4_ = auVar39._4_4_ * auVar39._4_4_;
          auVar71._0_4_ = auVar39._0_4_ * auVar39._0_4_;
          auVar71._8_4_ = auVar39._8_4_ * auVar39._8_4_;
          auVar71._12_4_ = auVar39._12_4_ * auVar39._12_4_;
          auVar71._16_4_ = auVar39._16_4_ * auVar39._16_4_;
          auVar71._20_4_ = auVar39._20_4_ * auVar39._20_4_;
          auVar71._24_4_ = auVar39._24_4_ * auVar39._24_4_;
          auVar71._28_4_ = auVar39._28_4_;
          _local_4e0 = vcmpps_avx(auVar71,auVar70,2);
          local_280 = (uint)lVar133;
          auVar227 = vpshufd_avx(ZEXT416(local_280),0);
          auVar138 = vpor_avx(auVar227,_DAT_01f7fcf0);
          auVar227 = vpor_avx(auVar227,_DAT_01fafea0);
          auVar116._4_4_ = fStack_4bc;
          auVar116._0_4_ = local_4c0;
          auVar116._8_4_ = fStack_4b8;
          auVar116._12_4_ = fStack_4b4;
          auVar138 = vpcmpgtd_avx(auVar116,auVar138);
          auVar227 = vpcmpgtd_avx(auVar116,auVar227);
          auVar185._16_16_ = auVar227;
          auVar185._0_16_ = auVar138;
          auVar32 = auVar185 & _local_4e0;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
            auVar323 = ZEXT3264(auVar323._0_32_);
            _local_740 = *pauVar10;
          }
          else {
            local_6c0._0_4_ = auVar122._0_4_;
            local_6c0._4_4_ = auVar122._4_4_;
            fStack_6b8 = auVar122._8_4_;
            fStack_6b4 = auVar122._12_4_;
            fStack_6b0 = auVar122._16_4_;
            fStack_6ac = auVar122._20_4_;
            fStack_6a8 = auVar122._24_4_;
            local_6c0._0_4_ =
                 (float)local_740._0_4_ * (float)local_160._0_4_ +
                 fVar281 * (float)local_4a0._0_4_ +
                 (float)local_320._0_4_ * fVar187 + (float)local_340._0_4_ * (float)local_6c0._0_4_;
            local_6c0._4_4_ =
                 (float)local_740._4_4_ * (float)local_160._4_4_ +
                 fVar209 * (float)local_4a0._4_4_ +
                 (float)local_320._4_4_ * fVar201 + (float)local_340._4_4_ * (float)local_6c0._4_4_;
            fStack_6b8 = (float)auStack_738._0_4_ * fStack_158 +
                         fVar309 * fStack_498 + fStack_318 * fVar212 + fStack_338 * fStack_6b8;
            fStack_6b4 = (float)auStack_738._4_4_ * fStack_154 +
                         fVar304 * fStack_494 + fStack_314 * fVar222 + fStack_334 * fStack_6b4;
            fStack_6b0 = fStack_730 * fStack_150 +
                         fVar305 * fStack_490 + fStack_310 * fVar225 + fStack_330 * fStack_6b0;
            fStack_6ac = fStack_72c * fStack_14c +
                         fVar211 * fStack_48c + fStack_30c * fVar236 + fStack_32c * fStack_6ac;
            fStack_6a8 = fStack_728 * fStack_148 +
                         fVar173 * fStack_488 + fStack_308 * fVar306 + fStack_328 * fStack_6a8;
            fStack_6a4 = fStack_724 + auVar22._28_4_ + fVar276 + 0.0;
            local_5a0 = auVar119._0_4_;
            auStack_59c._0_4_ = auVar119._4_4_;
            auStack_59c._4_4_ = auVar119._8_4_;
            fStack_594 = auVar119._12_4_;
            fStack_590 = auVar119._16_4_;
            fStack_58c = auVar119._20_4_;
            fStack_588 = auVar119._24_4_;
            local_6a0._0_4_ = auVar118._0_4_;
            local_6a0._4_4_ = auVar118._4_4_;
            fStack_698 = auVar118._8_4_;
            fStack_694 = auVar118._12_4_;
            fStack_690 = auVar118._16_4_;
            fStack_68c = auVar118._20_4_;
            fStack_688 = auVar118._24_4_;
            fVar239 = (float)local_340._0_4_ * (float)local_6a0._0_4_;
            fVar247 = (float)local_340._4_4_ * (float)local_6a0._4_4_;
            fVar248 = fStack_338 * fStack_698;
            fVar249 = fStack_334 * fStack_694;
            fVar250 = fStack_330 * fStack_690;
            fVar251 = fStack_32c * fStack_68c;
            fVar252 = fStack_328 * fStack_688;
            pfVar2 = (float *)(lVar21 + 0x21abdfc + lVar133 * 4);
            fVar187 = *pfVar2;
            fVar199 = pfVar2[1];
            fVar201 = pfVar2[2];
            fVar202 = pfVar2[3];
            fVar212 = pfVar2[4];
            fVar221 = pfVar2[5];
            fVar222 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x21ac280 + lVar133 * 4);
            fVar223 = *pfVar3;
            fVar225 = pfVar3[1];
            fVar235 = pfVar3[2];
            fVar236 = pfVar3[3];
            fVar237 = pfVar3[4];
            fVar306 = pfVar3[5];
            fVar274 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x21ab978 + lVar133 * 4);
            fVar281 = *pfVar4;
            fVar209 = pfVar4[1];
            fVar309 = pfVar4[2];
            fVar304 = pfVar4[3];
            fVar305 = pfVar4[4];
            fVar211 = pfVar4[5];
            fVar173 = pfVar4[6];
            fVar154 = pfVar2[7] + pfVar3[7];
            fVar174 = pfVar3[7] + fVar205 + 0.0;
            fVar254 = fVar205 + pfVar1[7] + fVar205 + 0.0;
            pfVar1 = (float *)(lVar21 + 0x21ab4f4 + lVar133 * 4);
            fVar224 = *pfVar1;
            fVar253 = pfVar1[1];
            fVar203 = pfVar1[2];
            fVar206 = pfVar1[3];
            fVar208 = pfVar1[4];
            fVar210 = pfVar1[5];
            fVar238 = pfVar1[6];
            local_6a0._4_4_ =
                 fVar253 * (float)local_460._4_4_ +
                 fVar209 * fVar289 +
                 (float)local_5c0._4_4_ * fVar199 + (float)local_480._4_4_ * fVar225;
            local_6a0._0_4_ =
                 fVar224 * (float)local_460._0_4_ +
                 fVar281 * fVar282 +
                 (float)local_5c0._0_4_ * fVar187 + (float)local_480._0_4_ * fVar223;
            fStack_698 = fVar203 * fStack_458 +
                         fVar309 * fVar291 + fStack_5b8 * fVar201 + fStack_478 * fVar235;
            fStack_694 = fVar206 * fStack_454 +
                         fVar304 * fVar293 + fStack_5b4 * fVar202 + fStack_474 * fVar236;
            fStack_690 = fVar208 * fStack_450 +
                         fVar305 * fVar282 + fStack_5b0 * fVar212 + fStack_470 * fVar237;
            fStack_68c = fVar210 * fStack_44c +
                         fVar211 * fVar289 + fStack_5ac * fVar221 + fStack_46c * fVar306;
            fStack_688 = fVar238 * fStack_448 +
                         fVar173 * fVar291 + fStack_5a8 * fVar222 + fStack_468 * fVar274;
            fStack_684 = fVar154 + fVar174;
            auVar166._0_4_ =
                 (float)local_120._0_4_ * fVar224 +
                 fVar265 * fVar187 + fVar155 * fVar223 + fVar281 * fVar329;
            auVar166._4_4_ =
                 (float)local_120._4_4_ * fVar253 +
                 fVar273 * fVar199 + fVar170 * fVar225 + fVar209 * fVar332;
            auVar166._8_4_ =
                 fStack_118 * fVar203 + fVar275 * fVar201 + fVar171 * fVar235 + fVar309 * fVar333;
            auVar166._12_4_ =
                 fStack_114 * fVar206 + fVar277 * fVar202 + fVar172 * fVar236 + fVar304 * fVar334;
            auVar166._16_4_ =
                 fStack_110 * fVar208 + fVar310 * fVar212 + fVar155 * fVar237 + fVar305 * fVar329;
            auVar166._20_4_ =
                 fStack_10c * fVar210 + fVar200 * fVar221 + fVar170 * fVar306 + fVar211 * fVar332;
            auVar166._24_4_ =
                 fStack_108 * fVar238 + fVar313 * fVar222 + fVar171 * fVar274 + fVar173 * fVar333;
            auVar166._28_4_ = fVar174 + fVar254;
            auVar321._0_4_ =
                 fVar281 * (float)local_4a0._0_4_ +
                 (float)local_320._0_4_ * fVar187 + (float)local_340._0_4_ * fVar223 +
                 fVar224 * (float)local_160._0_4_;
            auVar321._4_4_ =
                 fVar209 * (float)local_4a0._4_4_ +
                 (float)local_320._4_4_ * fVar199 + (float)local_340._4_4_ * fVar225 +
                 fVar253 * (float)local_160._4_4_;
            auVar321._8_4_ =
                 fVar309 * fStack_498 + fStack_318 * fVar201 + fStack_338 * fVar235 +
                 fVar203 * fStack_158;
            auVar321._12_4_ =
                 fVar304 * fStack_494 + fStack_314 * fVar202 + fStack_334 * fVar236 +
                 fVar206 * fStack_154;
            auVar321._16_4_ =
                 fVar305 * fStack_490 + fStack_310 * fVar212 + fStack_330 * fVar237 +
                 fVar208 * fStack_150;
            auVar321._20_4_ =
                 fVar211 * fStack_48c + fStack_30c * fVar221 + fStack_32c * fVar306 +
                 fVar210 * fStack_14c;
            auVar321._24_4_ =
                 fVar173 * fStack_488 + fStack_308 * fVar222 + fStack_328 * fVar274 +
                 fVar238 * fStack_148;
            auVar321._28_4_ = pfVar4[7] + fVar154 + fVar254;
            pfVar1 = (float *)(lVar21 + 0x21ae21c + lVar133 * 4);
            fVar187 = *pfVar1;
            fVar199 = pfVar1[1];
            fVar201 = pfVar1[2];
            fVar202 = pfVar1[3];
            fVar212 = pfVar1[4];
            fVar221 = pfVar1[5];
            fVar222 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x21ae6a0 + lVar133 * 4);
            fVar223 = *pfVar2;
            fVar225 = pfVar2[1];
            fVar235 = pfVar2[2];
            fVar236 = pfVar2[3];
            fVar237 = pfVar2[4];
            fVar306 = pfVar2[5];
            fVar274 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x21add98 + lVar133 * 4);
            fVar281 = *pfVar3;
            fVar209 = pfVar3[1];
            fVar309 = pfVar3[2];
            fVar304 = pfVar3[3];
            fVar305 = pfVar3[4];
            fVar211 = pfVar3[5];
            fVar173 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x21ad914 + lVar133 * 4);
            fVar224 = *pfVar4;
            fVar253 = pfVar4[1];
            fVar203 = pfVar4[2];
            fVar206 = pfVar4[3];
            fVar208 = pfVar4[4];
            fVar210 = pfVar4[5];
            fVar238 = pfVar4[6];
            auVar287._0_4_ =
                 fVar224 * (float)local_460._0_4_ +
                 fVar281 * fVar282 +
                 (float)local_5c0._0_4_ * fVar187 + (float)local_480._0_4_ * fVar223;
            auVar287._4_4_ =
                 fVar253 * (float)local_460._4_4_ +
                 fVar209 * fVar289 +
                 (float)local_5c0._4_4_ * fVar199 + (float)local_480._4_4_ * fVar225;
            auVar287._8_4_ =
                 fVar203 * fStack_458 +
                 fVar309 * fVar291 + fStack_5b8 * fVar201 + fStack_478 * fVar235;
            auVar287._12_4_ =
                 fVar206 * fStack_454 +
                 fVar304 * fVar293 + fStack_5b4 * fVar202 + fStack_474 * fVar236;
            auVar287._16_4_ =
                 fVar208 * fStack_450 +
                 fVar305 * fVar282 + fStack_5b0 * fVar212 + fStack_470 * fVar237;
            auVar287._20_4_ =
                 fVar210 * fStack_44c +
                 fVar211 * fVar289 + fStack_5ac * fVar221 + fStack_46c * fVar306;
            auVar287._24_4_ =
                 fVar238 * fStack_448 +
                 fVar173 * fVar291 + fStack_5a8 * fVar222 + fStack_468 * fVar274;
            auVar287._28_4_ = fStack_464 + fStack_464 + fStack_5a4 + fStack_464;
            auVar318._0_4_ =
                 fVar224 * (float)local_120._0_4_ +
                 fVar281 * fVar329 + fVar265 * fVar187 + fVar223 * fVar155;
            auVar318._4_4_ =
                 fVar253 * (float)local_120._4_4_ +
                 fVar209 * fVar332 + fVar273 * fVar199 + fVar225 * fVar170;
            auVar318._8_4_ =
                 fVar203 * fStack_118 + fVar309 * fVar333 + fVar275 * fVar201 + fVar235 * fVar171;
            auVar318._12_4_ =
                 fVar206 * fStack_114 + fVar304 * fVar334 + fVar277 * fVar202 + fVar236 * fVar172;
            auVar318._16_4_ =
                 fVar208 * fStack_110 + fVar305 * fVar329 + fVar310 * fVar212 + fVar237 * fVar155;
            auVar318._20_4_ =
                 fVar210 * fStack_10c + fVar211 * fVar332 + fVar200 * fVar221 + fVar306 * fVar170;
            auVar318._24_4_ =
                 fVar238 * fStack_108 + fVar173 * fVar333 + fVar313 * fVar222 + fVar274 * fVar171;
            auVar318._28_4_ = fStack_464 + fStack_464 + fStack_104 + fStack_464;
            auVar234._8_4_ = 0x7fffffff;
            auVar234._0_8_ = 0x7fffffff7fffffff;
            auVar234._12_4_ = 0x7fffffff;
            auVar234._16_4_ = 0x7fffffff;
            auVar234._20_4_ = 0x7fffffff;
            auVar234._24_4_ = 0x7fffffff;
            auVar234._28_4_ = 0x7fffffff;
            auVar22 = vandps_avx(_local_6a0,auVar234);
            auVar32 = vandps_avx(auVar166,auVar234);
            auVar32 = vmaxps_avx(auVar22,auVar32);
            auVar22 = vandps_avx(auVar321,auVar234);
            auVar32 = vmaxps_avx(auVar32,auVar22);
            auVar32 = vcmpps_avx(auVar32,local_360,1);
            auVar39 = vblendvps_avx(_local_6a0,auVar232,auVar32);
            auVar144._0_4_ =
                 fVar224 * (float)local_160._0_4_ +
                 fVar281 * (float)local_4a0._0_4_ +
                 (float)local_340._0_4_ * fVar223 + (float)local_320._0_4_ * fVar187;
            auVar144._4_4_ =
                 fVar253 * (float)local_160._4_4_ +
                 fVar209 * (float)local_4a0._4_4_ +
                 (float)local_340._4_4_ * fVar225 + (float)local_320._4_4_ * fVar199;
            auVar144._8_4_ =
                 fVar203 * fStack_158 +
                 fVar309 * fStack_498 + fStack_338 * fVar235 + fStack_318 * fVar201;
            auVar144._12_4_ =
                 fVar206 * fStack_154 +
                 fVar304 * fStack_494 + fStack_334 * fVar236 + fStack_314 * fVar202;
            auVar144._16_4_ =
                 fVar208 * fStack_150 +
                 fVar305 * fStack_490 + fStack_330 * fVar237 + fStack_310 * fVar212;
            auVar144._20_4_ =
                 fVar210 * fStack_14c +
                 fVar211 * fStack_48c + fStack_32c * fVar306 + fStack_30c * fVar221;
            auVar144._24_4_ =
                 fVar238 * fStack_148 +
                 fVar173 * fStack_488 + fStack_328 * fVar274 + fStack_308 * fVar222;
            auVar144._28_4_ = auVar22._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar300 = vblendvps_avx(auVar166,auVar31,auVar32);
            auVar22 = vandps_avx(auVar287,auVar234);
            auVar32 = vandps_avx(auVar318,auVar234);
            auVar193 = vmaxps_avx(auVar22,auVar32);
            auVar22 = vandps_avx(auVar144,auVar234);
            auVar22 = vmaxps_avx(auVar193,auVar22);
            local_580._0_4_ = auVar120._0_4_;
            local_580._4_4_ = auVar120._4_4_;
            fStack_578 = auVar120._8_4_;
            fStack_574 = auVar120._12_4_;
            auStack_570._0_4_ = auVar120._16_4_;
            auStack_570._4_4_ = auVar120._20_4_;
            fStack_568 = auVar120._24_4_;
            auVar32 = vcmpps_avx(auVar22,local_360,1);
            auVar22 = vblendvps_avx(auVar287,auVar232,auVar32);
            auVar145._0_4_ =
                 (float)local_160._0_4_ * (float)local_580._0_4_ +
                 (float)local_4a0._0_4_ * (float)local_5a0 +
                 (float)local_320._0_4_ * fVar204 + fVar239;
            auVar145._4_4_ =
                 (float)local_160._4_4_ * (float)local_580._4_4_ +
                 (float)local_4a0._4_4_ * (float)auStack_59c._0_4_ +
                 (float)local_320._4_4_ * fVar307 + fVar247;
            auVar145._8_4_ =
                 fStack_158 * fStack_578 +
                 fStack_498 * (float)auStack_59c._4_4_ + fStack_318 * fVar278 + fVar248;
            auVar145._12_4_ =
                 fStack_154 * fStack_574 + fStack_494 * fStack_594 + fStack_314 * fVar279 + fVar249;
            auVar145._16_4_ =
                 fStack_150 * (float)auStack_570._0_4_ +
                 fStack_490 * fStack_590 + fStack_310 * fVar207 + fVar250;
            auVar145._20_4_ =
                 fStack_14c * (float)auStack_570._4_4_ +
                 fStack_48c * fStack_58c + fStack_30c * fVar308 + fVar251;
            auVar145._24_4_ =
                 fStack_148 * fStack_568 + fStack_488 * fStack_588 + fStack_308 * fVar280 + fVar252;
            auVar145._28_4_ = auVar193._28_4_ + fStack_6a4 + fVar276 + 0.0;
            auVar32 = vblendvps_avx(auVar318,auVar31,auVar32);
            fVar275 = auVar39._0_4_;
            fVar277 = auVar39._4_4_;
            fVar224 = auVar39._8_4_;
            fVar253 = auVar39._12_4_;
            fVar203 = auVar39._16_4_;
            fVar206 = auVar39._20_4_;
            fVar208 = auVar39._24_4_;
            fVar210 = auVar39._28_4_;
            fVar236 = auVar22._0_4_;
            fVar306 = auVar22._4_4_;
            fVar276 = auVar22._8_4_;
            fVar307 = auVar22._12_4_;
            fVar279 = auVar22._16_4_;
            fVar308 = auVar22._20_4_;
            fVar281 = auVar22._24_4_;
            fVar310 = auVar300._0_4_;
            fVar313 = auVar300._4_4_;
            fVar187 = auVar300._8_4_;
            fVar201 = auVar300._12_4_;
            fVar212 = auVar300._16_4_;
            fVar222 = auVar300._20_4_;
            fVar225 = auVar300._24_4_;
            auVar301._0_4_ = fVar310 * fVar310 + fVar275 * fVar275;
            auVar301._4_4_ = fVar313 * fVar313 + fVar277 * fVar277;
            auVar301._8_4_ = fVar187 * fVar187 + fVar224 * fVar224;
            auVar301._12_4_ = fVar201 * fVar201 + fVar253 * fVar253;
            auVar301._16_4_ = fVar212 * fVar212 + fVar203 * fVar203;
            auVar301._20_4_ = fVar222 * fVar222 + fVar206 * fVar206;
            auVar301._24_4_ = fVar225 * fVar225 + fVar208 * fVar208;
            auVar301._28_4_ = fVar205 + auVar31._28_4_;
            auVar232 = vrsqrtps_avx(auVar301);
            fVar200 = auVar232._0_4_;
            fVar205 = auVar232._4_4_;
            auVar72._4_4_ = fVar205 * 1.5;
            auVar72._0_4_ = fVar200 * 1.5;
            fVar199 = auVar232._8_4_;
            auVar72._8_4_ = fVar199 * 1.5;
            fVar202 = auVar232._12_4_;
            auVar72._12_4_ = fVar202 * 1.5;
            fVar221 = auVar232._16_4_;
            auVar72._16_4_ = fVar221 * 1.5;
            fVar223 = auVar232._20_4_;
            auVar72._20_4_ = fVar223 * 1.5;
            fVar235 = auVar232._24_4_;
            auVar72._24_4_ = fVar235 * 1.5;
            auVar72._28_4_ = auVar318._28_4_;
            auVar73._4_4_ = fVar205 * fVar205 * fVar205 * auVar301._4_4_ * 0.5;
            auVar73._0_4_ = fVar200 * fVar200 * fVar200 * auVar301._0_4_ * 0.5;
            auVar73._8_4_ = fVar199 * fVar199 * fVar199 * auVar301._8_4_ * 0.5;
            auVar73._12_4_ = fVar202 * fVar202 * fVar202 * auVar301._12_4_ * 0.5;
            auVar73._16_4_ = fVar221 * fVar221 * fVar221 * auVar301._16_4_ * 0.5;
            auVar73._20_4_ = fVar223 * fVar223 * fVar223 * auVar301._20_4_ * 0.5;
            auVar73._24_4_ = fVar235 * fVar235 * fVar235 * auVar301._24_4_ * 0.5;
            auVar73._28_4_ = auVar301._28_4_;
            auVar31 = vsubps_avx(auVar72,auVar73);
            fVar309 = auVar31._0_4_;
            fVar304 = auVar31._4_4_;
            fVar305 = auVar31._8_4_;
            fVar211 = auVar31._12_4_;
            fVar173 = auVar31._16_4_;
            fVar265 = auVar31._20_4_;
            fVar273 = auVar31._24_4_;
            fVar200 = auVar32._0_4_;
            fVar205 = auVar32._4_4_;
            fVar199 = auVar32._8_4_;
            fVar202 = auVar32._12_4_;
            fVar221 = auVar32._16_4_;
            fVar223 = auVar32._20_4_;
            fVar235 = auVar32._24_4_;
            auVar271._0_4_ = fVar200 * fVar200 + fVar236 * fVar236;
            auVar271._4_4_ = fVar205 * fVar205 + fVar306 * fVar306;
            auVar271._8_4_ = fVar199 * fVar199 + fVar276 * fVar276;
            auVar271._12_4_ = fVar202 * fVar202 + fVar307 * fVar307;
            auVar271._16_4_ = fVar221 * fVar221 + fVar279 * fVar279;
            auVar271._20_4_ = fVar223 * fVar223 + fVar308 * fVar308;
            auVar271._24_4_ = fVar235 * fVar235 + fVar281 * fVar281;
            auVar271._28_4_ = auVar232._28_4_ + auVar22._28_4_;
            auVar22 = vrsqrtps_avx(auVar271);
            fVar237 = auVar22._0_4_;
            fVar274 = auVar22._4_4_;
            auVar74._4_4_ = fVar274 * 1.5;
            auVar74._0_4_ = fVar237 * 1.5;
            fVar204 = auVar22._8_4_;
            auVar74._8_4_ = fVar204 * 1.5;
            fVar278 = auVar22._12_4_;
            auVar74._12_4_ = fVar278 * 1.5;
            fVar207 = auVar22._16_4_;
            auVar74._16_4_ = fVar207 * 1.5;
            fVar280 = auVar22._20_4_;
            auVar74._20_4_ = fVar280 * 1.5;
            fVar209 = auVar22._24_4_;
            auVar74._24_4_ = fVar209 * 1.5;
            auVar74._28_4_ = auVar318._28_4_;
            auVar75._4_4_ = fVar274 * fVar274 * fVar274 * auVar271._4_4_ * 0.5;
            auVar75._0_4_ = fVar237 * fVar237 * fVar237 * auVar271._0_4_ * 0.5;
            auVar75._8_4_ = fVar204 * fVar204 * fVar204 * auVar271._8_4_ * 0.5;
            auVar75._12_4_ = fVar278 * fVar278 * fVar278 * auVar271._12_4_ * 0.5;
            auVar75._16_4_ = fVar207 * fVar207 * fVar207 * auVar271._16_4_ * 0.5;
            auVar75._20_4_ = fVar280 * fVar280 * fVar280 * auVar271._20_4_ * 0.5;
            auVar75._24_4_ = fVar209 * fVar209 * fVar209 * auVar271._24_4_ * 0.5;
            auVar75._28_4_ = auVar271._28_4_;
            auVar32 = vsubps_avx(auVar74,auVar75);
            fVar237 = auVar32._0_4_;
            fVar274 = auVar32._4_4_;
            fVar204 = auVar32._8_4_;
            fVar278 = auVar32._12_4_;
            fVar207 = auVar32._16_4_;
            fVar280 = auVar32._20_4_;
            fVar209 = auVar32._24_4_;
            fVar310 = fVar134 * fVar309 * fVar310;
            fVar313 = fVar148 * fVar304 * fVar313;
            auVar76._4_4_ = fVar313;
            auVar76._0_4_ = fVar310;
            fVar187 = fVar149 * fVar305 * fVar187;
            auVar76._8_4_ = fVar187;
            fVar201 = fVar150 * fVar211 * fVar201;
            auVar76._12_4_ = fVar201;
            fVar212 = fVar151 * fVar173 * fVar212;
            auVar76._16_4_ = fVar212;
            fVar222 = fVar152 * fVar265 * fVar222;
            auVar76._20_4_ = fVar222;
            fVar225 = fVar186 * fVar273 * fVar225;
            auVar76._24_4_ = fVar225;
            auVar76._28_4_ = auVar22._28_4_;
            local_580._4_4_ = fVar313 + (float)local_7e0._4_4_;
            local_580._0_4_ = fVar310 + (float)local_7e0._0_4_;
            fStack_578 = fVar187 + fStack_7d8;
            fStack_574 = fVar201 + fStack_7d4;
            auStack_570._0_4_ = fVar212 + fStack_7d0;
            auStack_570._4_4_ = fVar222 + fStack_7cc;
            fStack_568 = fVar225 + fStack_7c8;
            fStack_564 = auVar22._28_4_ + fStack_7c4;
            local_680 = fVar134 * fVar309 * -fVar275;
            fStack_67c = fVar148 * fVar304 * -fVar277;
            auVar77._4_4_ = fStack_67c;
            auVar77._0_4_ = local_680;
            fStack_678 = fVar149 * fVar305 * -fVar224;
            auVar77._8_4_ = fStack_678;
            fStack_674 = fVar150 * fVar211 * -fVar253;
            auVar77._12_4_ = fStack_674;
            fStack_670 = fVar151 * fVar173 * -fVar203;
            auVar77._16_4_ = fStack_670;
            fStack_66c = fVar152 * fVar265 * -fVar206;
            auVar77._20_4_ = fStack_66c;
            fStack_668 = fVar186 * fVar273 * -fVar208;
            auVar77._24_4_ = fStack_668;
            auVar77._28_4_ = -fVar210;
            local_680 = auVar197._0_4_ + local_680;
            fStack_67c = auVar197._4_4_ + fStack_67c;
            fStack_678 = auVar197._8_4_ + fStack_678;
            fStack_674 = auVar197._12_4_ + fStack_674;
            fStack_670 = auVar197._16_4_ + fStack_670;
            fStack_66c = auVar197._20_4_ + fStack_66c;
            fStack_668 = auVar197._24_4_ + fStack_668;
            fStack_664 = auVar197._28_4_ + -fVar210;
            fVar310 = fVar309 * 0.0 * fVar134;
            fVar313 = fVar304 * 0.0 * fVar148;
            auVar78._4_4_ = fVar313;
            auVar78._0_4_ = fVar310;
            fVar187 = fVar305 * 0.0 * fVar149;
            auVar78._8_4_ = fVar187;
            fVar201 = fVar211 * 0.0 * fVar150;
            auVar78._12_4_ = fVar201;
            fVar212 = fVar173 * 0.0 * fVar151;
            auVar78._16_4_ = fVar212;
            fVar222 = fVar265 * 0.0 * fVar152;
            auVar78._20_4_ = fVar222;
            fVar225 = fVar273 * 0.0 * fVar186;
            auVar78._24_4_ = fVar225;
            auVar78._28_4_ = fVar210;
            auVar22 = vsubps_avx(_local_7e0,auVar76);
            auVar331._0_4_ = fVar310 + auVar145._0_4_;
            auVar331._4_4_ = fVar313 + auVar145._4_4_;
            auVar331._8_4_ = fVar187 + auVar145._8_4_;
            auVar331._12_4_ = fVar201 + auVar145._12_4_;
            auVar331._16_4_ = fVar212 + auVar145._16_4_;
            auVar331._20_4_ = fVar222 + auVar145._20_4_;
            auVar331._24_4_ = fVar225 + auVar145._24_4_;
            auVar331._28_4_ = fVar210 + auVar145._28_4_;
            fVar310 = auVar270._0_4_ * fVar237 * fVar200;
            fVar200 = auVar270._4_4_ * fVar274 * fVar205;
            auVar79._4_4_ = fVar200;
            auVar79._0_4_ = fVar310;
            fVar313 = auVar270._8_4_ * fVar204 * fVar199;
            auVar79._8_4_ = fVar313;
            fVar205 = auVar270._12_4_ * fVar278 * fVar202;
            auVar79._12_4_ = fVar205;
            fVar187 = auVar270._16_4_ * fVar207 * fVar221;
            auVar79._16_4_ = fVar187;
            fVar199 = auVar270._20_4_ * fVar280 * fVar223;
            auVar79._20_4_ = fVar199;
            fVar201 = auVar270._24_4_ * fVar209 * fVar235;
            auVar79._24_4_ = fVar201;
            auVar79._28_4_ = fStack_7c4;
            auVar34 = vsubps_avx(auVar197,auVar77);
            auVar322._0_4_ = auVar245._0_4_ + fVar310;
            auVar322._4_4_ = auVar245._4_4_ + fVar200;
            auVar322._8_4_ = auVar245._8_4_ + fVar313;
            auVar322._12_4_ = auVar245._12_4_ + fVar205;
            auVar322._16_4_ = auVar245._16_4_ + fVar187;
            auVar322._20_4_ = auVar245._20_4_ + fVar199;
            auVar322._24_4_ = auVar245._24_4_ + fVar201;
            auVar322._28_4_ = auVar245._28_4_ + fStack_7c4;
            fVar310 = fVar237 * -fVar236 * auVar270._0_4_;
            fVar200 = fVar274 * -fVar306 * auVar270._4_4_;
            auVar80._4_4_ = fVar200;
            auVar80._0_4_ = fVar310;
            fVar313 = fVar204 * -fVar276 * auVar270._8_4_;
            auVar80._8_4_ = fVar313;
            fVar205 = fVar278 * -fVar307 * auVar270._12_4_;
            auVar80._12_4_ = fVar205;
            fVar187 = fVar207 * -fVar279 * auVar270._16_4_;
            auVar80._16_4_ = fVar187;
            fVar199 = fVar280 * -fVar308 * auVar270._20_4_;
            auVar80._20_4_ = fVar199;
            fVar201 = fVar209 * -fVar281 * auVar270._24_4_;
            auVar80._24_4_ = fVar201;
            auVar80._28_4_ = fVar153;
            auVar35 = vsubps_avx(auVar145,auVar78);
            auVar219._0_4_ = auVar233._0_4_ + fVar310;
            auVar219._4_4_ = auVar233._4_4_ + fVar200;
            auVar219._8_4_ = auVar233._8_4_ + fVar313;
            auVar219._12_4_ = auVar233._12_4_ + fVar205;
            auVar219._16_4_ = auVar233._16_4_ + fVar187;
            auVar219._20_4_ = auVar233._20_4_ + fVar199;
            auVar219._24_4_ = auVar233._24_4_ + fVar201;
            auVar219._28_4_ = auVar233._28_4_ + fVar153;
            fVar310 = fVar237 * 0.0 * auVar270._0_4_;
            fVar200 = fVar274 * 0.0 * auVar270._4_4_;
            auVar81._4_4_ = fVar200;
            auVar81._0_4_ = fVar310;
            fVar313 = fVar204 * 0.0 * auVar270._8_4_;
            auVar81._8_4_ = fVar313;
            fVar205 = fVar278 * 0.0 * auVar270._12_4_;
            auVar81._12_4_ = fVar205;
            fVar187 = fVar207 * 0.0 * auVar270._16_4_;
            auVar81._16_4_ = fVar187;
            fVar199 = fVar280 * 0.0 * auVar270._20_4_;
            auVar81._20_4_ = fVar199;
            fVar201 = fVar209 * 0.0 * auVar270._24_4_;
            auVar81._24_4_ = fVar201;
            auVar81._28_4_ = auVar145._28_4_;
            auVar232 = vsubps_avx(auVar245,auVar79);
            auVar288._0_4_ = (float)local_6c0._0_4_ + fVar310;
            auVar288._4_4_ = (float)local_6c0._4_4_ + fVar200;
            auVar288._8_4_ = fStack_6b8 + fVar313;
            auVar288._12_4_ = fStack_6b4 + fVar205;
            auVar288._16_4_ = fStack_6b0 + fVar187;
            auVar288._20_4_ = fStack_6ac + fVar199;
            auVar288._24_4_ = fStack_6a8 + fVar201;
            auVar288._28_4_ = fStack_6a4 + auVar145._28_4_;
            auVar31 = vsubps_avx(auVar233,auVar80);
            auVar39 = vsubps_avx(_local_6c0,auVar81);
            auVar300 = vsubps_avx(auVar219,auVar34);
            auVar193 = vsubps_avx(auVar288,auVar35);
            auVar82._4_4_ = auVar35._4_4_ * auVar300._4_4_;
            auVar82._0_4_ = auVar35._0_4_ * auVar300._0_4_;
            auVar82._8_4_ = auVar35._8_4_ * auVar300._8_4_;
            auVar82._12_4_ = auVar35._12_4_ * auVar300._12_4_;
            auVar82._16_4_ = auVar35._16_4_ * auVar300._16_4_;
            auVar82._20_4_ = auVar35._20_4_ * auVar300._20_4_;
            auVar82._24_4_ = auVar35._24_4_ * auVar300._24_4_;
            auVar82._28_4_ = auVar318._28_4_;
            auVar83._4_4_ = auVar34._4_4_ * auVar193._4_4_;
            auVar83._0_4_ = auVar34._0_4_ * auVar193._0_4_;
            auVar83._8_4_ = auVar34._8_4_ * auVar193._8_4_;
            auVar83._12_4_ = auVar34._12_4_ * auVar193._12_4_;
            auVar83._16_4_ = auVar34._16_4_ * auVar193._16_4_;
            auVar83._20_4_ = auVar34._20_4_ * auVar193._20_4_;
            auVar83._24_4_ = auVar34._24_4_ * auVar193._24_4_;
            auVar83._28_4_ = fStack_6a4;
            auVar192 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar22._4_4_ * auVar193._4_4_;
            auVar84._0_4_ = auVar22._0_4_ * auVar193._0_4_;
            auVar84._8_4_ = auVar22._8_4_ * auVar193._8_4_;
            auVar84._12_4_ = auVar22._12_4_ * auVar193._12_4_;
            auVar84._16_4_ = auVar22._16_4_ * auVar193._16_4_;
            auVar84._20_4_ = auVar22._20_4_ * auVar193._20_4_;
            auVar84._24_4_ = auVar22._24_4_ * auVar193._24_4_;
            auVar84._28_4_ = auVar193._28_4_;
            auVar193 = vsubps_avx(auVar322,auVar22);
            auVar85._4_4_ = auVar35._4_4_ * auVar193._4_4_;
            auVar85._0_4_ = auVar35._0_4_ * auVar193._0_4_;
            auVar85._8_4_ = auVar35._8_4_ * auVar193._8_4_;
            auVar85._12_4_ = auVar35._12_4_ * auVar193._12_4_;
            auVar85._16_4_ = auVar35._16_4_ * auVar193._16_4_;
            auVar85._20_4_ = auVar35._20_4_ * auVar193._20_4_;
            auVar85._24_4_ = auVar35._24_4_ * auVar193._24_4_;
            auVar85._28_4_ = auVar32._28_4_;
            auVar216 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar34._4_4_ * auVar193._4_4_;
            auVar86._0_4_ = auVar34._0_4_ * auVar193._0_4_;
            auVar86._8_4_ = auVar34._8_4_ * auVar193._8_4_;
            auVar86._12_4_ = auVar34._12_4_ * auVar193._12_4_;
            auVar86._16_4_ = auVar34._16_4_ * auVar193._16_4_;
            auVar86._20_4_ = auVar34._20_4_ * auVar193._20_4_;
            auVar86._24_4_ = auVar34._24_4_ * auVar193._24_4_;
            auVar86._28_4_ = auVar32._28_4_;
            auVar87._4_4_ = auVar22._4_4_ * auVar300._4_4_;
            auVar87._0_4_ = auVar22._0_4_ * auVar300._0_4_;
            auVar87._8_4_ = auVar22._8_4_ * auVar300._8_4_;
            auVar87._12_4_ = auVar22._12_4_ * auVar300._12_4_;
            auVar87._16_4_ = auVar22._16_4_ * auVar300._16_4_;
            auVar87._20_4_ = auVar22._20_4_ * auVar300._20_4_;
            auVar87._24_4_ = auVar22._24_4_ * auVar300._24_4_;
            auVar87._28_4_ = auVar300._28_4_;
            auVar32 = vsubps_avx(auVar87,auVar86);
            auVar167._0_4_ = auVar192._0_4_ * 0.0 + auVar32._0_4_ + auVar216._0_4_ * 0.0;
            auVar167._4_4_ = auVar192._4_4_ * 0.0 + auVar32._4_4_ + auVar216._4_4_ * 0.0;
            auVar167._8_4_ = auVar192._8_4_ * 0.0 + auVar32._8_4_ + auVar216._8_4_ * 0.0;
            auVar167._12_4_ = auVar192._12_4_ * 0.0 + auVar32._12_4_ + auVar216._12_4_ * 0.0;
            auVar167._16_4_ = auVar192._16_4_ * 0.0 + auVar32._16_4_ + auVar216._16_4_ * 0.0;
            auVar167._20_4_ = auVar192._20_4_ * 0.0 + auVar32._20_4_ + auVar216._20_4_ * 0.0;
            auVar167._24_4_ = auVar192._24_4_ * 0.0 + auVar32._24_4_ + auVar216._24_4_ * 0.0;
            auVar167._28_4_ = auVar192._28_4_ + auVar32._28_4_ + auVar216._28_4_;
            auVar315 = vcmpps_avx(auVar167,ZEXT832(0) << 0x20,2);
            auVar32 = vblendvps_avx(auVar232,_local_580,auVar315);
            auVar198 = ZEXT3264(auVar32);
            auVar115._4_4_ = fStack_67c;
            auVar115._0_4_ = local_680;
            auVar115._8_4_ = fStack_678;
            auVar115._12_4_ = fStack_674;
            auVar115._16_4_ = fStack_670;
            auVar115._20_4_ = fStack_66c;
            auVar115._24_4_ = fStack_668;
            auVar115._28_4_ = fStack_664;
            auVar232 = vblendvps_avx(auVar31,auVar115,auVar315);
            auVar31 = vblendvps_avx(auVar39,auVar331,auVar315);
            auVar39 = vblendvps_avx(auVar22,auVar322,auVar315);
            auVar300 = vblendvps_avx(auVar34,auVar219,auVar315);
            auVar193 = vblendvps_avx(auVar35,auVar288,auVar315);
            auVar192 = vblendvps_avx(auVar322,auVar22,auVar315);
            auVar216 = vblendvps_avx(auVar219,auVar34,auVar315);
            auVar261 = vblendvps_avx(auVar288,auVar35,auVar315);
            auVar22 = vandps_avx(auVar185,_local_4e0);
            auVar192 = vsubps_avx(auVar192,auVar32);
            auVar36 = vsubps_avx(auVar216,auVar232);
            auVar261 = vsubps_avx(auVar261,auVar31);
            auVar37 = vsubps_avx(auVar232,auVar300);
            fVar310 = auVar36._0_4_;
            fVar249 = auVar31._0_4_;
            fVar202 = auVar36._4_4_;
            fVar250 = auVar31._4_4_;
            auVar88._4_4_ = fVar250 * fVar202;
            auVar88._0_4_ = fVar249 * fVar310;
            fVar236 = auVar36._8_4_;
            fVar251 = auVar31._8_4_;
            auVar88._8_4_ = fVar251 * fVar236;
            fVar278 = auVar36._12_4_;
            fVar252 = auVar31._12_4_;
            auVar88._12_4_ = fVar252 * fVar278;
            fVar309 = auVar36._16_4_;
            fVar254 = auVar31._16_4_;
            auVar88._16_4_ = fVar254 * fVar309;
            fVar275 = auVar36._20_4_;
            fVar263 = auVar31._20_4_;
            auVar88._20_4_ = fVar263 * fVar275;
            fVar210 = auVar36._24_4_;
            fVar264 = auVar31._24_4_;
            auVar88._24_4_ = fVar264 * fVar210;
            auVar88._28_4_ = auVar216._28_4_;
            fVar200 = auVar232._0_4_;
            fVar283 = auVar261._0_4_;
            fVar212 = auVar232._4_4_;
            fVar290 = auVar261._4_4_;
            auVar89._4_4_ = fVar290 * fVar212;
            auVar89._0_4_ = fVar283 * fVar200;
            fVar237 = auVar232._8_4_;
            fVar292 = auVar261._8_4_;
            auVar89._8_4_ = fVar292 * fVar237;
            fVar279 = auVar232._12_4_;
            fVar294 = auVar261._12_4_;
            auVar89._12_4_ = fVar294 * fVar279;
            fVar304 = auVar232._16_4_;
            fVar295 = auVar261._16_4_;
            auVar89._16_4_ = fVar295 * fVar304;
            fVar277 = auVar232._20_4_;
            fVar296 = auVar261._20_4_;
            auVar89._20_4_ = fVar296 * fVar277;
            fVar238 = auVar232._24_4_;
            fVar297 = auVar261._24_4_;
            uVar11 = auVar34._28_4_;
            auVar89._24_4_ = fVar297 * fVar238;
            auVar89._28_4_ = uVar11;
            auVar216 = vsubps_avx(auVar89,auVar88);
            fVar313 = auVar32._0_4_;
            fVar221 = auVar32._4_4_;
            auVar90._4_4_ = fVar290 * fVar221;
            auVar90._0_4_ = fVar283 * fVar313;
            fVar306 = auVar32._8_4_;
            auVar90._8_4_ = fVar292 * fVar306;
            fVar207 = auVar32._12_4_;
            auVar90._12_4_ = fVar294 * fVar207;
            fVar305 = auVar32._16_4_;
            auVar90._16_4_ = fVar295 * fVar305;
            fVar224 = auVar32._20_4_;
            auVar90._20_4_ = fVar296 * fVar224;
            fVar154 = auVar32._24_4_;
            auVar90._24_4_ = fVar297 * fVar154;
            auVar90._28_4_ = uVar11;
            fVar205 = auVar192._0_4_;
            fVar222 = auVar192._4_4_;
            auVar91._4_4_ = fVar250 * fVar222;
            auVar91._0_4_ = fVar249 * fVar205;
            fVar274 = auVar192._8_4_;
            auVar91._8_4_ = fVar251 * fVar274;
            fVar308 = auVar192._12_4_;
            auVar91._12_4_ = fVar252 * fVar308;
            fVar211 = auVar192._16_4_;
            auVar91._16_4_ = fVar254 * fVar211;
            fVar253 = auVar192._20_4_;
            auVar91._20_4_ = fVar263 * fVar253;
            fVar174 = auVar192._24_4_;
            auVar91._24_4_ = fVar264 * fVar174;
            auVar91._28_4_ = auVar322._28_4_;
            auVar34 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar212 * fVar222;
            auVar92._0_4_ = fVar200 * fVar205;
            auVar92._8_4_ = fVar237 * fVar274;
            auVar92._12_4_ = fVar279 * fVar308;
            auVar92._16_4_ = fVar304 * fVar211;
            auVar92._20_4_ = fVar277 * fVar253;
            auVar92._24_4_ = fVar238 * fVar174;
            auVar92._28_4_ = uVar11;
            auVar93._4_4_ = fVar221 * fVar202;
            auVar93._0_4_ = fVar313 * fVar310;
            auVar93._8_4_ = fVar306 * fVar236;
            auVar93._12_4_ = fVar207 * fVar278;
            auVar93._16_4_ = fVar305 * fVar309;
            auVar93._20_4_ = fVar224 * fVar275;
            auVar93._24_4_ = fVar154 * fVar210;
            auVar93._28_4_ = auVar35._28_4_;
            auVar35 = vsubps_avx(auVar93,auVar92);
            auVar38 = vsubps_avx(auVar31,auVar193);
            fVar199 = auVar35._28_4_ + auVar34._28_4_;
            auVar302._0_4_ = auVar35._0_4_ + auVar34._0_4_ * 0.0 + auVar216._0_4_ * 0.0;
            auVar302._4_4_ = auVar35._4_4_ + auVar34._4_4_ * 0.0 + auVar216._4_4_ * 0.0;
            auVar302._8_4_ = auVar35._8_4_ + auVar34._8_4_ * 0.0 + auVar216._8_4_ * 0.0;
            auVar302._12_4_ = auVar35._12_4_ + auVar34._12_4_ * 0.0 + auVar216._12_4_ * 0.0;
            auVar302._16_4_ = auVar35._16_4_ + auVar34._16_4_ * 0.0 + auVar216._16_4_ * 0.0;
            auVar302._20_4_ = auVar35._20_4_ + auVar34._20_4_ * 0.0 + auVar216._20_4_ * 0.0;
            auVar302._24_4_ = auVar35._24_4_ + auVar34._24_4_ * 0.0 + auVar216._24_4_ * 0.0;
            auVar302._28_4_ = fVar199 + auVar216._28_4_;
            fVar187 = auVar37._0_4_;
            fVar223 = auVar37._4_4_;
            auVar94._4_4_ = auVar193._4_4_ * fVar223;
            auVar94._0_4_ = auVar193._0_4_ * fVar187;
            fVar276 = auVar37._8_4_;
            auVar94._8_4_ = auVar193._8_4_ * fVar276;
            fVar280 = auVar37._12_4_;
            auVar94._12_4_ = auVar193._12_4_ * fVar280;
            fVar173 = auVar37._16_4_;
            auVar94._16_4_ = auVar193._16_4_ * fVar173;
            fVar203 = auVar37._20_4_;
            auVar94._20_4_ = auVar193._20_4_ * fVar203;
            fVar239 = auVar37._24_4_;
            auVar94._24_4_ = auVar193._24_4_ * fVar239;
            auVar94._28_4_ = fVar199;
            fVar199 = auVar38._0_4_;
            fVar225 = auVar38._4_4_;
            auVar95._4_4_ = auVar300._4_4_ * fVar225;
            auVar95._0_4_ = auVar300._0_4_ * fVar199;
            fVar204 = auVar38._8_4_;
            auVar95._8_4_ = auVar300._8_4_ * fVar204;
            fVar281 = auVar38._12_4_;
            auVar95._12_4_ = auVar300._12_4_ * fVar281;
            fVar265 = auVar38._16_4_;
            auVar95._16_4_ = auVar300._16_4_ * fVar265;
            fVar206 = auVar38._20_4_;
            auVar95._20_4_ = auVar300._20_4_ * fVar206;
            fVar247 = auVar38._24_4_;
            auVar95._24_4_ = auVar300._24_4_ * fVar247;
            auVar95._28_4_ = auVar35._28_4_;
            auVar34 = vsubps_avx(auVar95,auVar94);
            auVar35 = vsubps_avx(auVar32,auVar39);
            fVar201 = auVar35._0_4_;
            fVar235 = auVar35._4_4_;
            auVar96._4_4_ = auVar193._4_4_ * fVar235;
            auVar96._0_4_ = auVar193._0_4_ * fVar201;
            fVar307 = auVar35._8_4_;
            auVar96._8_4_ = auVar193._8_4_ * fVar307;
            fVar209 = auVar35._12_4_;
            auVar96._12_4_ = auVar193._12_4_ * fVar209;
            fVar273 = auVar35._16_4_;
            auVar96._16_4_ = auVar193._16_4_ * fVar273;
            fVar208 = auVar35._20_4_;
            auVar96._20_4_ = auVar193._20_4_ * fVar208;
            fVar248 = auVar35._24_4_;
            auVar96._24_4_ = auVar193._24_4_ * fVar248;
            auVar96._28_4_ = auVar193._28_4_;
            auVar97._4_4_ = fVar225 * auVar39._4_4_;
            auVar97._0_4_ = fVar199 * auVar39._0_4_;
            auVar97._8_4_ = fVar204 * auVar39._8_4_;
            auVar97._12_4_ = fVar281 * auVar39._12_4_;
            auVar97._16_4_ = fVar265 * auVar39._16_4_;
            auVar97._20_4_ = fVar206 * auVar39._20_4_;
            auVar97._24_4_ = fVar247 * auVar39._24_4_;
            auVar97._28_4_ = auVar216._28_4_;
            auVar193 = vsubps_avx(auVar96,auVar97);
            auVar98._4_4_ = auVar300._4_4_ * fVar235;
            auVar98._0_4_ = auVar300._0_4_ * fVar201;
            auVar98._8_4_ = auVar300._8_4_ * fVar307;
            auVar98._12_4_ = auVar300._12_4_ * fVar209;
            auVar98._16_4_ = auVar300._16_4_ * fVar273;
            auVar98._20_4_ = auVar300._20_4_ * fVar208;
            auVar98._24_4_ = auVar300._24_4_ * fVar248;
            auVar98._28_4_ = auVar300._28_4_;
            auVar99._4_4_ = fVar223 * auVar39._4_4_;
            auVar99._0_4_ = fVar187 * auVar39._0_4_;
            auVar99._8_4_ = fVar276 * auVar39._8_4_;
            auVar99._12_4_ = fVar280 * auVar39._12_4_;
            auVar99._16_4_ = fVar173 * auVar39._16_4_;
            auVar99._20_4_ = fVar203 * auVar39._20_4_;
            auVar99._24_4_ = fVar239 * auVar39._24_4_;
            auVar99._28_4_ = auVar39._28_4_;
            auVar39 = vsubps_avx(auVar99,auVar98);
            auVar146._0_4_ = auVar34._0_4_ * 0.0 + auVar39._0_4_ + auVar193._0_4_ * 0.0;
            auVar146._4_4_ = auVar34._4_4_ * 0.0 + auVar39._4_4_ + auVar193._4_4_ * 0.0;
            auVar146._8_4_ = auVar34._8_4_ * 0.0 + auVar39._8_4_ + auVar193._8_4_ * 0.0;
            auVar146._12_4_ = auVar34._12_4_ * 0.0 + auVar39._12_4_ + auVar193._12_4_ * 0.0;
            auVar146._16_4_ = auVar34._16_4_ * 0.0 + auVar39._16_4_ + auVar193._16_4_ * 0.0;
            auVar146._20_4_ = auVar34._20_4_ * 0.0 + auVar39._20_4_ + auVar193._20_4_ * 0.0;
            auVar146._24_4_ = auVar34._24_4_ * 0.0 + auVar39._24_4_ + auVar193._24_4_ * 0.0;
            auVar146._28_4_ = auVar193._28_4_ + auVar39._28_4_ + auVar193._28_4_;
            auVar147 = ZEXT3264(auVar146);
            auVar39 = vmaxps_avx(auVar302,auVar146);
            auVar39 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,2);
            auVar300 = auVar22 & auVar39;
            if ((((((((auVar300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar300 >> 0x7f,0) == '\0') &&
                  (auVar300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar300 >> 0xbf,0) == '\0') &&
                (auVar300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar300[0x1f]) {
LAB_00f7af01:
              auVar169._8_8_ = uStack_4f8;
              auVar169._0_8_ = local_500;
              auVar169._16_8_ = uStack_4f0;
              auVar169._24_8_ = uStack_4e8;
              auVar272 = ZEXT3264(CONCAT428(fVar153,CONCAT424(fVar186,CONCAT420(fVar152,CONCAT416(
                                                  fVar151,CONCAT412(fVar150,CONCAT48(fVar149,
                                                  CONCAT44(fVar148,fVar134))))))));
            }
            else {
              auVar300 = vandps_avx(auVar39,auVar22);
              auVar100._4_4_ = fVar225 * fVar202;
              auVar100._0_4_ = fVar199 * fVar310;
              auVar100._8_4_ = fVar204 * fVar236;
              auVar100._12_4_ = fVar281 * fVar278;
              auVar100._16_4_ = fVar265 * fVar309;
              auVar100._20_4_ = fVar206 * fVar275;
              auVar100._24_4_ = fVar247 * fVar210;
              auVar100._28_4_ = auVar22._28_4_;
              auVar101._4_4_ = fVar223 * fVar290;
              auVar101._0_4_ = fVar187 * fVar283;
              auVar101._8_4_ = fVar276 * fVar292;
              auVar101._12_4_ = fVar280 * fVar294;
              auVar101._16_4_ = fVar173 * fVar295;
              auVar101._20_4_ = fVar203 * fVar296;
              auVar101._24_4_ = fVar239 * fVar297;
              auVar101._28_4_ = auVar39._28_4_;
              auVar39 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar235 * fVar290;
              auVar102._0_4_ = fVar201 * fVar283;
              auVar102._8_4_ = fVar307 * fVar292;
              auVar102._12_4_ = fVar209 * fVar294;
              auVar102._16_4_ = fVar273 * fVar295;
              auVar102._20_4_ = fVar208 * fVar296;
              auVar102._24_4_ = fVar248 * fVar297;
              auVar102._28_4_ = auVar261._28_4_;
              auVar103._4_4_ = fVar225 * fVar222;
              auVar103._0_4_ = fVar199 * fVar205;
              auVar103._8_4_ = fVar204 * fVar274;
              auVar103._12_4_ = fVar281 * fVar308;
              auVar103._16_4_ = fVar265 * fVar211;
              auVar103._20_4_ = fVar206 * fVar253;
              auVar103._24_4_ = fVar247 * fVar174;
              auVar103._28_4_ = auVar38._28_4_;
              auVar193 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar223 * fVar222;
              auVar104._0_4_ = fVar187 * fVar205;
              auVar104._8_4_ = fVar276 * fVar274;
              auVar104._12_4_ = fVar280 * fVar308;
              auVar104._16_4_ = fVar173 * fVar211;
              auVar104._20_4_ = fVar203 * fVar253;
              auVar104._24_4_ = fVar239 * fVar174;
              auVar104._28_4_ = auVar192._28_4_;
              auVar105._4_4_ = fVar235 * fVar202;
              auVar105._0_4_ = fVar201 * fVar310;
              auVar105._8_4_ = fVar307 * fVar236;
              auVar105._12_4_ = fVar209 * fVar278;
              auVar105._16_4_ = fVar273 * fVar309;
              auVar105._20_4_ = fVar208 * fVar275;
              auVar105._24_4_ = fVar248 * fVar210;
              auVar105._28_4_ = auVar36._28_4_;
              auVar216 = vsubps_avx(auVar105,auVar104);
              auVar168._0_4_ = auVar39._0_4_ * 0.0 + auVar216._0_4_ + auVar193._0_4_ * 0.0;
              auVar168._4_4_ = auVar39._4_4_ * 0.0 + auVar216._4_4_ + auVar193._4_4_ * 0.0;
              auVar168._8_4_ = auVar39._8_4_ * 0.0 + auVar216._8_4_ + auVar193._8_4_ * 0.0;
              auVar168._12_4_ = auVar39._12_4_ * 0.0 + auVar216._12_4_ + auVar193._12_4_ * 0.0;
              auVar168._16_4_ = auVar39._16_4_ * 0.0 + auVar216._16_4_ + auVar193._16_4_ * 0.0;
              auVar168._20_4_ = auVar39._20_4_ * 0.0 + auVar216._20_4_ + auVar193._20_4_ * 0.0;
              auVar168._24_4_ = auVar39._24_4_ * 0.0 + auVar216._24_4_ + auVar193._24_4_ * 0.0;
              auVar168._28_4_ = auVar36._28_4_ + auVar216._28_4_ + auVar192._28_4_;
              auVar22 = vrcpps_avx(auVar168);
              fVar310 = auVar22._0_4_;
              fVar205 = auVar22._4_4_;
              auVar106._4_4_ = auVar168._4_4_ * fVar205;
              auVar106._0_4_ = auVar168._0_4_ * fVar310;
              fVar187 = auVar22._8_4_;
              auVar106._8_4_ = auVar168._8_4_ * fVar187;
              fVar199 = auVar22._12_4_;
              auVar106._12_4_ = auVar168._12_4_ * fVar199;
              fVar201 = auVar22._16_4_;
              auVar106._16_4_ = auVar168._16_4_ * fVar201;
              fVar202 = auVar22._20_4_;
              auVar106._20_4_ = auVar168._20_4_ * fVar202;
              fVar222 = auVar22._24_4_;
              auVar106._24_4_ = auVar168._24_4_ * fVar222;
              auVar106._28_4_ = auVar38._28_4_;
              auVar319._8_4_ = 0x3f800000;
              auVar319._0_8_ = 0x3f8000003f800000;
              auVar319._12_4_ = 0x3f800000;
              auVar319._16_4_ = 0x3f800000;
              auVar319._20_4_ = 0x3f800000;
              auVar319._24_4_ = 0x3f800000;
              auVar319._28_4_ = 0x3f800000;
              auVar22 = vsubps_avx(auVar319,auVar106);
              fVar310 = auVar22._0_4_ * fVar310 + fVar310;
              fVar205 = auVar22._4_4_ * fVar205 + fVar205;
              fVar187 = auVar22._8_4_ * fVar187 + fVar187;
              fVar199 = auVar22._12_4_ * fVar199 + fVar199;
              fVar201 = auVar22._16_4_ * fVar201 + fVar201;
              fVar202 = auVar22._20_4_ * fVar202 + fVar202;
              fVar222 = auVar22._24_4_ * fVar222 + fVar222;
              auVar107._4_4_ =
                   (fVar221 * auVar39._4_4_ + auVar193._4_4_ * fVar212 + auVar216._4_4_ * fVar250) *
                   fVar205;
              auVar107._0_4_ =
                   (fVar313 * auVar39._0_4_ + auVar193._0_4_ * fVar200 + auVar216._0_4_ * fVar249) *
                   fVar310;
              auVar107._8_4_ =
                   (fVar306 * auVar39._8_4_ + auVar193._8_4_ * fVar237 + auVar216._8_4_ * fVar251) *
                   fVar187;
              auVar107._12_4_ =
                   (fVar207 * auVar39._12_4_ + auVar193._12_4_ * fVar279 + auVar216._12_4_ * fVar252
                   ) * fVar199;
              auVar107._16_4_ =
                   (fVar305 * auVar39._16_4_ + auVar193._16_4_ * fVar304 + auVar216._16_4_ * fVar254
                   ) * fVar201;
              auVar107._20_4_ =
                   (fVar224 * auVar39._20_4_ + auVar193._20_4_ * fVar277 + auVar216._20_4_ * fVar263
                   ) * fVar202;
              auVar107._24_4_ =
                   (fVar154 * auVar39._24_4_ + auVar193._24_4_ * fVar238 + auVar216._24_4_ * fVar264
                   ) * fVar222;
              auVar107._28_4_ = auVar32._28_4_ + auVar232._28_4_ + auVar31._28_4_;
              auVar198 = ZEXT3264(auVar107);
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar220._4_4_ = uVar11;
              auVar220._0_4_ = uVar11;
              auVar220._8_4_ = uVar11;
              auVar220._12_4_ = uVar11;
              auVar220._16_4_ = uVar11;
              auVar220._20_4_ = uVar11;
              auVar220._24_4_ = uVar11;
              auVar220._28_4_ = uVar11;
              auVar22 = vcmpps_avx(local_e0,auVar107,2);
              auVar32 = vcmpps_avx(auVar107,auVar220,2);
              auVar22 = vandps_avx(auVar22,auVar32);
              auVar232 = auVar300 & auVar22;
              if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar232 >> 0x7f,0) == '\0') &&
                    (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar232 >> 0xbf,0) == '\0') &&
                  (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar232[0x1f]) goto LAB_00f7af01;
              auVar22 = vandps_avx(auVar300,auVar22);
              auVar232 = vcmpps_avx(ZEXT832(0) << 0x20,auVar168,4);
              auVar31 = auVar22 & auVar232;
              auVar169._8_8_ = uStack_4f8;
              auVar169._0_8_ = local_500;
              auVar169._16_8_ = uStack_4f0;
              auVar169._24_8_ = uStack_4e8;
              auVar272 = ZEXT3264(CONCAT428(fVar153,CONCAT424(fVar186,CONCAT420(fVar152,CONCAT416(
                                                  fVar151,CONCAT412(fVar150,CONCAT48(fVar149,
                                                  CONCAT44(fVar148,fVar134))))))));
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar169 = vandps_avx(auVar232,auVar22);
                auVar108._4_4_ = auVar302._4_4_ * fVar205;
                auVar108._0_4_ = auVar302._0_4_ * fVar310;
                auVar108._8_4_ = auVar302._8_4_ * fVar187;
                auVar108._12_4_ = auVar302._12_4_ * fVar199;
                auVar108._16_4_ = auVar302._16_4_ * fVar201;
                auVar108._20_4_ = auVar302._20_4_ * fVar202;
                auVar108._24_4_ = auVar302._24_4_ * fVar222;
                auVar108._28_4_ = auVar32._28_4_;
                auVar109._4_4_ = auVar146._4_4_ * fVar205;
                auVar109._0_4_ = auVar146._0_4_ * fVar310;
                auVar109._8_4_ = auVar146._8_4_ * fVar187;
                auVar109._12_4_ = auVar146._12_4_ * fVar199;
                auVar109._16_4_ = auVar146._16_4_ * fVar201;
                auVar109._20_4_ = auVar146._20_4_ * fVar202;
                auVar109._24_4_ = auVar146._24_4_ * fVar222;
                auVar109._28_4_ = auVar146._28_4_;
                auVar246._8_4_ = 0x3f800000;
                auVar246._0_8_ = 0x3f8000003f800000;
                auVar246._12_4_ = 0x3f800000;
                auVar246._16_4_ = 0x3f800000;
                auVar246._20_4_ = 0x3f800000;
                auVar246._24_4_ = 0x3f800000;
                auVar246._28_4_ = 0x3f800000;
                auVar22 = vsubps_avx(auVar246,auVar108);
                local_180 = vblendvps_avx(auVar22,auVar108,auVar315);
                auVar22 = vsubps_avx(auVar246,auVar109);
                _local_3a0 = vblendvps_avx(auVar22,auVar109,auVar315);
                auVar147 = ZEXT3264(_local_3a0);
                local_1a0 = auVar107;
              }
            }
            auVar323 = ZEXT3264(auVar285);
            fVar265 = (float)local_780._0_4_;
            fVar273 = (float)local_780._4_4_;
            fVar275 = fStack_778;
            fVar277 = fStack_774;
            fVar310 = fStack_770;
            fVar200 = fStack_76c;
            fVar313 = fStack_768;
            fVar205 = fStack_764;
            _local_740 = auVar270;
            if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0x7f,0) != '\0') ||
                  (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0xbf,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar169[0x1f] < '\0') {
              auVar22 = vsubps_avx(auVar270,auVar272._0_32_);
              auVar198 = ZEXT3264(local_180);
              fVar199 = auVar272._0_4_ + auVar22._0_4_ * local_180._0_4_;
              fVar201 = auVar272._4_4_ + auVar22._4_4_ * local_180._4_4_;
              fVar202 = auVar272._8_4_ + auVar22._8_4_ * local_180._8_4_;
              fVar212 = auVar272._12_4_ + auVar22._12_4_ * local_180._12_4_;
              fVar221 = auVar272._16_4_ + auVar22._16_4_ * local_180._16_4_;
              fVar222 = auVar272._20_4_ + auVar22._20_4_ * local_180._20_4_;
              fVar223 = auVar272._24_4_ + auVar22._24_4_ * local_180._24_4_;
              fVar225 = auVar272._28_4_ + auVar22._28_4_;
              fVar187 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
              auVar110._4_4_ = (fVar201 + fVar201) * fVar187;
              auVar110._0_4_ = (fVar199 + fVar199) * fVar187;
              auVar110._8_4_ = (fVar202 + fVar202) * fVar187;
              auVar110._12_4_ = (fVar212 + fVar212) * fVar187;
              auVar110._16_4_ = (fVar221 + fVar221) * fVar187;
              auVar110._20_4_ = (fVar222 + fVar222) * fVar187;
              auVar110._24_4_ = (fVar223 + fVar223) * fVar187;
              auVar110._28_4_ = fVar225 + fVar225;
              auVar22 = vcmpps_avx(local_1a0,auVar110,6);
              auVar147 = ZEXT3264(auVar22);
              auVar32 = auVar169 & auVar22;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar32 >> 0x7f,0) != '\0') ||
                    (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0xbf,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar32[0x1f] < '\0') {
                local_220 = vandps_avx(auVar22,auVar169);
                auVar147 = ZEXT3264(local_220);
                local_2c0 = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
                fStack_2bc = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
                fStack_2b8 = (float)uStack_398 + (float)uStack_398 + -1.0;
                fStack_2b4 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
                fStack_2b0 = (float)uStack_390 + (float)uStack_390 + -1.0;
                fStack_2ac = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
                fStack_2a8 = (float)uStack_388 + (float)uStack_388 + -1.0;
                fStack_2a4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
                local_2e0 = local_180;
                local_2a0 = local_1a0;
                local_270 = local_710;
                uStack_268 = uStack_708;
                local_260 = local_5e0;
                uStack_258 = uStack_5d8;
                local_250 = local_5f0;
                uStack_248 = uStack_5e8;
                local_240 = local_5d0;
                uStack_238 = uStack_5c8;
                auVar132 = (undefined1  [8])(context->scene->geometries).items[local_788].ptr;
                local_3a0._4_4_ = fStack_2bc;
                local_3a0._0_4_ = local_2c0;
                uStack_398._0_4_ = fStack_2b8;
                uStack_398._4_4_ = fStack_2b4;
                uStack_390._0_4_ = fStack_2b0;
                uStack_390._4_4_ = fStack_2ac;
                auVar121 = _local_3a0;
                uStack_388._0_4_ = fStack_2a8;
                uStack_388._4_4_ = fStack_2a4;
                auVar22 = _local_3a0;
                if ((((Geometry *)auVar132)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar126 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar126 = context->args;
                  if ((pRVar126->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar126 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar126 >> 8),1),
                     ((Geometry *)auVar132)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    _auStack_738 = auVar270._8_24_;
                    local_740 = auVar132;
                    local_760._4_28_ = auVar197._4_28_;
                    local_760._0_4_ = (int)uVar130;
                    auVar162._0_4_ = (float)(int)local_280;
                    auVar162._4_8_ = SUB128(ZEXT812(0),4);
                    auVar162._12_4_ = 0;
                    auVar138 = vshufps_avx(auVar162,auVar162,0);
                    local_200[0] = (auVar138._0_4_ + local_180._0_4_ + 0.0) * (float)local_100._0_4_
                    ;
                    local_200[1] = (auVar138._4_4_ + local_180._4_4_ + 1.0) * (float)local_100._4_4_
                    ;
                    local_200[2] = (auVar138._8_4_ + local_180._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (auVar138._12_4_ + local_180._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (auVar138._0_4_ + local_180._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (auVar138._4_4_ + local_180._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (auVar138._8_4_ + local_180._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = auVar138._12_4_ + (float)local_180._28_4_ + 7.0;
                    uStack_390 = auVar121._16_8_;
                    uStack_388 = auVar22._24_8_;
                    local_1e0 = local_3a0;
                    uStack_1d8 = uStack_398;
                    uStack_1d0 = uStack_390;
                    uStack_1c8 = uStack_388;
                    local_1c0 = local_1a0;
                    iVar124 = vmovmskps_avx(local_220);
                    local_7e0 = (undefined1  [8])CONCAT44((int)((ulong)pRVar126 >> 0x20),iVar124);
                    lVar18 = 0;
                    if (local_7e0 != (undefined1  [8])0x0) {
                      for (; ((ulong)local_7e0 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar18;
                    uStack_7bc = (undefined4)((ulong)lVar18 >> 0x20);
                    _local_3a0 = auVar22;
                    if (iVar124 == 0) {
                      pRVar126 = (RTCIntersectArguments *)0x0;
LAB_00f7af2d:
                      uVar130 = (ulong)(uint)local_760._0_4_;
                    }
                    else {
                      auStack_630 = auVar245._16_16_;
                      local_640 = *local_700;
                      stack0xfffffffffffff9a4 = auVar233._4_28_;
                      local_660._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      _local_5a0 = auVar185;
                      local_27c = uVar15;
                      do {
                        lVar18 = CONCAT44(uStack_7bc,local_7c0);
                        local_400 = local_200[lVar18];
                        local_3f0 = *(undefined4 *)((long)&local_1e0 + lVar18 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + lVar18 * 4);
                        fVar200 = 1.0 - local_400;
                        fVar310 = local_400 * fVar200 + local_400 * fVar200;
                        auVar138 = ZEXT416((uint)(local_400 * local_400 * 3.0));
                        auVar138 = vshufps_avx(auVar138,auVar138,0);
                        auVar227 = ZEXT416((uint)((fVar310 - local_400 * local_400) * 3.0));
                        auVar227 = vshufps_avx(auVar227,auVar227,0);
                        auVar191 = ZEXT416((uint)((fVar200 * fVar200 - fVar310) * 3.0));
                        auVar191 = vshufps_avx(auVar191,auVar191,0);
                        local_6f0.context = context->user;
                        auVar181 = ZEXT416((uint)(fVar200 * fVar200 * -3.0));
                        auVar181 = vshufps_avx(auVar181,auVar181,0);
                        auVar182._0_4_ =
                             auVar181._0_4_ * (float)local_710._0_4_ +
                             auVar191._0_4_ * (float)local_5e0._0_4_ +
                             auVar138._0_4_ * (float)local_5d0._0_4_ +
                             auVar227._0_4_ * (float)local_5f0._0_4_;
                        auVar182._4_4_ =
                             auVar181._4_4_ * (float)local_710._4_4_ +
                             auVar191._4_4_ * (float)local_5e0._4_4_ +
                             auVar138._4_4_ * (float)local_5d0._4_4_ +
                             auVar227._4_4_ * (float)local_5f0._4_4_;
                        auVar182._8_4_ =
                             auVar181._8_4_ * (float)uStack_708 +
                             auVar191._8_4_ * (float)uStack_5d8 +
                             auVar138._8_4_ * (float)uStack_5c8 + auVar227._8_4_ * (float)uStack_5e8
                        ;
                        auVar182._12_4_ =
                             auVar181._12_4_ * uStack_708._4_4_ +
                             auVar191._12_4_ * uStack_5d8._4_4_ +
                             auVar138._12_4_ * uStack_5c8._4_4_ + auVar227._12_4_ * uStack_5e8._4_4_
                        ;
                        local_430 = (RTCHitN  [16])vshufps_avx(auVar182,auVar182,0);
                        local_420 = vshufps_avx(auVar182,auVar182,0x55);
                        auVar198 = ZEXT1664(local_420);
                        local_410 = vshufps_avx(auVar182,auVar182,0xaa);
                        local_3e0 = local_610._0_8_;
                        uStack_3d8 = local_610._8_8_;
                        local_3d0 = local_600._0_8_;
                        uStack_3c8 = local_600._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3bc = (local_6f0.context)->instID[0];
                        local_3c0 = uStack_3bc;
                        uStack_3b8 = uStack_3bc;
                        uStack_3b4 = uStack_3bc;
                        uStack_3b0 = (local_6f0.context)->instPrimID[0];
                        uStack_3ac = uStack_3b0;
                        uStack_3a8 = uStack_3b0;
                        uStack_3a4 = uStack_3b0;
                        local_7a0 = local_640;
                        local_6f0.valid = (int *)local_7a0;
                        local_6f0.geometryUserPtr = ((Geometry *)auVar132)->userPtr;
                        local_6f0.hit = local_430;
                        local_6f0.N = 4;
                        local_6f0.ray = (RTCRayN *)ray;
                        fStack_3fc = local_400;
                        fStack_3f8 = local_400;
                        fStack_3f4 = local_400;
                        uStack_3ec = local_3f0;
                        uStack_3e8 = local_3f0;
                        uStack_3e4 = local_3f0;
                        if (((Geometry *)auVar132)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar198 = ZEXT1664(local_420);
                          auVar272 = ZEXT1664(auVar272._0_16_);
                          (*((Geometry *)auVar132)->occlusionFilterN)(&local_6f0);
                        }
                        if (local_7a0 == (undefined1  [16])0x0) {
                          auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar138 = auVar138 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var20 = context->args->filter;
                          if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)((long)local_740 + 0x3e) & 0x40) != 0)))) {
                            auVar198 = ZEXT1664(auVar198._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            (*p_Var20)(&local_6f0);
                          }
                          auVar227 = vpcmpeqd_avx(local_7a0,_DAT_01f7aa10);
                          auVar138 = auVar227 ^ _DAT_01f7ae20;
                          auVar183._8_4_ = 0xff800000;
                          auVar183._0_8_ = 0xff800000ff800000;
                          auVar183._12_4_ = 0xff800000;
                          auVar227 = vblendvps_avx(auVar183,*(undefined1 (*) [16])
                                                             (local_6f0.ray + 0x80),auVar227);
                          *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar227;
                        }
                        auVar147 = ZEXT1664(auVar138);
                        auVar163._8_8_ = 0x100000001;
                        auVar163._0_8_ = 0x100000001;
                        if ((auVar163 & auVar138) != (undefined1  [16])0x0) {
                          pRVar126 = (RTCIntersectArguments *)0x1;
                          goto LAB_00f7af2d;
                        }
                        auVar147 = ZEXT464((uint)local_660._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_660._0_4_;
                        local_7e0 = (undefined1  [8])
                                    ((ulong)local_7e0 ^ 1L << ((ulong)local_7c0 & 0x3f));
                        lVar18 = 0;
                        if (local_7e0 != (undefined1  [8])0x0) {
                          for (; ((ulong)local_7e0 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar18;
                        uStack_7bc = (undefined4)((ulong)lVar18 >> 0x20);
                        pRVar126 = (RTCIntersectArguments *)0x0;
                        uVar130 = (ulong)(uint)local_760._0_4_;
                        auVar132 = local_740;
                      } while (local_7e0 != (undefined1  [8])0x0);
                    }
                  }
                }
                auVar323 = ZEXT3264(auVar285);
                uVar130 = CONCAT71((int7)(uVar130 >> 8),(byte)uVar130 | (byte)pRVar126);
                fVar265 = (float)local_780._0_4_;
                fVar273 = (float)local_780._4_4_;
                fVar275 = fStack_778;
                fVar277 = fStack_774;
                fVar310 = fStack_770;
                fVar200 = fStack_76c;
                fVar313 = fStack_768;
                fVar205 = fStack_764;
              }
            }
          }
          lVar133 = lVar133 + 8;
        } while ((int)lVar133 < (int)uVar15);
      }
      bVar129 = (byte)uVar130;
      if ((uVar130 & 1) != 0) break;
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = uVar11;
      auVar139._0_4_ = uVar11;
      auVar139._8_4_ = uVar11;
      auVar139._12_4_ = uVar11;
      auVar138 = vcmpps_avx(local_2f0,auVar139,2);
      uVar127 = vmovmskps_avx(auVar138);
      uVar123 = uVar123 & uVar123 + 0xf & uVar127;
    } while (uVar123 != 0);
  }
  return (bool)(bVar129 & 1);
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }